

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O2

void embree::avx::CurveNvIntersector1<8>::
     intersect_t<embree::avx::RibbonCurve1Intersector1<embree::BezierCurveT,8>,embree::avx::Intersect1EpilogMU<8,true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  Primitive *pPVar1;
  undefined1 (*pauVar2) [28];
  float *pfVar3;
  undefined1 (*pauVar4) [32];
  undefined1 (*pauVar5) [28];
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  undefined4 uVar11;
  undefined8 uVar12;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  Primitive PVar22;
  uint uVar23;
  uint uVar24;
  Geometry *pGVar25;
  RTCFilterFunctionN p_Var26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [28];
  undefined1 auVar127 [28];
  undefined1 auVar128 [28];
  undefined1 auVar129 [28];
  undefined1 auVar130 [24];
  uint uVar131;
  uint uVar132;
  uint uVar133;
  long lVar134;
  ulong uVar135;
  long lVar136;
  Primitive *pPVar137;
  ulong uVar138;
  long lVar139;
  float fVar140;
  float fVar141;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  float fVar161;
  float fVar162;
  float fVar165;
  float fVar166;
  float fVar167;
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  float fVar163;
  float fVar164;
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  float fVar168;
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  float fVar169;
  float fVar186;
  float fVar187;
  undefined1 auVar170 [16];
  float fVar190;
  float fVar192;
  float fVar193;
  undefined1 auVar173 [32];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  float fVar194;
  undefined1 auVar177 [32];
  float fVar188;
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  float fVar189;
  float fVar191;
  float fVar195;
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [64];
  float fVar196;
  undefined1 auVar198 [16];
  float fVar197;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  float fVar212;
  float fVar214;
  float fVar218;
  float fVar220;
  float fVar221;
  undefined1 auVar206 [32];
  float fVar216;
  undefined1 auVar207 [32];
  undefined1 auVar219 [16];
  undefined1 auVar208 [32];
  float fVar213;
  float fVar215;
  float fVar217;
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  float fVar229;
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  float fVar230;
  float fVar240;
  float fVar241;
  float fVar244;
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  float fVar242;
  float fVar243;
  undefined1 auVar238 [32];
  float fVar245;
  undefined1 auVar239 [32];
  float fVar246;
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  float fVar256;
  float fVar257;
  float fVar258;
  float fVar259;
  float fVar260;
  float fVar261;
  undefined1 auVar251 [32];
  float fVar262;
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  float fVar263;
  float fVar264;
  float fVar270;
  float fVar272;
  undefined1 auVar265 [16];
  float fVar274;
  undefined1 auVar266 [16];
  float fVar276;
  float fVar278;
  float fVar281;
  undefined1 auVar267 [32];
  float fVar279;
  float fVar282;
  undefined1 auVar268 [32];
  float fVar271;
  float fVar273;
  float fVar275;
  float fVar277;
  float fVar280;
  float fVar283;
  float fVar284;
  undefined1 auVar269 [32];
  float fVar285;
  undefined1 auVar286 [16];
  float fVar294;
  float fVar295;
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  float fVar296;
  float fVar297;
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [64];
  float fVar305;
  float fVar306;
  float fVar307;
  float fVar309;
  float fVar311;
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  float fVar308;
  undefined1 auVar302 [32];
  float fVar310;
  undefined1 auVar303 [32];
  undefined1 auVar304 [64];
  float fVar317;
  float fVar318;
  float fVar319;
  float fVar320;
  undefined1 auVar312 [32];
  float fVar321;
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  undefined1 auVar316 [64];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  undefined1 auVar327 [16];
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  float in_register_0000151c;
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  undefined1 auVar336 [16];
  undefined1 auVar337 [32];
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  undefined1 auVar341 [64];
  float fVar342;
  float fVar346;
  float fVar347;
  float fVar348;
  float in_register_0000159c;
  undefined1 auVar343 [32];
  undefined1 auVar344 [32];
  undefined1 auVar345 [64];
  float fVar349;
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  float fVar354;
  float fVar355;
  float fVar356;
  float in_register_000015dc;
  undefined1 auVar353 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  RibbonHit<embree::CubicBezierCurve<embree::Vec3fx>,_8> bhit;
  int local_7c4;
  ulong local_7c0;
  Geometry *local_7b8;
  float local_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  Precalculations *local_758;
  RTCFilterFunctionNArguments local_750;
  undefined1 local_720 [32];
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  undefined1 local_6e0 [32];
  undefined1 local_6b0 [8];
  undefined8 uStack_6a8;
  undefined1 local_6a0 [8];
  undefined8 uStack_698;
  undefined1 local_690 [8];
  undefined8 uStack_688;
  undefined1 local_680 [32];
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined8 local_5e0;
  undefined4 local_5d8;
  float local_5d4;
  undefined4 local_5d0;
  uint local_5cc;
  undefined4 local_5c8;
  uint local_5c4;
  uint local_5c0;
  RayHit *local_5b0;
  RayQueryContext *local_5a8;
  undefined1 local_5a0 [32];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [32];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  undefined1 local_520 [32];
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  undefined1 auStack_4b0 [8];
  float fStack_4a8;
  float fStack_4a4;
  float local_4a0;
  float fStack_49c;
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [2] [32];
  undefined1 local_420 [32];
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [8];
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined1 local_360 [32];
  undefined1 local_340 [8];
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  undefined4 uStack_2e4;
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [32];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  uint local_220;
  uint local_21c;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined1 local_160 [32];
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [32];
  undefined1 auVar330 [12];
  undefined1 auVar338 [32];
  
  PVar22 = prim[1];
  uVar138 = (ulong)(byte)PVar22;
  pPVar137 = prim + uVar138 * 0x19 + 0x16;
  fVar196 = *(float *)(prim + uVar138 * 0x19 + 0x12);
  auVar250 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                        *(undefined1 (*) [16])(prim + uVar138 * 0x19 + 6));
  auVar170._0_4_ = fVar196 * auVar250._0_4_;
  auVar170._4_4_ = fVar196 * auVar250._4_4_;
  auVar170._8_4_ = fVar196 * auVar250._8_4_;
  auVar170._12_4_ = fVar196 * auVar250._12_4_;
  auVar265._0_4_ = fVar196 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar265._4_4_ = fVar196 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar265._8_4_ = fVar196 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar265._12_4_ = fVar196 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar250 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar138 * 4 + 6)));
  auVar202 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar138 * 4 + 10)));
  auVar144._16_16_ = auVar202;
  auVar144._0_16_ = auVar250;
  auVar250 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar138 * 5 + 6)));
  auVar202 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar138 * 5 + 10)));
  auVar144 = vcvtdq2ps_avx(auVar144);
  auVar206._16_16_ = auVar202;
  auVar206._0_16_ = auVar250;
  auVar28 = vcvtdq2ps_avx(auVar206);
  auVar250 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar138 * 6 + 6)));
  auVar202 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar138 * 6 + 10)));
  auVar224._16_16_ = auVar202;
  auVar224._0_16_ = auVar250;
  auVar250 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar138 * 0xb + 6)));
  auVar29 = vcvtdq2ps_avx(auVar224);
  auVar202 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar138 * 0xb + 10)));
  auVar225._16_16_ = auVar202;
  auVar225._0_16_ = auVar250;
  auVar30 = vcvtdq2ps_avx(auVar225);
  auVar250 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar138 * 0xc + 6)));
  auVar202 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar138 * 0xc + 10)));
  auVar233._16_16_ = auVar202;
  auVar233._0_16_ = auVar250;
  auVar250 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar138 * 0xd + 6)));
  auVar202 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar138 * 0xd + 10)));
  auVar352 = vcvtdq2ps_avx(auVar233);
  auVar234._16_16_ = auVar202;
  auVar234._0_16_ = auVar250;
  auVar31 = vcvtdq2ps_avx(auVar234);
  auVar250 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar138 * 0x12 + 6)));
  auVar202 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar138 * 0x12 + 10)));
  auVar235._16_16_ = auVar202;
  auVar235._0_16_ = auVar250;
  auVar250 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar138 * 0x13 + 6)));
  auVar32 = vcvtdq2ps_avx(auVar235);
  auVar202 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar138 * 0x13 + 10)));
  auVar312._16_16_ = auVar202;
  auVar312._0_16_ = auVar250;
  auVar33 = vcvtdq2ps_avx(auVar312);
  auVar250 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar138 * 0x14 + 6)));
  auVar202 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar138 * 0x14 + 10)));
  auVar322._16_16_ = auVar202;
  auVar322._0_16_ = auVar250;
  auVar34 = vcvtdq2ps_avx(auVar322);
  auVar250 = vshufps_avx(auVar265,auVar265,0);
  auVar202 = vshufps_avx(auVar265,auVar265,0x55);
  auVar219 = vshufps_avx(auVar265,auVar265,0xaa);
  fVar196 = auVar219._0_4_;
  fVar212 = auVar219._4_4_;
  fVar214 = auVar219._8_4_;
  fVar216 = auVar219._12_4_;
  fVar218 = auVar202._0_4_;
  fVar220 = auVar202._4_4_;
  fVar221 = auVar202._8_4_;
  fVar246 = auVar202._12_4_;
  fVar256 = auVar250._0_4_;
  fVar257 = auVar250._4_4_;
  fVar258 = auVar250._8_4_;
  fVar259 = auVar250._12_4_;
  auVar331._0_4_ = fVar256 * auVar144._0_4_ + fVar218 * auVar28._0_4_ + fVar196 * auVar29._0_4_;
  auVar331._4_4_ = fVar257 * auVar144._4_4_ + fVar220 * auVar28._4_4_ + fVar212 * auVar29._4_4_;
  auVar331._8_4_ = fVar258 * auVar144._8_4_ + fVar221 * auVar28._8_4_ + fVar214 * auVar29._8_4_;
  auVar331._12_4_ = fVar259 * auVar144._12_4_ + fVar246 * auVar28._12_4_ + fVar216 * auVar29._12_4_;
  auVar331._16_4_ = fVar256 * auVar144._16_4_ + fVar218 * auVar28._16_4_ + fVar196 * auVar29._16_4_;
  auVar331._20_4_ = fVar257 * auVar144._20_4_ + fVar220 * auVar28._20_4_ + fVar212 * auVar29._20_4_;
  auVar331._24_4_ = fVar258 * auVar144._24_4_ + fVar221 * auVar28._24_4_ + fVar214 * auVar29._24_4_;
  auVar331._28_4_ = fVar246 + in_register_000015dc + in_register_0000151c;
  auVar328._0_4_ = fVar256 * auVar30._0_4_ + fVar218 * auVar352._0_4_ + auVar31._0_4_ * fVar196;
  auVar328._4_4_ = fVar257 * auVar30._4_4_ + fVar220 * auVar352._4_4_ + auVar31._4_4_ * fVar212;
  auVar328._8_4_ = fVar258 * auVar30._8_4_ + fVar221 * auVar352._8_4_ + auVar31._8_4_ * fVar214;
  auVar328._12_4_ = fVar259 * auVar30._12_4_ + fVar246 * auVar352._12_4_ + auVar31._12_4_ * fVar216;
  auVar328._16_4_ = fVar256 * auVar30._16_4_ + fVar218 * auVar352._16_4_ + auVar31._16_4_ * fVar196;
  auVar328._20_4_ = fVar257 * auVar30._20_4_ + fVar220 * auVar352._20_4_ + auVar31._20_4_ * fVar212;
  auVar328._24_4_ = fVar258 * auVar30._24_4_ + fVar221 * auVar352._24_4_ + auVar31._24_4_ * fVar214;
  auVar328._28_4_ = fVar246 + in_register_000015dc + in_register_0000159c;
  auVar267._0_4_ = fVar256 * auVar32._0_4_ + fVar218 * auVar33._0_4_ + auVar34._0_4_ * fVar196;
  auVar267._4_4_ = fVar257 * auVar32._4_4_ + fVar220 * auVar33._4_4_ + auVar34._4_4_ * fVar212;
  auVar267._8_4_ = fVar258 * auVar32._8_4_ + fVar221 * auVar33._8_4_ + auVar34._8_4_ * fVar214;
  auVar267._12_4_ = fVar259 * auVar32._12_4_ + fVar246 * auVar33._12_4_ + auVar34._12_4_ * fVar216;
  auVar267._16_4_ = fVar256 * auVar32._16_4_ + fVar218 * auVar33._16_4_ + auVar34._16_4_ * fVar196;
  auVar267._20_4_ = fVar257 * auVar32._20_4_ + fVar220 * auVar33._20_4_ + auVar34._20_4_ * fVar212;
  auVar267._24_4_ = fVar258 * auVar32._24_4_ + fVar221 * auVar33._24_4_ + auVar34._24_4_ * fVar214;
  auVar267._28_4_ = fVar259 + fVar246 + fVar216;
  auVar250 = vshufps_avx(auVar170,auVar170,0);
  auVar202 = vshufps_avx(auVar170,auVar170,0x55);
  auVar219 = vshufps_avx(auVar170,auVar170,0xaa);
  fVar196 = auVar219._0_4_;
  fVar212 = auVar219._4_4_;
  fVar214 = auVar219._8_4_;
  fVar216 = auVar219._12_4_;
  fVar256 = auVar202._0_4_;
  fVar257 = auVar202._4_4_;
  fVar258 = auVar202._8_4_;
  fVar259 = auVar202._12_4_;
  fVar218 = auVar250._0_4_;
  fVar220 = auVar250._4_4_;
  fVar221 = auVar250._8_4_;
  fVar246 = auVar250._12_4_;
  auVar173._0_4_ = fVar218 * auVar144._0_4_ + fVar256 * auVar28._0_4_ + fVar196 * auVar29._0_4_;
  auVar173._4_4_ = fVar220 * auVar144._4_4_ + fVar257 * auVar28._4_4_ + fVar212 * auVar29._4_4_;
  auVar173._8_4_ = fVar221 * auVar144._8_4_ + fVar258 * auVar28._8_4_ + fVar214 * auVar29._8_4_;
  auVar173._12_4_ = fVar246 * auVar144._12_4_ + fVar259 * auVar28._12_4_ + fVar216 * auVar29._12_4_;
  auVar173._16_4_ = fVar218 * auVar144._16_4_ + fVar256 * auVar28._16_4_ + fVar196 * auVar29._16_4_;
  auVar173._20_4_ = fVar220 * auVar144._20_4_ + fVar257 * auVar28._20_4_ + fVar212 * auVar29._20_4_;
  auVar173._24_4_ = fVar221 * auVar144._24_4_ + fVar258 * auVar28._24_4_ + fVar214 * auVar29._24_4_;
  auVar173._28_4_ = auVar144._28_4_ + auVar28._28_4_ + auVar29._28_4_;
  auVar226._0_4_ = fVar218 * auVar30._0_4_ + auVar31._0_4_ * fVar196 + fVar256 * auVar352._0_4_;
  auVar226._4_4_ = fVar220 * auVar30._4_4_ + auVar31._4_4_ * fVar212 + fVar257 * auVar352._4_4_;
  auVar226._8_4_ = fVar221 * auVar30._8_4_ + auVar31._8_4_ * fVar214 + fVar258 * auVar352._8_4_;
  auVar226._12_4_ = fVar246 * auVar30._12_4_ + auVar31._12_4_ * fVar216 + fVar259 * auVar352._12_4_;
  auVar226._16_4_ = fVar218 * auVar30._16_4_ + auVar31._16_4_ * fVar196 + fVar256 * auVar352._16_4_;
  auVar226._20_4_ = fVar220 * auVar30._20_4_ + auVar31._20_4_ * fVar212 + fVar257 * auVar352._20_4_;
  auVar226._24_4_ = fVar221 * auVar30._24_4_ + auVar31._24_4_ * fVar214 + fVar258 * auVar352._24_4_;
  auVar226._28_4_ = auVar144._28_4_ + auVar31._28_4_ + auVar29._28_4_;
  auVar298._8_4_ = 0x7fffffff;
  auVar298._0_8_ = 0x7fffffff7fffffff;
  auVar298._12_4_ = 0x7fffffff;
  auVar298._16_4_ = 0x7fffffff;
  auVar298._20_4_ = 0x7fffffff;
  auVar298._24_4_ = 0x7fffffff;
  auVar298._28_4_ = 0x7fffffff;
  auVar145._8_4_ = 0x219392ef;
  auVar145._0_8_ = 0x219392ef219392ef;
  auVar145._12_4_ = 0x219392ef;
  auVar145._16_4_ = 0x219392ef;
  auVar145._20_4_ = 0x219392ef;
  auVar145._24_4_ = 0x219392ef;
  auVar145._28_4_ = 0x219392ef;
  auVar144 = vandps_avx(auVar331,auVar298);
  auVar144 = vcmpps_avx(auVar144,auVar145,1);
  auVar28 = vblendvps_avx(auVar331,auVar145,auVar144);
  auVar144 = vandps_avx(auVar328,auVar298);
  auVar144 = vcmpps_avx(auVar144,auVar145,1);
  auVar29 = vblendvps_avx(auVar328,auVar145,auVar144);
  auVar144 = vandps_avx(auVar298,auVar267);
  auVar144 = vcmpps_avx(auVar144,auVar145,1);
  auVar144 = vblendvps_avx(auVar267,auVar145,auVar144);
  auVar30 = vrcpps_avx(auVar28);
  auVar236._0_4_ = fVar218 * auVar32._0_4_ + fVar256 * auVar33._0_4_ + auVar34._0_4_ * fVar196;
  auVar236._4_4_ = fVar220 * auVar32._4_4_ + fVar257 * auVar33._4_4_ + auVar34._4_4_ * fVar212;
  auVar236._8_4_ = fVar221 * auVar32._8_4_ + fVar258 * auVar33._8_4_ + auVar34._8_4_ * fVar214;
  auVar236._12_4_ = fVar246 * auVar32._12_4_ + fVar259 * auVar33._12_4_ + auVar34._12_4_ * fVar216;
  auVar236._16_4_ = fVar218 * auVar32._16_4_ + fVar256 * auVar33._16_4_ + auVar34._16_4_ * fVar196;
  auVar236._20_4_ = fVar220 * auVar32._20_4_ + fVar257 * auVar33._20_4_ + auVar34._20_4_ * fVar212;
  auVar236._24_4_ = fVar221 * auVar32._24_4_ + fVar258 * auVar33._24_4_ + auVar34._24_4_ * fVar214;
  auVar236._28_4_ = auVar32._28_4_ + auVar352._28_4_ + fVar216;
  fVar196 = auVar30._0_4_;
  fVar212 = auVar30._4_4_;
  auVar352._4_4_ = auVar28._4_4_ * fVar212;
  auVar352._0_4_ = auVar28._0_4_ * fVar196;
  fVar214 = auVar30._8_4_;
  auVar352._8_4_ = auVar28._8_4_ * fVar214;
  fVar216 = auVar30._12_4_;
  auVar352._12_4_ = auVar28._12_4_ * fVar216;
  fVar218 = auVar30._16_4_;
  auVar352._16_4_ = auVar28._16_4_ * fVar218;
  fVar220 = auVar30._20_4_;
  auVar352._20_4_ = auVar28._20_4_ * fVar220;
  fVar221 = auVar30._24_4_;
  auVar352._24_4_ = auVar28._24_4_ * fVar221;
  auVar352._28_4_ = auVar28._28_4_;
  auVar299._8_4_ = 0x3f800000;
  auVar299._0_8_ = 0x3f8000003f800000;
  auVar299._12_4_ = 0x3f800000;
  auVar299._16_4_ = 0x3f800000;
  auVar299._20_4_ = 0x3f800000;
  auVar299._24_4_ = 0x3f800000;
  auVar299._28_4_ = 0x3f800000;
  auVar30 = vsubps_avx(auVar299,auVar352);
  auVar28 = vrcpps_avx(auVar29);
  fVar196 = fVar196 + fVar196 * auVar30._0_4_;
  fVar212 = fVar212 + fVar212 * auVar30._4_4_;
  fVar214 = fVar214 + fVar214 * auVar30._8_4_;
  fVar216 = fVar216 + fVar216 * auVar30._12_4_;
  fVar218 = fVar218 + fVar218 * auVar30._16_4_;
  fVar220 = fVar220 + fVar220 * auVar30._20_4_;
  fVar221 = fVar221 + fVar221 * auVar30._24_4_;
  fVar246 = auVar28._0_4_;
  fVar256 = auVar28._4_4_;
  auVar30._4_4_ = fVar256 * auVar29._4_4_;
  auVar30._0_4_ = fVar246 * auVar29._0_4_;
  fVar257 = auVar28._8_4_;
  auVar30._8_4_ = fVar257 * auVar29._8_4_;
  fVar258 = auVar28._12_4_;
  auVar30._12_4_ = fVar258 * auVar29._12_4_;
  fVar259 = auVar28._16_4_;
  auVar30._16_4_ = fVar259 * auVar29._16_4_;
  fVar260 = auVar28._20_4_;
  auVar30._20_4_ = fVar260 * auVar29._20_4_;
  fVar261 = auVar28._24_4_;
  auVar30._24_4_ = fVar261 * auVar29._24_4_;
  auVar30._28_4_ = auVar29._28_4_;
  auVar29 = vsubps_avx(auVar299,auVar30);
  auVar28 = vrcpps_avx(auVar144);
  fVar246 = fVar246 + fVar246 * auVar29._0_4_;
  fVar256 = fVar256 + fVar256 * auVar29._4_4_;
  fVar257 = fVar257 + fVar257 * auVar29._8_4_;
  fVar258 = fVar258 + fVar258 * auVar29._12_4_;
  fVar259 = fVar259 + fVar259 * auVar29._16_4_;
  fVar260 = fVar260 + fVar260 * auVar29._20_4_;
  fVar261 = fVar261 + fVar261 * auVar29._24_4_;
  fVar263 = auVar28._0_4_;
  fVar270 = auVar28._4_4_;
  auVar29._4_4_ = fVar270 * auVar144._4_4_;
  auVar29._0_4_ = fVar263 * auVar144._0_4_;
  fVar272 = auVar28._8_4_;
  auVar29._8_4_ = fVar272 * auVar144._8_4_;
  fVar274 = auVar28._12_4_;
  auVar29._12_4_ = fVar274 * auVar144._12_4_;
  fVar276 = auVar28._16_4_;
  auVar29._16_4_ = fVar276 * auVar144._16_4_;
  fVar278 = auVar28._20_4_;
  auVar29._20_4_ = fVar278 * auVar144._20_4_;
  fVar281 = auVar28._24_4_;
  auVar29._24_4_ = fVar281 * auVar144._24_4_;
  auVar29._28_4_ = auVar144._28_4_;
  auVar144 = vsubps_avx(auVar299,auVar29);
  fVar263 = fVar263 + fVar263 * auVar144._0_4_;
  fVar270 = fVar270 + fVar270 * auVar144._4_4_;
  fVar272 = fVar272 + fVar272 * auVar144._8_4_;
  fVar274 = fVar274 + fVar274 * auVar144._12_4_;
  fVar276 = fVar276 + fVar276 * auVar144._16_4_;
  fVar278 = fVar278 + fVar278 * auVar144._20_4_;
  fVar281 = fVar281 + fVar281 * auVar144._24_4_;
  auVar250._8_8_ = 0;
  auVar250._0_8_ = *(ulong *)(prim + uVar138 * 7 + 6);
  auVar250 = vpmovsxwd_avx(auVar250);
  auVar202._8_8_ = 0;
  auVar202._0_8_ = *(ulong *)(prim + uVar138 * 7 + 0xe);
  auVar202 = vpmovsxwd_avx(auVar202);
  auVar146._16_16_ = auVar202;
  auVar146._0_16_ = auVar250;
  auVar144 = vcvtdq2ps_avx(auVar146);
  auVar144 = vsubps_avx(auVar144,auVar173);
  auVar219._8_8_ = 0;
  auVar219._0_8_ = *(ulong *)(prim + uVar138 * 9 + 6);
  auVar250 = vpmovsxwd_avx(auVar219);
  auVar142._0_4_ = fVar196 * auVar144._0_4_;
  auVar142._4_4_ = fVar212 * auVar144._4_4_;
  auVar142._8_4_ = fVar214 * auVar144._8_4_;
  auVar142._12_4_ = fVar216 * auVar144._12_4_;
  auVar31._16_4_ = fVar218 * auVar144._16_4_;
  auVar31._0_16_ = auVar142;
  auVar31._20_4_ = fVar220 * auVar144._20_4_;
  auVar31._24_4_ = fVar221 * auVar144._24_4_;
  auVar31._28_4_ = auVar144._28_4_;
  auVar223._8_8_ = 0;
  auVar223._0_8_ = *(ulong *)(prim + uVar138 * 9 + 0xe);
  auVar202 = vpmovsxwd_avx(auVar223);
  auVar287._16_16_ = auVar202;
  auVar287._0_16_ = auVar250;
  auVar144 = vcvtdq2ps_avx(auVar287);
  auVar144 = vsubps_avx(auVar144,auVar173);
  auVar171._0_4_ = fVar196 * auVar144._0_4_;
  auVar171._4_4_ = fVar212 * auVar144._4_4_;
  auVar171._8_4_ = fVar214 * auVar144._8_4_;
  auVar171._12_4_ = fVar216 * auVar144._12_4_;
  auVar32._16_4_ = fVar218 * auVar144._16_4_;
  auVar32._0_16_ = auVar171;
  auVar32._20_4_ = fVar220 * auVar144._20_4_;
  auVar32._24_4_ = fVar221 * auVar144._24_4_;
  auVar32._28_4_ = auVar144._28_4_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar138 * 0xe + 6);
  auVar250 = vpmovsxwd_avx(auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar138 * 0xe + 0xe);
  auVar202 = vpmovsxwd_avx(auVar15);
  auVar207._16_16_ = auVar202;
  auVar207._0_16_ = auVar250;
  auVar144 = vcvtdq2ps_avx(auVar207);
  auVar144 = vsubps_avx(auVar144,auVar226);
  auVar198._0_4_ = fVar246 * auVar144._0_4_;
  auVar198._4_4_ = fVar256 * auVar144._4_4_;
  auVar198._8_4_ = fVar257 * auVar144._8_4_;
  auVar198._12_4_ = fVar258 * auVar144._12_4_;
  auVar28._16_4_ = fVar259 * auVar144._16_4_;
  auVar28._0_16_ = auVar198;
  auVar28._20_4_ = fVar260 * auVar144._20_4_;
  auVar28._24_4_ = fVar261 * auVar144._24_4_;
  auVar28._28_4_ = auVar144._28_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar22 * 0x10 + 6);
  auVar250 = vpmovsxwd_avx(auVar16);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar22 * 0x10 + 0xe);
  auVar202 = vpmovsxwd_avx(auVar17);
  auVar288._16_16_ = auVar202;
  auVar288._0_16_ = auVar250;
  auVar144 = vcvtdq2ps_avx(auVar288);
  auVar144 = vsubps_avx(auVar144,auVar226);
  auVar222._0_4_ = fVar246 * auVar144._0_4_;
  auVar222._4_4_ = fVar256 * auVar144._4_4_;
  auVar222._8_4_ = fVar257 * auVar144._8_4_;
  auVar222._12_4_ = fVar258 * auVar144._12_4_;
  auVar33._16_4_ = fVar259 * auVar144._16_4_;
  auVar33._0_16_ = auVar222;
  auVar33._20_4_ = fVar260 * auVar144._20_4_;
  auVar33._24_4_ = fVar261 * auVar144._24_4_;
  auVar33._28_4_ = auVar144._28_4_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar138 * 0x15 + 6);
  auVar250 = vpmovsxwd_avx(auVar18);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar138 * 0x15 + 0xe);
  auVar202 = vpmovsxwd_avx(auVar19);
  auVar251._16_16_ = auVar202;
  auVar251._0_16_ = auVar250;
  auVar144 = vcvtdq2ps_avx(auVar251);
  auVar144 = vsubps_avx(auVar144,auVar236);
  auVar247._0_4_ = fVar263 * auVar144._0_4_;
  auVar247._4_4_ = fVar270 * auVar144._4_4_;
  auVar247._8_4_ = fVar272 * auVar144._8_4_;
  auVar247._12_4_ = fVar274 * auVar144._12_4_;
  auVar34._16_4_ = fVar276 * auVar144._16_4_;
  auVar34._0_16_ = auVar247;
  auVar34._20_4_ = fVar278 * auVar144._20_4_;
  auVar34._24_4_ = fVar281 * auVar144._24_4_;
  auVar34._28_4_ = auVar144._28_4_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar138 * 0x17 + 6);
  auVar250 = vpmovsxwd_avx(auVar20);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar138 * 0x17 + 0xe);
  auVar202 = vpmovsxwd_avx(auVar21);
  auVar289._16_16_ = auVar202;
  auVar289._0_16_ = auVar250;
  auVar144 = vcvtdq2ps_avx(auVar289);
  auVar144 = vsubps_avx(auVar144,auVar236);
  auVar231._0_4_ = fVar263 * auVar144._0_4_;
  auVar231._4_4_ = fVar270 * auVar144._4_4_;
  auVar231._8_4_ = fVar272 * auVar144._8_4_;
  auVar231._12_4_ = fVar274 * auVar144._12_4_;
  auVar27._16_4_ = fVar276 * auVar144._16_4_;
  auVar27._0_16_ = auVar231;
  auVar27._20_4_ = fVar278 * auVar144._20_4_;
  auVar27._24_4_ = fVar281 * auVar144._24_4_;
  auVar27._28_4_ = auVar144._28_4_;
  auVar250 = vpminsd_avx(auVar31._16_16_,auVar32._16_16_);
  auVar202 = vpminsd_avx(auVar142,auVar171);
  auVar323._16_16_ = auVar250;
  auVar323._0_16_ = auVar202;
  auVar223 = auVar33._16_16_;
  auVar304 = ZEXT1664(auVar223);
  auVar219 = auVar28._16_16_;
  auVar316 = ZEXT1664(auVar219);
  auVar250 = vpminsd_avx(auVar219,auVar223);
  auVar202 = vpminsd_avx(auVar198,auVar222);
  auVar329._16_16_ = auVar250;
  auVar329._0_16_ = auVar202;
  auVar144 = vmaxps_avx(auVar323,auVar329);
  auVar250 = vpminsd_avx(auVar34._16_16_,auVar27._16_16_);
  auVar202 = vpminsd_avx(auVar247,auVar231);
  auVar337._16_16_ = auVar250;
  auVar337._0_16_ = auVar202;
  uVar11 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar343._4_4_ = uVar11;
  auVar343._0_4_ = uVar11;
  auVar343._8_4_ = uVar11;
  auVar343._12_4_ = uVar11;
  auVar343._16_4_ = uVar11;
  auVar343._20_4_ = uVar11;
  auVar343._24_4_ = uVar11;
  auVar343._28_4_ = uVar11;
  auVar28 = vmaxps_avx(auVar337,auVar343);
  auVar144 = vmaxps_avx(auVar144,auVar28);
  local_80._4_4_ = auVar144._4_4_ * 0.99999964;
  local_80._0_4_ = auVar144._0_4_ * 0.99999964;
  local_80._8_4_ = auVar144._8_4_ * 0.99999964;
  local_80._12_4_ = auVar144._12_4_ * 0.99999964;
  local_80._16_4_ = auVar144._16_4_ * 0.99999964;
  local_80._20_4_ = auVar144._20_4_ * 0.99999964;
  local_80._24_4_ = auVar144._24_4_ * 0.99999964;
  local_80._28_4_ = 0x3f7ffffa;
  auVar250 = vpmaxsd_avx(auVar31._16_16_,auVar32._16_16_);
  auVar202 = vpmaxsd_avx(auVar142,auVar171);
  auVar147._16_16_ = auVar250;
  auVar147._0_16_ = auVar202;
  auVar250 = vpmaxsd_avx(auVar219,auVar223);
  auVar202 = vpmaxsd_avx(auVar198,auVar222);
  auVar174._16_16_ = auVar250;
  auVar174._0_16_ = auVar202;
  auVar144 = vminps_avx(auVar147,auVar174);
  auVar250 = vpmaxsd_avx(auVar34._16_16_,auVar27._16_16_);
  auVar202 = vpmaxsd_avx(auVar247,auVar231);
  auVar175._16_16_ = auVar250;
  auVar175._0_16_ = auVar202;
  fVar196 = (ray->super_RayK<1>).tfar;
  auVar208._4_4_ = fVar196;
  auVar208._0_4_ = fVar196;
  auVar208._8_4_ = fVar196;
  auVar208._12_4_ = fVar196;
  auVar208._16_4_ = fVar196;
  auVar208._20_4_ = fVar196;
  auVar208._24_4_ = fVar196;
  auVar208._28_4_ = fVar196;
  auVar28 = vminps_avx(auVar175,auVar208);
  auVar144 = vminps_avx(auVar144,auVar28);
  auVar35._4_4_ = auVar144._4_4_ * 1.0000004;
  auVar35._0_4_ = auVar144._0_4_ * 1.0000004;
  auVar35._8_4_ = auVar144._8_4_ * 1.0000004;
  auVar35._12_4_ = auVar144._12_4_ * 1.0000004;
  auVar35._16_4_ = auVar144._16_4_ * 1.0000004;
  auVar35._20_4_ = auVar144._20_4_ * 1.0000004;
  auVar35._24_4_ = auVar144._24_4_ * 1.0000004;
  auVar35._28_4_ = auVar144._28_4_;
  auVar144 = vcmpps_avx(local_80,auVar35,2);
  auVar250 = vpshufd_avx(ZEXT116((byte)PVar22),0);
  auVar176._16_16_ = auVar250;
  auVar176._0_16_ = auVar250;
  auVar28 = vcvtdq2ps_avx(auVar176);
  auVar28 = vcmpps_avx(_DAT_01f7b060,auVar28,1);
  auVar144 = vandps_avx(auVar144,auVar28);
  uVar131 = vmovmskps_avx(auVar144);
  local_460[1]._0_8_ = mm_lookupmask_ps._16_8_;
  local_460[1]._8_8_ = mm_lookupmask_ps._24_8_;
  local_460[1]._16_8_ = mm_lookupmask_ps._16_8_;
  local_460[1]._24_8_ = mm_lookupmask_ps._24_8_;
  local_758 = pre;
LAB_00983d58:
  uVar138 = (ulong)uVar131;
  if (uVar138 == 0) {
    return;
  }
  local_680 = auVar316._0_32_;
  local_6e0 = auVar304._0_32_;
  lVar134 = 0;
  if (uVar138 != 0) {
    for (; (uVar131 >> lVar134 & 1) == 0; lVar134 = lVar134 + 1) {
    }
  }
  uVar138 = uVar138 - 1 & uVar138;
  uVar131 = *(uint *)(prim + lVar134 * 4 + 6);
  lVar134 = lVar134 * 0x40;
  lVar139 = 0;
  if (uVar138 != 0) {
    for (; (uVar138 >> lVar139 & 1) == 0; lVar139 = lVar139 + 1) {
    }
  }
  uVar23 = *(uint *)(prim + 2);
  local_7c0 = (ulong)uVar23;
  pGVar25 = (context->scene->geometries).items[uVar23].ptr;
  pPVar1 = pPVar137 + lVar134;
  local_210 = *(undefined8 *)pPVar1;
  uStack_208 = *(undefined8 *)(pPVar1 + 8);
  local_7b0 = (float)local_210;
  fStack_7ac = (float)((ulong)local_210 >> 0x20);
  fStack_7a8 = (float)uStack_208;
  fStack_7a4 = (float)((ulong)uStack_208 >> 0x20);
  if (((uVar138 != 0) && (uVar135 = uVar138 - 1 & uVar138, uVar135 != 0)) &&
     (lVar139 = 0, uVar135 != 0)) {
    for (; (uVar135 >> lVar139 & 1) == 0; lVar139 = lVar139 + 1) {
    }
  }
  _local_690 = *(undefined1 (*) [16])(pPVar137 + lVar134 + 0x10);
  _local_6a0 = *(undefined1 (*) [16])(pPVar137 + lVar134 + 0x20);
  _local_6b0 = *(undefined1 (*) [16])(pPVar137 + lVar134 + 0x30);
  uVar24 = (uint)pGVar25[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  aVar13 = (ray->super_RayK<1>).org.field_0;
  auVar121._12_4_ = fStack_7a4;
  auVar121._0_12_ = *(undefined1 (*) [12])pPVar1;
  auVar219 = vsubps_avx(auVar121,(undefined1  [16])aVar13);
  auVar250 = vshufps_avx(auVar219,auVar219,0);
  auVar202 = vshufps_avx(auVar219,auVar219,0x55);
  auVar219 = vshufps_avx(auVar219,auVar219,0xaa);
  fVar196 = (pre->ray_space).vx.field_0.m128[0];
  fVar212 = (pre->ray_space).vx.field_0.m128[1];
  fVar214 = (pre->ray_space).vx.field_0.m128[2];
  fVar216 = (pre->ray_space).vx.field_0.m128[3];
  fVar218 = (pre->ray_space).vy.field_0.m128[0];
  fVar220 = (pre->ray_space).vy.field_0.m128[1];
  fVar221 = (pre->ray_space).vy.field_0.m128[2];
  fVar246 = (pre->ray_space).vy.field_0.m128[3];
  fVar256 = (pre->ray_space).vz.field_0.m128[0];
  fVar257 = (pre->ray_space).vz.field_0.m128[1];
  fVar258 = (pre->ray_space).vz.field_0.m128[2];
  fVar259 = (pre->ray_space).vz.field_0.m128[3];
  auVar232._0_4_ = auVar250._0_4_ * fVar196 + auVar219._0_4_ * fVar256 + auVar202._0_4_ * fVar218;
  auVar232._4_4_ = auVar250._4_4_ * fVar212 + auVar219._4_4_ * fVar257 + auVar202._4_4_ * fVar220;
  auVar232._8_4_ = auVar250._8_4_ * fVar214 + auVar219._8_4_ * fVar258 + auVar202._8_4_ * fVar221;
  auVar232._12_4_ =
       auVar250._12_4_ * fVar216 + auVar219._12_4_ * fVar259 + auVar202._12_4_ * fVar246;
  auVar250 = vblendps_avx(auVar232,auVar121,8);
  auVar223 = vsubps_avx(_local_690,(undefined1  [16])aVar13);
  auVar202 = vshufps_avx(auVar223,auVar223,0);
  auVar219 = vshufps_avx(auVar223,auVar223,0x55);
  auVar223 = vshufps_avx(auVar223,auVar223,0xaa);
  auVar248._0_4_ = auVar202._0_4_ * fVar196 + auVar223._0_4_ * fVar256 + auVar219._0_4_ * fVar218;
  auVar248._4_4_ = auVar202._4_4_ * fVar212 + auVar223._4_4_ * fVar257 + auVar219._4_4_ * fVar220;
  auVar248._8_4_ = auVar202._8_4_ * fVar214 + auVar223._8_4_ * fVar258 + auVar219._8_4_ * fVar221;
  auVar248._12_4_ =
       auVar202._12_4_ * fVar216 + auVar223._12_4_ * fVar259 + auVar219._12_4_ * fVar246;
  _local_7a0 = auVar248;
  auVar202 = vblendps_avx(auVar248,_local_690,8);
  auVar14 = vsubps_avx(_local_6a0,(undefined1  [16])aVar13);
  auVar219 = vshufps_avx(auVar14,auVar14,0);
  auVar223 = vshufps_avx(auVar14,auVar14,0x55);
  auVar14 = vshufps_avx(auVar14,auVar14,0xaa);
  auVar286._0_4_ = auVar219._0_4_ * fVar196 + auVar223._0_4_ * fVar218 + auVar14._0_4_ * fVar256;
  auVar286._4_4_ = auVar219._4_4_ * fVar212 + auVar223._4_4_ * fVar220 + auVar14._4_4_ * fVar257;
  auVar286._8_4_ = auVar219._8_4_ * fVar214 + auVar223._8_4_ * fVar221 + auVar14._8_4_ * fVar258;
  auVar286._12_4_ = auVar219._12_4_ * fVar216 + auVar223._12_4_ * fVar246 + auVar14._12_4_ * fVar259
  ;
  auVar219 = vblendps_avx(auVar286,_local_6a0,8);
  auVar15 = vsubps_avx(_local_6b0,(undefined1  [16])aVar13);
  auVar223 = vshufps_avx(auVar15,auVar15,0);
  auVar14 = vshufps_avx(auVar15,auVar15,0x55);
  auVar15 = vshufps_avx(auVar15,auVar15,0xaa);
  auVar172._0_4_ = auVar223._0_4_ * fVar196 + auVar15._0_4_ * fVar256 + auVar14._0_4_ * fVar218;
  auVar172._4_4_ = auVar223._4_4_ * fVar212 + auVar15._4_4_ * fVar257 + auVar14._4_4_ * fVar220;
  auVar172._8_4_ = auVar223._8_4_ * fVar214 + auVar15._8_4_ * fVar258 + auVar14._8_4_ * fVar221;
  auVar172._12_4_ = auVar223._12_4_ * fVar216 + auVar15._12_4_ * fVar259 + auVar14._12_4_ * fVar246;
  auVar223 = vblendps_avx(auVar172,_local_6b0,8);
  auVar266._8_4_ = 0x7fffffff;
  auVar266._0_8_ = 0x7fffffff7fffffff;
  auVar266._12_4_ = 0x7fffffff;
  auVar250 = vandps_avx(auVar250,auVar266);
  auVar202 = vandps_avx(auVar202,auVar266);
  auVar14 = vmaxps_avx(auVar250,auVar202);
  auVar250 = vandps_avx(auVar219,auVar266);
  auVar202 = vandps_avx(auVar223,auVar266);
  auVar250 = vmaxps_avx(auVar250,auVar202);
  auVar250 = vmaxps_avx(auVar14,auVar250);
  auVar202 = vmovshdup_avx(auVar250);
  auVar202 = vmaxss_avx(auVar202,auVar250);
  auVar250 = vshufpd_avx(auVar250,auVar250,1);
  auVar250 = vmaxss_avx(auVar250,auVar202);
  lVar134 = (long)(int)uVar24;
  lVar139 = lVar134 * 0x44;
  fVar263 = *(float *)(bezier_basis0 + lVar139 + 0x908);
  fVar270 = *(float *)(bezier_basis0 + lVar139 + 0x90c);
  fVar272 = *(float *)(bezier_basis0 + lVar139 + 0x910);
  fVar274 = *(float *)(bezier_basis0 + lVar139 + 0x914);
  fVar276 = *(float *)(bezier_basis0 + lVar139 + 0x918);
  fVar278 = *(float *)(bezier_basis0 + lVar139 + 0x91c);
  fVar281 = *(float *)(bezier_basis0 + lVar139 + 0x920);
  auVar202 = vshufps_avx(auVar286,auVar286,0);
  register0x00001250 = auVar202;
  _local_600 = auVar202;
  auVar219 = vshufps_avx(auVar286,auVar286,0x55);
  register0x000012d0 = auVar219;
  _local_700 = auVar219;
  pauVar4 = (undefined1 (*) [32])(bezier_basis0 + lVar139 + 0xd8c);
  fVar196 = *(float *)*pauVar4;
  fVar212 = *(float *)(bezier_basis0 + lVar139 + 0xd90);
  fVar214 = *(float *)(bezier_basis0 + lVar139 + 0xd94);
  fVar216 = *(float *)(bezier_basis0 + lVar139 + 0xd98);
  fVar218 = *(float *)(bezier_basis0 + lVar139 + 0xd9c);
  fVar220 = *(float *)(bezier_basis0 + lVar139 + 0xda0);
  fVar221 = *(float *)(bezier_basis0 + lVar139 + 0xda4);
  auVar126 = *(undefined1 (*) [28])*pauVar4;
  _auStack_4b0 = SUB3216(*pauVar4,0x10);
  auVar223 = vshufps_avx(auVar172,auVar172,0);
  register0x00001590 = auVar223;
  _local_3a0 = auVar223;
  fVar317 = auVar223._0_4_;
  fVar318 = auVar223._4_4_;
  fVar319 = auVar223._8_4_;
  fVar320 = auVar223._12_4_;
  fVar189 = auVar202._0_4_;
  fVar191 = auVar202._4_4_;
  fVar192 = auVar202._8_4_;
  fVar193 = auVar202._12_4_;
  auVar202 = vshufps_avx(auVar172,auVar172,0x55);
  register0x00001210 = auVar202;
  _local_500 = auVar202;
  fVar195 = auVar202._0_4_;
  fVar264 = auVar202._4_4_;
  fVar271 = auVar202._8_4_;
  fVar273 = auVar202._12_4_;
  fVar284 = auVar219._0_4_;
  fVar229 = auVar219._4_4_;
  fVar141 = auVar219._8_4_;
  fVar245 = auVar219._12_4_;
  auVar17 = _local_6a0;
  auVar202 = vshufps_avx(_local_6a0,_local_6a0,0xff);
  register0x00001510 = auVar202;
  _local_100 = auVar202;
  auVar16 = _local_6b0;
  auVar219 = vshufps_avx(_local_6b0,_local_6b0,0xff);
  register0x00001450 = auVar219;
  _local_120 = auVar219;
  fVar140 = auVar219._0_4_;
  fVar161 = auVar219._4_4_;
  fVar162 = auVar219._8_4_;
  fVar163 = auVar219._12_4_;
  fVar194 = auVar202._0_4_;
  fVar285 = auVar202._4_4_;
  fVar294 = auVar202._8_4_;
  auVar219 = vshufps_avx(auVar248,auVar248,0);
  register0x000014d0 = auVar219;
  _local_640 = auVar219;
  fVar246 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar139 + 0x484);
  fVar256 = *(float *)(bezier_basis0 + lVar139 + 0x488);
  fVar257 = *(float *)(bezier_basis0 + lVar139 + 0x48c);
  fVar258 = *(float *)(bezier_basis0 + lVar139 + 0x490);
  fVar259 = *(float *)(bezier_basis0 + lVar139 + 0x494);
  fVar260 = *(float *)(bezier_basis0 + lVar139 + 0x498);
  fVar261 = *(float *)(bezier_basis0 + lVar139 + 0x49c);
  auVar127 = *(undefined1 (*) [28])(bezier_basis0 + lVar139 + 0x484);
  fVar305 = auVar219._0_4_;
  fVar306 = auVar219._4_4_;
  fVar307 = auVar219._8_4_;
  fVar309 = auVar219._12_4_;
  auVar219 = vshufps_avx(auVar248,auVar248,0x55);
  register0x00001250 = auVar219;
  _local_620 = auVar219;
  fVar275 = auVar219._0_4_;
  fVar277 = auVar219._4_4_;
  fVar280 = auVar219._8_4_;
  fVar283 = auVar219._12_4_;
  auVar18 = _local_690;
  auVar219 = vshufps_avx(_local_690,_local_690,0xff);
  register0x000015d0 = auVar219;
  _local_a0 = auVar219;
  fVar295 = auVar219._0_4_;
  fVar296 = auVar219._4_4_;
  fVar297 = auVar219._8_4_;
  fVar321 = auVar219._12_4_;
  auVar219 = vshufps_avx(auVar232,auVar232,0);
  register0x00001390 = auVar219;
  _local_2c0 = auVar219;
  pauVar4 = (undefined1 (*) [32])(bezier_basis0 + lVar139);
  fVar279 = *(float *)*pauVar4;
  fVar242 = *(float *)(bezier_basis0 + lVar139 + 4);
  fVar188 = *(float *)(bezier_basis0 + lVar139 + 8);
  fVar282 = *(float *)(bezier_basis0 + lVar139 + 0xc);
  fVar308 = *(float *)(bezier_basis0 + lVar139 + 0x10);
  fVar243 = *(float *)(bezier_basis0 + lVar139 + 0x14);
  fVar190 = *(float *)(bezier_basis0 + lVar139 + 0x18);
  auVar128 = *(undefined1 (*) [28])*pauVar4;
  fVar164 = auVar219._0_4_;
  fVar165 = auVar219._4_4_;
  fVar166 = auVar219._8_4_;
  fVar167 = auVar219._12_4_;
  auVar336._0_4_ = fVar164 * fVar279 + fVar305 * fVar246 + fVar189 * fVar263 + fVar317 * fVar196;
  auVar336._4_4_ = fVar165 * fVar242 + fVar306 * fVar256 + fVar191 * fVar270 + fVar318 * fVar212;
  auVar336._8_4_ = fVar166 * fVar188 + fVar307 * fVar257 + fVar192 * fVar272 + fVar319 * fVar214;
  auVar336._12_4_ = fVar167 * fVar282 + fVar309 * fVar258 + fVar193 * fVar274 + fVar320 * fVar216;
  auVar338._16_4_ = fVar164 * fVar308 + fVar305 * fVar259 + fVar189 * fVar276 + fVar317 * fVar218;
  auVar338._0_16_ = auVar336;
  auVar338._20_4_ = fVar165 * fVar243 + fVar306 * fVar260 + fVar191 * fVar278 + fVar318 * fVar220;
  auVar338._24_4_ = fVar166 * fVar190 + fVar307 * fVar261 + fVar192 * fVar281 + fVar319 * fVar221;
  auVar338._28_4_ = fVar193 + 0.0 + 0.0 + 0.0;
  auVar219 = vshufps_avx(auVar232,auVar232,0x55);
  register0x00001290 = auVar219;
  _local_660 = auVar219;
  fVar197 = auVar219._0_4_;
  fVar213 = auVar219._4_4_;
  fVar215 = auVar219._8_4_;
  fVar217 = auVar219._12_4_;
  local_480._0_4_ = fVar197 * fVar279 + fVar275 * fVar246 + fVar284 * fVar263 + fVar195 * fVar196;
  local_480._4_4_ = fVar213 * fVar242 + fVar277 * fVar256 + fVar229 * fVar270 + fVar264 * fVar212;
  fStack_478 = fVar215 * fVar188 + fVar280 * fVar257 + fVar141 * fVar272 + fVar271 * fVar214;
  fStack_474 = fVar217 * fVar282 + fVar283 * fVar258 + fVar245 * fVar274 + fVar273 * fVar216;
  fStack_470 = fVar197 * fVar308 + fVar275 * fVar259 + fVar284 * fVar276 + fVar195 * fVar218;
  fStack_46c = fVar213 * fVar243 + fVar277 * fVar260 + fVar229 * fVar278 + fVar264 * fVar220;
  fStack_468 = fVar215 * fVar190 + fVar280 * fVar261 + fVar141 * fVar281 + fVar271 * fVar221;
  fStack_464 = fVar283 + fVar245 + fVar273 + 0.0;
  auVar122._12_4_ = fStack_7a4;
  auVar122._0_12_ = *(undefined1 (*) [12])pPVar1;
  auVar219 = vpermilps_avx(auVar122,0xff);
  register0x000013d0 = auVar219;
  _local_c0 = auVar219;
  _local_2e0 = *pauVar4;
  auVar352 = _local_2e0;
  fVar230 = auVar219._0_4_;
  fVar240 = auVar219._4_4_;
  fVar241 = auVar219._8_4_;
  local_560._0_4_ = fVar230 * fVar279 + fVar295 * fVar246 + fVar194 * fVar263 + fVar140 * fVar196;
  local_560._4_4_ = fVar240 * fVar242 + fVar296 * fVar256 + fVar285 * fVar270 + fVar161 * fVar212;
  local_560._8_4_ = fVar241 * fVar188 + fVar297 * fVar257 + fVar294 * fVar272 + fVar162 * fVar214;
  local_560._12_4_ =
       auVar219._12_4_ * fVar282 + fVar321 * fVar258 + auVar202._12_4_ * fVar274 + fVar163 * fVar216
  ;
  local_560._16_4_ = fVar230 * fVar308 + fVar295 * fVar259 + fVar194 * fVar276 + fVar140 * fVar218;
  local_560._20_4_ = fVar240 * fVar243 + fVar296 * fVar260 + fVar285 * fVar278 + fVar161 * fVar220;
  local_560._24_4_ = fVar241 * fVar190 + fVar297 * fVar261 + fVar294 * fVar281 + fVar162 * fVar221;
  local_560._28_4_ = 0.0;
  fVar196 = *(float *)*(undefined1 (*) [28])(bezier_basis1 + lVar139 + 0x908);
  fVar212 = *(float *)(bezier_basis1 + lVar139 + 0x90c);
  fVar214 = *(float *)(bezier_basis1 + lVar139 + 0x910);
  fVar216 = *(float *)(bezier_basis1 + lVar139 + 0x914);
  fVar218 = *(float *)(bezier_basis1 + lVar139 + 0x918);
  fVar220 = *(float *)(bezier_basis1 + lVar139 + 0x91c);
  fVar221 = *(float *)(bezier_basis1 + lVar139 + 0x920);
  auVar129 = *(undefined1 (*) [28])(bezier_basis1 + lVar139 + 0x908);
  local_300 = *(float *)(bezier_basis1 + lVar139 + 0xd8c);
  fStack_2fc = *(float *)(bezier_basis1 + lVar139 + 0xd90);
  fStack_2f8 = *(float *)(bezier_basis1 + lVar139 + 0xd94);
  fStack_2f4 = *(float *)(bezier_basis1 + lVar139 + 0xd98);
  fStack_2f0 = *(float *)(bezier_basis1 + lVar139 + 0xd9c);
  fStack_2ec = *(float *)(bezier_basis1 + lVar139 + 0xda0);
  fStack_2e8 = *(float *)(bezier_basis1 + lVar139 + 0xda4);
  uStack_2e4 = (float)*(undefined4 *)(bezier_basis1 + lVar139 + 0xda8);
  fVar279 = *(float *)(bezier_basis1 + lVar139 + 0x484);
  fVar242 = *(float *)(bezier_basis1 + lVar139 + 0x488);
  fVar188 = *(float *)(bezier_basis1 + lVar139 + 0x48c);
  fVar282 = *(float *)(bezier_basis1 + lVar139 + 0x490);
  fVar308 = *(float *)(bezier_basis1 + lVar139 + 0x494);
  fVar243 = *(float *)(bezier_basis1 + lVar139 + 0x498);
  fVar190 = *(float *)(bezier_basis1 + lVar139 + 0x49c);
  fVar262 = fVar163 + 0.0 + 0.0;
  fVar310 = *(float *)(bezier_basis1 + lVar139);
  fVar311 = *(float *)(bezier_basis1 + lVar139 + 4);
  fVar244 = *(float *)(bezier_basis1 + lVar139 + 8);
  fVar168 = *(float *)(bezier_basis1 + lVar139 + 0xc);
  fVar169 = *(float *)(bezier_basis1 + lVar139 + 0x10);
  fVar186 = *(float *)(bezier_basis1 + lVar139 + 0x14);
  fVar187 = *(float *)(bezier_basis1 + lVar139 + 0x18);
  local_3c0._0_4_ = fVar164 * fVar310 + fVar305 * fVar279 + fVar196 * fVar189 + fVar317 * local_300;
  local_3c0._4_4_ = fVar165 * fVar311 + fVar306 * fVar242 + fVar212 * fVar191 + fVar318 * fStack_2fc
  ;
  fStack_3b8 = fVar166 * fVar244 + fVar307 * fVar188 + fVar214 * fVar192 + fVar319 * fStack_2f8;
  fStack_3b4 = fVar167 * fVar168 + fVar309 * fVar282 + fVar216 * fVar193 + fVar320 * fStack_2f4;
  fStack_3b0 = fVar164 * fVar169 + fVar305 * fVar308 + fVar218 * fVar189 + fVar317 * fStack_2f0;
  fStack_3ac = fVar165 * fVar186 + fVar306 * fVar243 + fVar220 * fVar191 + fVar318 * fStack_2ec;
  fStack_3a8 = fVar166 * fVar187 + fVar307 * fVar190 + fVar221 * fVar192 + fVar319 * fStack_2e8;
  fStack_3a4 = fVar321 + fVar320 + 0.0;
  local_3e0._0_4_ = fVar197 * fVar310 + fVar275 * fVar279 + fVar196 * fVar284 + local_300 * fVar195;
  local_3e0._4_4_ = fVar213 * fVar311 + fVar277 * fVar242 + fVar212 * fVar229 + fStack_2fc * fVar264
  ;
  fStack_3d8 = fVar215 * fVar244 + fVar280 * fVar188 + fVar214 * fVar141 + fStack_2f8 * fVar271;
  fStack_3d4 = fVar217 * fVar168 + fVar283 * fVar282 + fVar216 * fVar245 + fStack_2f4 * fVar273;
  fStack_3d0 = fVar197 * fVar169 + fVar275 * fVar308 + fVar218 * fVar284 + fStack_2f0 * fVar195;
  fStack_3cc = fVar213 * fVar186 + fVar277 * fVar243 + fVar220 * fVar229 + fStack_2ec * fVar264;
  fStack_3c8 = fVar215 * fVar187 + fVar280 * fVar190 + fVar221 * fVar141 + fStack_2e8 * fVar271;
  fStack_3c4 = fVar320 + 0.0 + 0.0;
  auVar290._0_4_ = fVar230 * fVar310 + fVar295 * fVar279 + fVar194 * fVar196 + fVar140 * local_300;
  auVar290._4_4_ = fVar240 * fVar311 + fVar296 * fVar242 + fVar285 * fVar212 + fVar161 * fStack_2fc;
  auVar290._8_4_ = fVar241 * fVar244 + fVar297 * fVar188 + fVar294 * fVar214 + fVar162 * fStack_2f8;
  auVar290._12_4_ =
       auVar219._12_4_ * fVar168 +
       fVar321 * fVar282 + auVar202._12_4_ * fVar216 + fVar163 * fStack_2f4;
  auVar290._16_4_ = fVar230 * fVar169 + fVar295 * fVar308 + fVar194 * fVar218 + fVar140 * fStack_2f0
  ;
  auVar290._20_4_ = fVar240 * fVar186 + fVar296 * fVar243 + fVar285 * fVar220 + fVar161 * fStack_2ec
  ;
  auVar290._24_4_ = fVar241 * fVar187 + fVar297 * fVar190 + fVar294 * fVar221 + fVar162 * fStack_2e8
  ;
  auVar290._28_4_ = fVar262 + 0.0;
  auVar29 = vsubps_avx(_local_3c0,auVar338);
  _local_320 = vsubps_avx(_local_3e0,_local_480);
  fVar196 = auVar29._0_4_;
  fVar214 = auVar29._4_4_;
  auVar37._4_4_ = (float)local_480._4_4_ * fVar214;
  auVar37._0_4_ = (float)local_480._0_4_ * fVar196;
  fVar218 = auVar29._8_4_;
  auVar37._8_4_ = fStack_478 * fVar218;
  fVar221 = auVar29._12_4_;
  auVar37._12_4_ = fStack_474 * fVar221;
  fVar256 = auVar29._16_4_;
  auVar37._16_4_ = fStack_470 * fVar256;
  fVar258 = auVar29._20_4_;
  auVar37._20_4_ = fStack_46c * fVar258;
  fVar260 = auVar29._24_4_;
  auVar37._24_4_ = fStack_468 * fVar260;
  auVar37._28_4_ = 0;
  fVar212 = local_320._0_4_;
  fVar216 = local_320._4_4_;
  auVar38._4_4_ = auVar336._4_4_ * fVar216;
  auVar38._0_4_ = auVar336._0_4_ * fVar212;
  fVar220 = local_320._8_4_;
  auVar38._8_4_ = auVar336._8_4_ * fVar220;
  fVar246 = local_320._12_4_;
  auVar38._12_4_ = auVar336._12_4_ * fVar246;
  fVar257 = local_320._16_4_;
  auVar38._16_4_ = auVar338._16_4_ * fVar257;
  fVar259 = local_320._20_4_;
  auVar38._20_4_ = auVar338._20_4_ * fVar259;
  fVar261 = local_320._24_4_;
  auVar38._24_4_ = auVar338._24_4_ * fVar261;
  auVar38._28_4_ = fVar262;
  auVar28 = vsubps_avx(auVar37,auVar38);
  local_5a0 = auVar290;
  auVar144 = vmaxps_avx(local_560,auVar290);
  auVar39._4_4_ = auVar144._4_4_ * auVar144._4_4_ * (fVar214 * fVar214 + fVar216 * fVar216);
  auVar39._0_4_ = auVar144._0_4_ * auVar144._0_4_ * (fVar196 * fVar196 + fVar212 * fVar212);
  auVar39._8_4_ = auVar144._8_4_ * auVar144._8_4_ * (fVar218 * fVar218 + fVar220 * fVar220);
  auVar39._12_4_ = auVar144._12_4_ * auVar144._12_4_ * (fVar221 * fVar221 + fVar246 * fVar246);
  auVar39._16_4_ = auVar144._16_4_ * auVar144._16_4_ * (fVar256 * fVar256 + fVar257 * fVar257);
  auVar39._20_4_ = auVar144._20_4_ * auVar144._20_4_ * (fVar258 * fVar258 + fVar259 * fVar259);
  auVar39._24_4_ = auVar144._24_4_ * auVar144._24_4_ * (fVar260 * fVar260 + fVar261 * fVar261);
  auVar39._28_4_ = fStack_3a4 + fVar262;
  auVar40._4_4_ = auVar28._4_4_ * auVar28._4_4_;
  auVar40._0_4_ = auVar28._0_4_ * auVar28._0_4_;
  auVar40._8_4_ = auVar28._8_4_ * auVar28._8_4_;
  auVar40._12_4_ = auVar28._12_4_ * auVar28._12_4_;
  auVar40._16_4_ = auVar28._16_4_ * auVar28._16_4_;
  auVar40._20_4_ = auVar28._20_4_ * auVar28._20_4_;
  auVar40._24_4_ = auVar28._24_4_ * auVar28._24_4_;
  auVar40._28_4_ = auVar28._28_4_;
  auVar144 = vcmpps_avx(auVar40,auVar39,2);
  auVar249._0_4_ = (float)(int)uVar24;
  auVar249._4_12_ = auVar336._4_12_;
  local_520._0_16_ = auVar249;
  auVar202 = vshufps_avx(auVar249,auVar249,0);
  auVar252._16_16_ = auVar202;
  auVar252._0_16_ = auVar202;
  auVar28 = vcmpps_avx(_DAT_01f7b060,auVar252,1);
  auVar202 = vpermilps_avx(auVar232,0xaa);
  register0x000013d0 = auVar202;
  _local_140 = auVar202;
  auVar219 = vpermilps_avx(auVar248,0xaa);
  register0x00001590 = auVar219;
  _local_e0 = auVar219;
  auVar223 = vpermilps_avx(auVar286,0xaa);
  register0x000015d0 = auVar223;
  _local_2a0 = auVar223;
  auVar353 = ZEXT3264(_local_2a0);
  auVar14 = vpermilps_avx(auVar172,0xaa);
  register0x00001210 = auVar14;
  _local_540 = auVar14;
  auVar30 = auVar28 & auVar144;
  auVar15 = vpermilps_avx((undefined1  [16])aVar13,0xff);
  _local_780 = ZEXT1632(auVar15);
  auVar250 = ZEXT416((uint)(auVar250._0_4_ * 4.7683716e-07));
  fVar196 = fVar189;
  fVar212 = fVar191;
  fVar214 = fVar192;
  fVar216 = fVar193;
  fVar218 = fVar197;
  fVar220 = fVar213;
  fVar221 = fVar215;
  fVar246 = fVar195;
  fVar256 = fVar264;
  fVar257 = fVar271;
  fVar258 = fVar273;
  if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar30 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar30 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar30 >> 0x7f,0) != '\0') ||
        (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar30 >> 0xbf,0) != '\0') ||
      (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar30[0x1f] < '\0') {
    local_7b8 = pGVar25;
    auVar144 = vandps_avx(auVar144,auVar28);
    fVar285 = auVar202._0_4_;
    fVar294 = auVar202._4_4_;
    fVar295 = auVar202._8_4_;
    fVar296 = auVar202._12_4_;
    fVar342 = auVar219._0_4_;
    fVar346 = auVar219._4_4_;
    fVar347 = auVar219._8_4_;
    fVar348 = auVar219._12_4_;
    local_400._0_4_ = auVar129._0_4_;
    local_400._4_4_ = auVar129._4_4_;
    fStack_3f8 = auVar129._8_4_;
    fStack_3f4 = auVar129._12_4_;
    fStack_3f0 = auVar129._16_4_;
    fStack_3ec = auVar129._20_4_;
    fStack_3e8 = auVar129._24_4_;
    fVar349 = auVar223._0_4_;
    fVar354 = auVar223._4_4_;
    fVar355 = auVar223._8_4_;
    fVar356 = auVar223._12_4_;
    fVar140 = auVar14._0_4_;
    fVar161 = auVar14._4_4_;
    fVar162 = auVar14._8_4_;
    fVar163 = auVar14._12_4_;
    fVar259 = auVar144._28_4_ + auVar28._28_4_ + 0.0;
    local_400._0_4_ =
         fVar285 * fVar310 +
         fVar342 * fVar279 + fVar349 * (float)local_400._0_4_ + fVar140 * local_300;
    local_400._4_4_ =
         fVar294 * fVar311 +
         fVar346 * fVar242 + fVar354 * (float)local_400._4_4_ + fVar161 * fStack_2fc;
    fStack_3f8 = fVar295 * fVar244 + fVar347 * fVar188 + fVar355 * fStack_3f8 + fVar162 * fStack_2f8
    ;
    fStack_3f4 = fVar296 * fVar168 + fVar348 * fVar282 + fVar356 * fStack_3f4 + fVar163 * fStack_2f4
    ;
    fStack_3f0 = fVar285 * fVar169 + fVar342 * fVar308 + fVar349 * fStack_3f0 + fVar140 * fStack_2f0
    ;
    fStack_3ec = fVar294 * fVar186 + fVar346 * fVar243 + fVar354 * fStack_3ec + fVar161 * fStack_2ec
    ;
    fStack_3e8 = fVar295 * fVar187 + fVar347 * fVar190 + fVar355 * fStack_3e8 + fVar162 * fStack_2e8
    ;
    fStack_3e4 = *(float *)(bezier_basis1 + lVar139 + 0x1c) + fVar259;
    _local_7a0 = auVar250;
    local_2e0._0_4_ = auVar128._0_4_;
    local_2e0._4_4_ = auVar128._4_4_;
    fStack_2d8 = auVar128._8_4_;
    fStack_2d4 = auVar128._12_4_;
    fStack_2d0 = auVar128._16_4_;
    fStack_2cc = auVar128._20_4_;
    fStack_2c8 = auVar128._24_4_;
    local_4e0._0_4_ = auVar127._0_4_;
    local_4e0._4_4_ = auVar127._4_4_;
    fStack_4d8 = auVar127._8_4_;
    fStack_4d4 = auVar127._12_4_;
    fStack_4d0 = auVar127._16_4_;
    fStack_4cc = auVar127._20_4_;
    fStack_4c8 = auVar127._24_4_;
    local_4c0._0_4_ = auVar126._0_4_;
    local_4c0._4_4_ = auVar126._4_4_;
    fStack_4b8 = auVar126._8_4_;
    fStack_4b4 = auVar126._12_4_;
    auStack_4b0._0_4_ = auVar126._16_4_;
    auStack_4b0._4_4_ = auVar126._20_4_;
    fStack_4a8 = auVar126._24_4_;
    local_4a0 = fVar285 * (float)local_2e0._0_4_ +
                fVar342 * (float)local_4e0._0_4_ +
                fVar349 * fVar263 + fVar140 * (float)local_4c0._0_4_;
    fStack_49c = fVar294 * (float)local_2e0._4_4_ +
                 fVar346 * (float)local_4e0._4_4_ +
                 fVar354 * fVar270 + fVar161 * (float)local_4c0._4_4_;
    fStack_498 = fVar295 * fStack_2d8 +
                 fVar347 * fStack_4d8 + fVar355 * fVar272 + fVar162 * fStack_4b8;
    fStack_494 = fVar296 * fStack_2d4 +
                 fVar348 * fStack_4d4 + fVar356 * fVar274 + fVar163 * fStack_4b4;
    fStack_490 = fVar285 * fStack_2d0 +
                 fVar342 * fStack_4d0 + fVar349 * fVar276 + fVar140 * (float)auStack_4b0._0_4_;
    fStack_48c = fVar294 * fStack_2cc +
                 fVar346 * fStack_4cc + fVar354 * fVar278 + fVar161 * (float)auStack_4b0._4_4_;
    fStack_488 = fVar295 * fStack_2c8 +
                 fVar347 * fStack_4c8 + fVar355 * fVar281 + fVar162 * fStack_4a8;
    fStack_484 = fStack_3e4 + *(float *)(bezier_basis1 + lVar139 + 0x1c) + fVar259 + 0.0;
    fVar259 = *(float *)(bezier_basis0 + lVar139 + 0x1210);
    fVar260 = *(float *)(bezier_basis0 + lVar139 + 0x1214);
    fVar261 = *(float *)(bezier_basis0 + lVar139 + 0x1218);
    fVar263 = *(float *)(bezier_basis0 + lVar139 + 0x121c);
    fVar270 = *(float *)(bezier_basis0 + lVar139 + 0x1220);
    fVar272 = *(float *)(bezier_basis0 + lVar139 + 0x1224);
    fVar274 = *(float *)(bezier_basis0 + lVar139 + 0x1228);
    fVar276 = *(float *)(bezier_basis0 + lVar139 + 0x1694);
    fVar278 = *(float *)(bezier_basis0 + lVar139 + 0x1698);
    fVar281 = *(float *)(bezier_basis0 + lVar139 + 0x169c);
    fVar279 = *(float *)(bezier_basis0 + lVar139 + 0x16a0);
    fVar242 = *(float *)(bezier_basis0 + lVar139 + 0x16a4);
    fVar188 = *(float *)(bezier_basis0 + lVar139 + 0x16a8);
    fVar282 = *(float *)(bezier_basis0 + lVar139 + 0x16ac);
    fVar308 = *(float *)(bezier_basis0 + lVar139 + 0x1b18);
    fVar243 = *(float *)(bezier_basis0 + lVar139 + 0x1b1c);
    fVar190 = *(float *)(bezier_basis0 + lVar139 + 0x1b20);
    fVar310 = *(float *)(bezier_basis0 + lVar139 + 0x1b24);
    fVar311 = *(float *)(bezier_basis0 + lVar139 + 0x1b28);
    fVar244 = *(float *)(bezier_basis0 + lVar139 + 0x1b2c);
    fVar168 = *(float *)(bezier_basis0 + lVar139 + 0x1b30);
    fVar169 = *(float *)(bezier_basis0 + lVar139 + 0x1f9c);
    fVar186 = *(float *)(bezier_basis0 + lVar139 + 0x1fa0);
    fVar187 = *(float *)(bezier_basis0 + lVar139 + 0x1fa4);
    fVar262 = *(float *)(bezier_basis0 + lVar139 + 0x1fa8);
    fVar230 = *(float *)(bezier_basis0 + lVar139 + 0x1fac);
    fVar240 = *(float *)(bezier_basis0 + lVar139 + 0x1fb0);
    fVar241 = *(float *)(bezier_basis0 + lVar139 + 0x1fb4);
    fVar297 = *(float *)(bezier_basis1 + lVar139 + 0x4a0) + fVar296;
    fVar194 = *(float *)(bezier_basis0 + lVar139 + 0x1b34) +
              *(float *)(bezier_basis0 + lVar139 + 0x1fb8);
    fVar321 = *(float *)(bezier_basis0 + lVar139 + 0x16b0) + fVar194;
    local_4e0._4_4_ = fVar165 * fVar260 + fVar306 * fVar278 + fVar191 * fVar243 + fVar318 * fVar186;
    local_4e0._0_4_ = fVar164 * fVar259 + fVar305 * fVar276 + fVar189 * fVar308 + fVar317 * fVar169;
    fStack_4d8 = fVar166 * fVar261 + fVar307 * fVar281 + fVar192 * fVar190 + fVar319 * fVar187;
    fStack_4d4 = fVar167 * fVar263 + fVar309 * fVar279 + fVar193 * fVar310 + fVar320 * fVar262;
    fStack_4d0 = fVar164 * fVar270 + fVar305 * fVar242 + fVar189 * fVar311 + fVar317 * fVar230;
    fStack_4cc = fVar165 * fVar272 + fVar306 * fVar188 + fVar191 * fVar244 + fVar318 * fVar240;
    fStack_4c8 = fVar166 * fVar274 + fVar307 * fVar282 + fVar192 * fVar168 + fVar319 * fVar241;
    fStack_4c4 = *(float *)(bezier_basis0 + lVar139 + 0x16b0) +
                 *(float *)(bezier_basis0 + lVar139 + 0x1fb8) + fVar297;
    auVar177._0_4_ = fVar197 * fVar259 + fVar284 * fVar308 + fVar195 * fVar169 + fVar275 * fVar276;
    auVar177._4_4_ = fVar213 * fVar260 + fVar229 * fVar243 + fVar264 * fVar186 + fVar277 * fVar278;
    auVar177._8_4_ = fVar215 * fVar261 + fVar141 * fVar190 + fVar271 * fVar187 + fVar280 * fVar281;
    auVar177._12_4_ = fVar217 * fVar263 + fVar245 * fVar310 + fVar273 * fVar262 + fVar283 * fVar279;
    auVar177._16_4_ = fVar197 * fVar270 + fVar284 * fVar311 + fVar195 * fVar230 + fVar275 * fVar242;
    auVar177._20_4_ = fVar213 * fVar272 + fVar229 * fVar244 + fVar264 * fVar240 + fVar277 * fVar188;
    auVar177._24_4_ = fVar215 * fVar274 + fVar141 * fVar168 + fVar271 * fVar241 + fVar280 * fVar282;
    auVar177._28_4_ = fVar194 + *(float *)(bezier_basis1 + lVar139 + 0x4a0) + fVar283 + fVar297;
    auVar227._0_4_ = fVar342 * fVar276 + fVar349 * fVar308 + fVar140 * fVar169 + fVar285 * fVar259;
    auVar227._4_4_ = fVar346 * fVar278 + fVar354 * fVar243 + fVar161 * fVar186 + fVar294 * fVar260;
    auVar227._8_4_ = fVar347 * fVar281 + fVar355 * fVar190 + fVar162 * fVar187 + fVar295 * fVar261;
    auVar227._12_4_ = fVar348 * fVar279 + fVar356 * fVar310 + fVar163 * fVar262 + fVar296 * fVar263;
    auVar227._16_4_ = fVar342 * fVar242 + fVar349 * fVar311 + fVar140 * fVar230 + fVar285 * fVar270;
    auVar227._20_4_ = fVar346 * fVar188 + fVar354 * fVar244 + fVar161 * fVar240 + fVar294 * fVar272;
    auVar227._24_4_ = fVar347 * fVar282 + fVar355 * fVar168 + fVar162 * fVar241 + fVar295 * fVar274;
    auVar227._28_4_ = fVar321 + *(float *)(bezier_basis0 + lVar139 + 0x122c);
    fVar259 = *(float *)(bezier_basis1 + lVar139 + 0x1b18);
    fVar260 = *(float *)(bezier_basis1 + lVar139 + 0x1b1c);
    fVar261 = *(float *)(bezier_basis1 + lVar139 + 0x1b20);
    fVar263 = *(float *)(bezier_basis1 + lVar139 + 0x1b24);
    fVar270 = *(float *)(bezier_basis1 + lVar139 + 0x1b28);
    fVar272 = *(float *)(bezier_basis1 + lVar139 + 0x1b2c);
    fVar274 = *(float *)(bezier_basis1 + lVar139 + 0x1b30);
    fVar276 = *(float *)(bezier_basis1 + lVar139 + 0x1f9c);
    fVar278 = *(float *)(bezier_basis1 + lVar139 + 0x1fa0);
    fVar281 = *(float *)(bezier_basis1 + lVar139 + 0x1fa4);
    fVar279 = *(float *)(bezier_basis1 + lVar139 + 0x1fa8);
    fVar242 = *(float *)(bezier_basis1 + lVar139 + 0x1fac);
    fVar188 = *(float *)(bezier_basis1 + lVar139 + 0x1fb0);
    fVar282 = *(float *)(bezier_basis1 + lVar139 + 0x1fb4);
    fVar308 = *(float *)(bezier_basis1 + lVar139 + 0x1694);
    fVar243 = *(float *)(bezier_basis1 + lVar139 + 0x1698);
    fVar190 = *(float *)(bezier_basis1 + lVar139 + 0x169c);
    fVar310 = *(float *)(bezier_basis1 + lVar139 + 0x16a0);
    fVar311 = *(float *)(bezier_basis1 + lVar139 + 0x16a4);
    fVar244 = *(float *)(bezier_basis1 + lVar139 + 0x16a8);
    fVar168 = *(float *)(bezier_basis1 + lVar139 + 0x16ac);
    fVar169 = *(float *)(bezier_basis1 + lVar139 + 0x1210);
    fVar186 = *(float *)(bezier_basis1 + lVar139 + 0x1214);
    fVar187 = *(float *)(bezier_basis1 + lVar139 + 0x1218);
    fVar262 = *(float *)(bezier_basis1 + lVar139 + 0x121c);
    fVar230 = *(float *)(bezier_basis1 + lVar139 + 0x1220);
    fVar240 = *(float *)(bezier_basis1 + lVar139 + 0x1224);
    fVar241 = *(float *)(bezier_basis1 + lVar139 + 0x1228);
    auVar300._0_4_ = fVar164 * fVar169 + fVar305 * fVar308 + fVar189 * fVar259 + fVar317 * fVar276;
    auVar300._4_4_ = fVar165 * fVar186 + fVar306 * fVar243 + fVar191 * fVar260 + fVar318 * fVar278;
    auVar300._8_4_ = fVar166 * fVar187 + fVar307 * fVar190 + fVar192 * fVar261 + fVar319 * fVar281;
    auVar300._12_4_ = fVar167 * fVar262 + fVar309 * fVar310 + fVar193 * fVar263 + fVar320 * fVar279;
    auVar300._16_4_ = fVar164 * fVar230 + fVar305 * fVar311 + fVar189 * fVar270 + fVar317 * fVar242;
    auVar300._20_4_ = fVar165 * fVar240 + fVar306 * fVar244 + fVar191 * fVar272 + fVar318 * fVar188;
    auVar300._24_4_ = fVar166 * fVar241 + fVar307 * fVar168 + fVar192 * fVar274 + fVar319 * fVar282;
    auVar300._28_4_ = fVar273 + fVar273 + fVar321 + fVar320;
    auVar313._0_4_ = fVar197 * fVar169 + fVar308 * fVar275 + fVar284 * fVar259 + fVar195 * fVar276;
    auVar313._4_4_ = fVar213 * fVar186 + fVar243 * fVar277 + fVar229 * fVar260 + fVar264 * fVar278;
    auVar313._8_4_ = fVar215 * fVar187 + fVar190 * fVar280 + fVar141 * fVar261 + fVar271 * fVar281;
    auVar313._12_4_ = fVar217 * fVar262 + fVar310 * fVar283 + fVar245 * fVar263 + fVar273 * fVar279;
    auVar313._16_4_ = fVar197 * fVar230 + fVar311 * fVar275 + fVar284 * fVar270 + fVar195 * fVar242;
    auVar313._20_4_ = fVar213 * fVar240 + fVar244 * fVar277 + fVar229 * fVar272 + fVar264 * fVar188;
    auVar313._24_4_ = fVar215 * fVar241 + fVar168 * fVar280 + fVar141 * fVar274 + fVar271 * fVar282;
    auVar313._28_4_ = fVar273 + fVar273 + fVar273 + fVar321;
    auVar237._0_4_ = fVar285 * fVar169 + fVar342 * fVar308 + fVar349 * fVar259 + fVar140 * fVar276;
    auVar237._4_4_ = fVar294 * fVar186 + fVar346 * fVar243 + fVar354 * fVar260 + fVar161 * fVar278;
    auVar237._8_4_ = fVar295 * fVar187 + fVar347 * fVar190 + fVar355 * fVar261 + fVar162 * fVar281;
    auVar237._12_4_ = fVar296 * fVar262 + fVar348 * fVar310 + fVar356 * fVar263 + fVar163 * fVar279;
    auVar237._16_4_ = fVar285 * fVar230 + fVar342 * fVar311 + fVar349 * fVar270 + fVar140 * fVar242;
    auVar237._20_4_ = fVar294 * fVar240 + fVar346 * fVar244 + fVar354 * fVar272 + fVar161 * fVar188;
    auVar237._24_4_ = fVar295 * fVar241 + fVar347 * fVar168 + fVar355 * fVar274 + fVar162 * fVar282;
    auVar237._28_4_ =
         *(float *)(bezier_basis1 + lVar139 + 0x122c) +
         *(float *)(bezier_basis1 + lVar139 + 0x16b0) +
         *(float *)(bezier_basis1 + lVar139 + 0x1b34) + *(float *)(bezier_basis1 + lVar139 + 0x1fb8)
    ;
    auVar209._8_4_ = 0x7fffffff;
    auVar209._0_8_ = 0x7fffffff7fffffff;
    auVar209._12_4_ = 0x7fffffff;
    auVar209._16_4_ = 0x7fffffff;
    auVar209._20_4_ = 0x7fffffff;
    auVar209._24_4_ = 0x7fffffff;
    auVar209._28_4_ = 0x7fffffff;
    auVar28 = vandps_avx(_local_4e0,auVar209);
    auVar30 = vandps_avx(auVar177,auVar209);
    auVar30 = vmaxps_avx(auVar28,auVar30);
    auVar28 = vandps_avx(auVar227,auVar209);
    auVar28 = vmaxps_avx(auVar30,auVar28);
    auVar202 = vpermilps_avx(auVar250,0);
    auVar291._16_16_ = auVar202;
    auVar291._0_16_ = auVar202;
    auVar28 = vcmpps_avx(auVar28,auVar291,1);
    auVar31 = vblendvps_avx(_local_4e0,auVar29,auVar28);
    auVar32 = vblendvps_avx(auVar177,_local_320,auVar28);
    auVar28 = vandps_avx(auVar300,auVar209);
    auVar30 = vandps_avx(auVar313,auVar209);
    auVar33 = vmaxps_avx(auVar28,auVar30);
    auVar28 = vandps_avx(auVar237,auVar209);
    auVar28 = vmaxps_avx(auVar33,auVar28);
    auVar33 = vcmpps_avx(auVar28,auVar291,1);
    auVar28 = vblendvps_avx(auVar300,auVar29,auVar33);
    auVar29 = vblendvps_avx(auVar313,_local_320,auVar33);
    fVar141 = auVar31._0_4_;
    fVar245 = auVar31._4_4_;
    fVar262 = auVar31._8_4_;
    fVar164 = auVar31._12_4_;
    fVar165 = auVar31._16_4_;
    fVar166 = auVar31._20_4_;
    fVar167 = auVar31._24_4_;
    fVar230 = auVar28._0_4_;
    fVar240 = auVar28._4_4_;
    fVar241 = auVar28._8_4_;
    fVar140 = auVar28._12_4_;
    fVar161 = auVar28._16_4_;
    fVar162 = auVar28._20_4_;
    fVar163 = auVar28._24_4_;
    fVar259 = auVar32._0_4_;
    fVar270 = auVar32._4_4_;
    fVar278 = auVar32._8_4_;
    fVar188 = auVar32._12_4_;
    fVar190 = auVar32._16_4_;
    fVar168 = auVar32._20_4_;
    fVar275 = auVar32._24_4_;
    auVar148._0_4_ = fVar259 * fVar259 + fVar141 * fVar141;
    auVar148._4_4_ = fVar270 * fVar270 + fVar245 * fVar245;
    auVar148._8_4_ = fVar278 * fVar278 + fVar262 * fVar262;
    auVar148._12_4_ = fVar188 * fVar188 + fVar164 * fVar164;
    auVar148._16_4_ = fVar190 * fVar190 + fVar165 * fVar165;
    auVar148._20_4_ = fVar168 * fVar168 + fVar166 * fVar166;
    auVar148._24_4_ = fVar275 * fVar275 + fVar167 * fVar167;
    auVar148._28_4_ = auVar313._28_4_ + auVar31._28_4_;
    auVar31 = vrsqrtps_avx(auVar148);
    fVar260 = auVar31._0_4_;
    fVar261 = auVar31._4_4_;
    auVar41._4_4_ = fVar261 * 1.5;
    auVar41._0_4_ = fVar260 * 1.5;
    fVar263 = auVar31._8_4_;
    auVar41._8_4_ = fVar263 * 1.5;
    fVar272 = auVar31._12_4_;
    auVar41._12_4_ = fVar272 * 1.5;
    fVar274 = auVar31._16_4_;
    auVar41._16_4_ = fVar274 * 1.5;
    fVar276 = auVar31._20_4_;
    auVar41._20_4_ = fVar276 * 1.5;
    fVar281 = auVar31._24_4_;
    auVar41._24_4_ = fVar281 * 1.5;
    auVar41._28_4_ = auVar30._28_4_;
    auVar42._4_4_ = fVar261 * fVar261 * fVar261 * auVar148._4_4_ * 0.5;
    auVar42._0_4_ = fVar260 * fVar260 * fVar260 * auVar148._0_4_ * 0.5;
    auVar42._8_4_ = fVar263 * fVar263 * fVar263 * auVar148._8_4_ * 0.5;
    auVar42._12_4_ = fVar272 * fVar272 * fVar272 * auVar148._12_4_ * 0.5;
    auVar42._16_4_ = fVar274 * fVar274 * fVar274 * auVar148._16_4_ * 0.5;
    auVar42._20_4_ = fVar276 * fVar276 * fVar276 * auVar148._20_4_ * 0.5;
    auVar42._24_4_ = fVar281 * fVar281 * fVar281 * auVar148._24_4_ * 0.5;
    auVar42._28_4_ = auVar148._28_4_;
    auVar31 = vsubps_avx(auVar41,auVar42);
    fVar260 = auVar31._0_4_;
    fVar272 = auVar31._4_4_;
    fVar281 = auVar31._8_4_;
    fVar282 = auVar31._12_4_;
    fVar310 = auVar31._16_4_;
    fVar169 = auVar31._20_4_;
    fVar277 = auVar31._24_4_;
    fVar284 = auVar32._28_4_;
    fVar261 = auVar29._0_4_;
    fVar274 = auVar29._4_4_;
    fVar279 = auVar29._8_4_;
    fVar308 = auVar29._12_4_;
    fVar311 = auVar29._16_4_;
    fVar186 = auVar29._20_4_;
    fVar280 = auVar29._24_4_;
    auVar149._0_4_ = fVar261 * fVar261 + fVar230 * fVar230;
    auVar149._4_4_ = fVar274 * fVar274 + fVar240 * fVar240;
    auVar149._8_4_ = fVar279 * fVar279 + fVar241 * fVar241;
    auVar149._12_4_ = fVar308 * fVar308 + fVar140 * fVar140;
    auVar149._16_4_ = fVar311 * fVar311 + fVar161 * fVar161;
    auVar149._20_4_ = fVar186 * fVar186 + fVar162 * fVar162;
    auVar149._24_4_ = fVar280 * fVar280 + fVar163 * fVar163;
    auVar149._28_4_ = auVar28._28_4_ + auVar31._28_4_;
    auVar28 = vrsqrtps_avx(auVar149);
    fVar263 = auVar28._0_4_;
    fVar276 = auVar28._4_4_;
    auVar43._4_4_ = fVar276 * 1.5;
    auVar43._0_4_ = fVar263 * 1.5;
    fVar242 = auVar28._8_4_;
    auVar43._8_4_ = fVar242 * 1.5;
    fVar243 = auVar28._12_4_;
    auVar43._12_4_ = fVar243 * 1.5;
    fVar244 = auVar28._16_4_;
    auVar43._16_4_ = fVar244 * 1.5;
    fVar187 = auVar28._20_4_;
    auVar43._20_4_ = fVar187 * 1.5;
    fVar283 = auVar28._24_4_;
    auVar43._24_4_ = fVar283 * 1.5;
    auVar43._28_4_ = auVar30._28_4_;
    fVar229 = auVar28._28_4_;
    auVar44._4_4_ = fVar276 * fVar276 * fVar276 * auVar149._4_4_ * 0.5;
    auVar44._0_4_ = fVar263 * fVar263 * fVar263 * auVar149._0_4_ * 0.5;
    auVar44._8_4_ = fVar242 * fVar242 * fVar242 * auVar149._8_4_ * 0.5;
    auVar44._12_4_ = fVar243 * fVar243 * fVar243 * auVar149._12_4_ * 0.5;
    auVar44._16_4_ = fVar244 * fVar244 * fVar244 * auVar149._16_4_ * 0.5;
    auVar44._20_4_ = fVar187 * fVar187 * fVar187 * auVar149._20_4_ * 0.5;
    auVar44._24_4_ = fVar283 * fVar283 * fVar283 * auVar149._24_4_ * 0.5;
    auVar44._28_4_ = auVar149._28_4_;
    auVar28 = vsubps_avx(auVar43,auVar44);
    fVar263 = auVar28._0_4_;
    fVar276 = auVar28._4_4_;
    fVar242 = auVar28._8_4_;
    fVar243 = auVar28._12_4_;
    fVar244 = auVar28._16_4_;
    fVar187 = auVar28._20_4_;
    fVar283 = auVar28._24_4_;
    fVar259 = (float)local_560._0_4_ * fVar259 * fVar260;
    fVar270 = local_560._4_4_ * fVar270 * fVar272;
    auVar45._4_4_ = fVar270;
    auVar45._0_4_ = fVar259;
    fVar278 = local_560._8_4_ * fVar278 * fVar281;
    auVar45._8_4_ = fVar278;
    fVar188 = local_560._12_4_ * fVar188 * fVar282;
    auVar45._12_4_ = fVar188;
    fVar190 = local_560._16_4_ * fVar190 * fVar310;
    auVar45._16_4_ = fVar190;
    fVar168 = local_560._20_4_ * fVar168 * fVar169;
    auVar45._20_4_ = fVar168;
    fVar275 = local_560._24_4_ * fVar275 * fVar277;
    auVar45._24_4_ = fVar275;
    auVar45._28_4_ = fVar284;
    local_4c0._4_4_ = auVar336._4_4_ + fVar270;
    local_4c0._0_4_ = auVar336._0_4_ + fVar259;
    fStack_4b8 = auVar336._8_4_ + fVar278;
    fStack_4b4 = auVar336._12_4_ + fVar188;
    auStack_4b0._0_4_ = auVar338._16_4_ + fVar190;
    auStack_4b0._4_4_ = auVar338._20_4_ + fVar168;
    fStack_4a8 = auVar338._24_4_ + fVar275;
    fStack_4a4 = auVar338._28_4_ + fVar284;
    fVar259 = (float)local_560._0_4_ * fVar260 * -fVar141;
    fVar270 = local_560._4_4_ * fVar272 * -fVar245;
    auVar46._4_4_ = fVar270;
    auVar46._0_4_ = fVar259;
    fVar278 = local_560._8_4_ * fVar281 * -fVar262;
    auVar46._8_4_ = fVar278;
    fVar188 = local_560._12_4_ * fVar282 * -fVar164;
    auVar46._12_4_ = fVar188;
    fVar190 = local_560._16_4_ * fVar310 * -fVar165;
    auVar46._16_4_ = fVar190;
    fVar168 = local_560._20_4_ * fVar169 * -fVar166;
    auVar46._20_4_ = fVar168;
    fVar275 = local_560._24_4_ * fVar277 * -fVar167;
    auVar46._24_4_ = fVar275;
    auVar46._28_4_ = 0x3f000000;
    local_4e0._4_4_ = fVar270 + (float)local_480._4_4_;
    local_4e0._0_4_ = fVar259 + (float)local_480._0_4_;
    fStack_4d8 = fVar278 + fStack_478;
    fStack_4d4 = fVar188 + fStack_474;
    fStack_4d0 = fVar190 + fStack_470;
    fStack_4cc = fVar168 + fStack_46c;
    fStack_4c8 = fVar275 + fStack_468;
    fStack_4c4 = fStack_464 + 0.5;
    fVar259 = (float)local_560._0_4_ * fVar260 * 0.0;
    fVar260 = local_560._4_4_ * fVar272 * 0.0;
    auVar47._4_4_ = fVar260;
    auVar47._0_4_ = fVar259;
    fVar270 = local_560._8_4_ * fVar281 * 0.0;
    auVar47._8_4_ = fVar270;
    fVar272 = local_560._12_4_ * fVar282 * 0.0;
    auVar47._12_4_ = fVar272;
    fVar278 = local_560._16_4_ * fVar310 * 0.0;
    auVar47._16_4_ = fVar278;
    fVar281 = local_560._20_4_ * fVar169 * 0.0;
    auVar47._20_4_ = fVar281;
    fVar188 = local_560._24_4_ * fVar277 * 0.0;
    auVar47._24_4_ = fVar188;
    auVar47._28_4_ = fVar296;
    auVar123._4_4_ = fStack_49c;
    auVar123._0_4_ = local_4a0;
    auVar123._8_4_ = fStack_498;
    auVar123._12_4_ = fStack_494;
    auVar123._16_4_ = fStack_490;
    auVar123._20_4_ = fStack_48c;
    auVar123._24_4_ = fStack_488;
    auVar123._28_4_ = fStack_484;
    auVar301._0_4_ = fVar259 + local_4a0;
    auVar301._4_4_ = fVar260 + fStack_49c;
    auVar301._8_4_ = fVar270 + fStack_498;
    auVar301._12_4_ = fVar272 + fStack_494;
    auVar301._16_4_ = fVar278 + fStack_490;
    auVar301._20_4_ = fVar281 + fStack_48c;
    auVar301._24_4_ = fVar188 + fStack_488;
    auVar301._28_4_ = fVar296 + fStack_484;
    fVar259 = auVar290._0_4_ * fVar261 * fVar263;
    fVar260 = auVar290._4_4_ * fVar274 * fVar276;
    auVar48._4_4_ = fVar260;
    auVar48._0_4_ = fVar259;
    fVar261 = auVar290._8_4_ * fVar279 * fVar242;
    auVar48._8_4_ = fVar261;
    fVar270 = auVar290._12_4_ * fVar308 * fVar243;
    auVar48._12_4_ = fVar270;
    fVar272 = auVar290._16_4_ * fVar311 * fVar244;
    auVar48._16_4_ = fVar272;
    fVar274 = auVar290._20_4_ * fVar186 * fVar187;
    auVar48._20_4_ = fVar274;
    fVar278 = auVar290._24_4_ * fVar280 * fVar283;
    auVar48._24_4_ = fVar278;
    auVar48._28_4_ = auVar29._28_4_;
    auVar32 = vsubps_avx(auVar338,auVar45);
    auVar324._0_4_ = (float)local_3c0._0_4_ + fVar259;
    auVar324._4_4_ = (float)local_3c0._4_4_ + fVar260;
    auVar324._8_4_ = fStack_3b8 + fVar261;
    auVar324._12_4_ = fStack_3b4 + fVar270;
    auVar324._16_4_ = fStack_3b0 + fVar272;
    auVar324._20_4_ = fStack_3ac + fVar274;
    auVar324._24_4_ = fStack_3a8 + fVar278;
    auVar324._28_4_ = fStack_3a4 + auVar29._28_4_;
    fVar259 = auVar290._0_4_ * -fVar230 * fVar263;
    fVar260 = auVar290._4_4_ * -fVar240 * fVar276;
    auVar49._4_4_ = fVar260;
    auVar49._0_4_ = fVar259;
    fVar261 = auVar290._8_4_ * -fVar241 * fVar242;
    auVar49._8_4_ = fVar261;
    fVar270 = auVar290._12_4_ * -fVar140 * fVar243;
    auVar49._12_4_ = fVar270;
    fVar272 = auVar290._16_4_ * -fVar161 * fVar244;
    auVar49._16_4_ = fVar272;
    fVar274 = auVar290._20_4_ * -fVar162 * fVar187;
    auVar49._20_4_ = fVar274;
    fVar278 = auVar290._24_4_ * -fVar163 * fVar283;
    auVar49._24_4_ = fVar278;
    auVar49._28_4_ = fVar284;
    auVar35 = vsubps_avx(_local_480,auVar46);
    auVar344._0_4_ = (float)local_3e0._0_4_ + fVar259;
    auVar344._4_4_ = (float)local_3e0._4_4_ + fVar260;
    auVar344._8_4_ = fStack_3d8 + fVar261;
    auVar344._12_4_ = fStack_3d4 + fVar270;
    auVar344._16_4_ = fStack_3d0 + fVar272;
    auVar344._20_4_ = fStack_3cc + fVar274;
    auVar344._24_4_ = fStack_3c8 + fVar278;
    auVar344._28_4_ = fStack_3c4 + fVar284;
    fVar259 = fVar263 * 0.0 * auVar290._0_4_;
    fVar260 = fVar276 * 0.0 * auVar290._4_4_;
    auVar50._4_4_ = fVar260;
    auVar50._0_4_ = fVar259;
    fVar261 = fVar242 * 0.0 * auVar290._8_4_;
    auVar50._8_4_ = fVar261;
    fVar263 = fVar243 * 0.0 * auVar290._12_4_;
    auVar50._12_4_ = fVar263;
    fVar270 = fVar244 * 0.0 * auVar290._16_4_;
    auVar50._16_4_ = fVar270;
    fVar272 = fVar187 * 0.0 * auVar290._20_4_;
    auVar50._20_4_ = fVar272;
    fVar274 = fVar283 * 0.0 * auVar290._24_4_;
    auVar50._24_4_ = fVar274;
    auVar50._28_4_ = fVar229;
    auVar34 = vsubps_avx(auVar123,auVar47);
    auVar350._0_4_ = (float)local_400._0_4_ + fVar259;
    auVar350._4_4_ = (float)local_400._4_4_ + fVar260;
    auVar350._8_4_ = fStack_3f8 + fVar261;
    auVar350._12_4_ = fStack_3f4 + fVar263;
    auVar350._16_4_ = fStack_3f0 + fVar270;
    auVar350._20_4_ = fStack_3ec + fVar272;
    auVar350._24_4_ = fStack_3e8 + fVar274;
    auVar350._28_4_ = fStack_3e4 + fVar229;
    auVar28 = vsubps_avx(_local_3c0,auVar48);
    auVar29 = vsubps_avx(_local_3e0,auVar49);
    auVar30 = vsubps_avx(_local_400,auVar50);
    auVar31 = vsubps_avx(auVar344,auVar35);
    auVar33 = vsubps_avx(auVar350,auVar34);
    auVar51._4_4_ = auVar34._4_4_ * auVar31._4_4_;
    auVar51._0_4_ = auVar34._0_4_ * auVar31._0_4_;
    auVar51._8_4_ = auVar34._8_4_ * auVar31._8_4_;
    auVar51._12_4_ = auVar34._12_4_ * auVar31._12_4_;
    auVar51._16_4_ = auVar34._16_4_ * auVar31._16_4_;
    auVar51._20_4_ = auVar34._20_4_ * auVar31._20_4_;
    auVar51._24_4_ = auVar34._24_4_ * auVar31._24_4_;
    auVar51._28_4_ = fVar229;
    auVar52._4_4_ = auVar35._4_4_ * auVar33._4_4_;
    auVar52._0_4_ = auVar35._0_4_ * auVar33._0_4_;
    auVar52._8_4_ = auVar35._8_4_ * auVar33._8_4_;
    auVar52._12_4_ = auVar35._12_4_ * auVar33._12_4_;
    auVar52._16_4_ = auVar35._16_4_ * auVar33._16_4_;
    auVar52._20_4_ = auVar35._20_4_ * auVar33._20_4_;
    auVar52._24_4_ = auVar35._24_4_ * auVar33._24_4_;
    auVar52._28_4_ = fStack_3c4;
    auVar27 = vsubps_avx(auVar52,auVar51);
    auVar53._4_4_ = auVar32._4_4_ * auVar33._4_4_;
    auVar53._0_4_ = auVar32._0_4_ * auVar33._0_4_;
    auVar53._8_4_ = auVar32._8_4_ * auVar33._8_4_;
    auVar53._12_4_ = auVar32._12_4_ * auVar33._12_4_;
    auVar53._16_4_ = auVar32._16_4_ * auVar33._16_4_;
    auVar53._20_4_ = auVar32._20_4_ * auVar33._20_4_;
    auVar53._24_4_ = auVar32._24_4_ * auVar33._24_4_;
    auVar53._28_4_ = auVar33._28_4_;
    auVar145 = vsubps_avx(auVar324,auVar32);
    auVar54._4_4_ = auVar34._4_4_ * auVar145._4_4_;
    auVar54._0_4_ = auVar34._0_4_ * auVar145._0_4_;
    auVar54._8_4_ = auVar34._8_4_ * auVar145._8_4_;
    auVar54._12_4_ = auVar34._12_4_ * auVar145._12_4_;
    auVar54._16_4_ = auVar34._16_4_ * auVar145._16_4_;
    auVar54._20_4_ = auVar34._20_4_ * auVar145._20_4_;
    auVar54._24_4_ = auVar34._24_4_ * auVar145._24_4_;
    auVar54._28_4_ = fStack_3a4;
    auVar146 = vsubps_avx(auVar54,auVar53);
    auVar55._4_4_ = auVar35._4_4_ * auVar145._4_4_;
    auVar55._0_4_ = auVar35._0_4_ * auVar145._0_4_;
    auVar55._8_4_ = auVar35._8_4_ * auVar145._8_4_;
    auVar55._12_4_ = auVar35._12_4_ * auVar145._12_4_;
    auVar55._16_4_ = auVar35._16_4_ * auVar145._16_4_;
    auVar55._20_4_ = auVar35._20_4_ * auVar145._20_4_;
    auVar55._24_4_ = auVar35._24_4_ * auVar145._24_4_;
    auVar55._28_4_ = auVar33._28_4_;
    auVar56._4_4_ = auVar32._4_4_ * auVar31._4_4_;
    auVar56._0_4_ = auVar32._0_4_ * auVar31._0_4_;
    auVar56._8_4_ = auVar32._8_4_ * auVar31._8_4_;
    auVar56._12_4_ = auVar32._12_4_ * auVar31._12_4_;
    auVar56._16_4_ = auVar32._16_4_ * auVar31._16_4_;
    auVar56._20_4_ = auVar32._20_4_ * auVar31._20_4_;
    auVar56._24_4_ = auVar32._24_4_ * auVar31._24_4_;
    auVar56._28_4_ = auVar31._28_4_;
    auVar31 = vsubps_avx(auVar56,auVar55);
    auVar150._0_4_ = auVar27._0_4_ * 0.0 + auVar31._0_4_ + auVar146._0_4_ * 0.0;
    auVar150._4_4_ = auVar27._4_4_ * 0.0 + auVar31._4_4_ + auVar146._4_4_ * 0.0;
    auVar150._8_4_ = auVar27._8_4_ * 0.0 + auVar31._8_4_ + auVar146._8_4_ * 0.0;
    auVar150._12_4_ = auVar27._12_4_ * 0.0 + auVar31._12_4_ + auVar146._12_4_ * 0.0;
    auVar150._16_4_ = auVar27._16_4_ * 0.0 + auVar31._16_4_ + auVar146._16_4_ * 0.0;
    auVar150._20_4_ = auVar27._20_4_ * 0.0 + auVar31._20_4_ + auVar146._20_4_ * 0.0;
    auVar150._24_4_ = auVar27._24_4_ * 0.0 + auVar31._24_4_ + auVar146._24_4_ * 0.0;
    auVar150._28_4_ = auVar31._28_4_ + auVar31._28_4_ + auVar146._28_4_;
    auVar27 = vcmpps_avx(auVar150,ZEXT832(0) << 0x20,2);
    local_720 = vblendvps_avx(auVar28,_local_4c0,auVar27);
    _local_580 = vblendvps_avx(auVar29,_local_4e0,auVar27);
    auVar28 = vblendvps_avx(auVar30,auVar301,auVar27);
    auVar29 = vblendvps_avx(auVar32,auVar324,auVar27);
    auVar30 = vblendvps_avx(auVar35,auVar344,auVar27);
    auVar31 = vblendvps_avx(auVar34,auVar350,auVar27);
    auVar32 = vblendvps_avx(auVar324,auVar32,auVar27);
    auVar33 = vblendvps_avx(auVar344,auVar35,auVar27);
    auVar202 = vpackssdw_avx(auVar144._0_16_,auVar144._16_16_);
    auVar34 = vblendvps_avx(auVar350,auVar34,auVar27);
    auVar32 = vsubps_avx(auVar32,local_720);
    auVar33 = vsubps_avx(auVar33,_local_580);
    auVar34 = vsubps_avx(auVar34,auVar28);
    auVar145 = vsubps_avx(_local_580,auVar30);
    fVar259 = auVar33._0_4_;
    fVar166 = auVar28._0_4_;
    fVar272 = auVar33._4_4_;
    fVar167 = auVar28._4_4_;
    auVar57._4_4_ = fVar167 * fVar272;
    auVar57._0_4_ = fVar166 * fVar259;
    fVar279 = auVar33._8_4_;
    fVar230 = auVar28._8_4_;
    auVar57._8_4_ = fVar230 * fVar279;
    fVar243 = auVar33._12_4_;
    fVar240 = auVar28._12_4_;
    auVar57._12_4_ = fVar240 * fVar243;
    fVar168 = auVar33._16_4_;
    fVar241 = auVar28._16_4_;
    auVar57._16_4_ = fVar241 * fVar168;
    fVar277 = auVar33._20_4_;
    fVar140 = auVar28._20_4_;
    auVar57._20_4_ = fVar140 * fVar277;
    fVar141 = auVar33._24_4_;
    fVar161 = auVar28._24_4_;
    auVar57._24_4_ = fVar161 * fVar141;
    auVar57._28_4_ = auVar144._28_4_;
    fVar260 = local_580._0_4_;
    fVar285 = auVar34._0_4_;
    fVar274 = local_580._4_4_;
    fVar294 = auVar34._4_4_;
    auVar58._4_4_ = fVar294 * fVar274;
    auVar58._0_4_ = fVar285 * fVar260;
    fVar242 = local_580._8_4_;
    fVar317 = auVar34._8_4_;
    auVar58._8_4_ = fVar317 * fVar242;
    fVar190 = local_580._12_4_;
    fVar318 = auVar34._12_4_;
    auVar58._12_4_ = fVar318 * fVar190;
    fVar169 = local_580._16_4_;
    fVar319 = auVar34._16_4_;
    auVar58._16_4_ = fVar319 * fVar169;
    fVar280 = local_580._20_4_;
    fVar320 = auVar34._20_4_;
    auVar58._20_4_ = fVar320 * fVar280;
    fVar245 = local_580._24_4_;
    fVar295 = auVar34._24_4_;
    uVar11 = auVar35._28_4_;
    auVar58._24_4_ = fVar295 * fVar245;
    auVar58._28_4_ = uVar11;
    auVar144 = vsubps_avx(auVar58,auVar57);
    fVar261 = local_720._0_4_;
    fVar276 = local_720._4_4_;
    auVar59._4_4_ = fVar294 * fVar276;
    auVar59._0_4_ = fVar285 * fVar261;
    fVar188 = local_720._8_4_;
    auVar59._8_4_ = fVar317 * fVar188;
    fVar310 = local_720._12_4_;
    auVar59._12_4_ = fVar318 * fVar310;
    fVar186 = local_720._16_4_;
    auVar59._16_4_ = fVar319 * fVar186;
    fVar283 = local_720._20_4_;
    auVar59._20_4_ = fVar320 * fVar283;
    fVar262 = local_720._24_4_;
    auVar59._24_4_ = fVar295 * fVar262;
    auVar59._28_4_ = uVar11;
    fVar263 = auVar32._0_4_;
    fVar278 = auVar32._4_4_;
    auVar60._4_4_ = fVar167 * fVar278;
    auVar60._0_4_ = fVar166 * fVar263;
    fVar282 = auVar32._8_4_;
    auVar60._8_4_ = fVar230 * fVar282;
    fVar311 = auVar32._12_4_;
    auVar60._12_4_ = fVar240 * fVar311;
    fVar187 = auVar32._16_4_;
    auVar60._16_4_ = fVar241 * fVar187;
    fVar284 = auVar32._20_4_;
    auVar60._20_4_ = fVar140 * fVar284;
    fVar164 = auVar32._24_4_;
    auVar60._24_4_ = fVar161 * fVar164;
    auVar60._28_4_ = auVar344._28_4_;
    auVar35 = vsubps_avx(auVar60,auVar59);
    auVar61._4_4_ = fVar274 * fVar278;
    auVar61._0_4_ = fVar260 * fVar263;
    auVar61._8_4_ = fVar242 * fVar282;
    auVar61._12_4_ = fVar190 * fVar311;
    auVar61._16_4_ = fVar169 * fVar187;
    auVar61._20_4_ = fVar280 * fVar284;
    auVar61._24_4_ = fVar245 * fVar164;
    auVar61._28_4_ = uVar11;
    auVar62._4_4_ = fVar276 * fVar272;
    auVar62._0_4_ = fVar261 * fVar259;
    auVar62._8_4_ = fVar188 * fVar279;
    auVar62._12_4_ = fVar310 * fVar243;
    auVar62._16_4_ = fVar186 * fVar168;
    auVar62._20_4_ = fVar283 * fVar277;
    auVar62._24_4_ = fVar262 * fVar141;
    auVar62._28_4_ = auVar350._28_4_;
    auVar146 = vsubps_avx(auVar62,auVar61);
    auVar147 = vsubps_avx(auVar28,auVar31);
    fVar270 = auVar146._28_4_ + auVar35._28_4_;
    auVar238._0_4_ = auVar146._0_4_ + auVar35._0_4_ * 0.0 + auVar144._0_4_ * 0.0;
    auVar238._4_4_ = auVar146._4_4_ + auVar35._4_4_ * 0.0 + auVar144._4_4_ * 0.0;
    auVar238._8_4_ = auVar146._8_4_ + auVar35._8_4_ * 0.0 + auVar144._8_4_ * 0.0;
    auVar238._12_4_ = auVar146._12_4_ + auVar35._12_4_ * 0.0 + auVar144._12_4_ * 0.0;
    auVar238._16_4_ = auVar146._16_4_ + auVar35._16_4_ * 0.0 + auVar144._16_4_ * 0.0;
    auVar238._20_4_ = auVar146._20_4_ + auVar35._20_4_ * 0.0 + auVar144._20_4_ * 0.0;
    auVar238._24_4_ = auVar146._24_4_ + auVar35._24_4_ * 0.0 + auVar144._24_4_ * 0.0;
    auVar238._28_4_ = fVar270 + 0.0;
    fVar162 = auVar145._0_4_;
    fVar163 = auVar145._4_4_;
    auVar63._4_4_ = fVar163 * auVar31._4_4_;
    auVar63._0_4_ = fVar162 * auVar31._0_4_;
    fVar305 = auVar145._8_4_;
    auVar63._8_4_ = fVar305 * auVar31._8_4_;
    fVar306 = auVar145._12_4_;
    auVar63._12_4_ = fVar306 * auVar31._12_4_;
    fVar307 = auVar145._16_4_;
    auVar63._16_4_ = fVar307 * auVar31._16_4_;
    fVar309 = auVar145._20_4_;
    auVar63._20_4_ = fVar309 * auVar31._20_4_;
    fVar194 = auVar145._24_4_;
    auVar63._24_4_ = fVar194 * auVar31._24_4_;
    auVar63._28_4_ = fVar270;
    fVar270 = auVar147._0_4_;
    fVar281 = auVar147._4_4_;
    auVar64._4_4_ = auVar30._4_4_ * fVar281;
    auVar64._0_4_ = auVar30._0_4_ * fVar270;
    fVar308 = auVar147._8_4_;
    auVar64._8_4_ = auVar30._8_4_ * fVar308;
    fVar244 = auVar147._12_4_;
    auVar64._12_4_ = auVar30._12_4_ * fVar244;
    fVar275 = auVar147._16_4_;
    auVar64._16_4_ = auVar30._16_4_ * fVar275;
    fVar229 = auVar147._20_4_;
    auVar64._20_4_ = auVar30._20_4_ * fVar229;
    fVar165 = auVar147._24_4_;
    auVar64._24_4_ = auVar30._24_4_ * fVar165;
    auVar64._28_4_ = auVar146._28_4_;
    auVar144 = vsubps_avx(auVar64,auVar63);
    auVar353 = ZEXT3264(auVar144);
    auVar35 = vsubps_avx(local_720,auVar29);
    fVar296 = auVar35._0_4_;
    fVar297 = auVar35._4_4_;
    auVar65._4_4_ = fVar297 * auVar31._4_4_;
    auVar65._0_4_ = fVar296 * auVar31._0_4_;
    fVar321 = auVar35._8_4_;
    auVar65._8_4_ = fVar321 * auVar31._8_4_;
    fVar342 = auVar35._12_4_;
    auVar65._12_4_ = fVar342 * auVar31._12_4_;
    fVar346 = auVar35._16_4_;
    auVar65._16_4_ = fVar346 * auVar31._16_4_;
    fVar347 = auVar35._20_4_;
    auVar65._20_4_ = fVar347 * auVar31._20_4_;
    fVar348 = auVar35._24_4_;
    auVar65._24_4_ = fVar348 * auVar31._24_4_;
    auVar65._28_4_ = auVar31._28_4_;
    auVar66._4_4_ = auVar29._4_4_ * fVar281;
    auVar66._0_4_ = auVar29._0_4_ * fVar270;
    auVar66._8_4_ = auVar29._8_4_ * fVar308;
    auVar66._12_4_ = auVar29._12_4_ * fVar244;
    auVar66._16_4_ = auVar29._16_4_ * fVar275;
    auVar66._20_4_ = auVar29._20_4_ * fVar229;
    auVar66._24_4_ = auVar29._24_4_ * fVar165;
    auVar66._28_4_ = 0;
    auVar35 = vsubps_avx(auVar65,auVar66);
    auVar67._4_4_ = auVar30._4_4_ * fVar297;
    auVar67._0_4_ = auVar30._0_4_ * fVar296;
    auVar67._8_4_ = auVar30._8_4_ * fVar321;
    auVar67._12_4_ = auVar30._12_4_ * fVar342;
    auVar67._16_4_ = auVar30._16_4_ * fVar346;
    auVar67._20_4_ = auVar30._20_4_ * fVar347;
    auVar67._24_4_ = auVar30._24_4_ * fVar348;
    auVar67._28_4_ = auVar31._28_4_;
    auVar68._4_4_ = auVar29._4_4_ * fVar163;
    auVar68._0_4_ = auVar29._0_4_ * fVar162;
    auVar68._8_4_ = auVar29._8_4_ * fVar305;
    auVar68._12_4_ = auVar29._12_4_ * fVar306;
    auVar68._16_4_ = auVar29._16_4_ * fVar307;
    auVar68._20_4_ = auVar29._20_4_ * fVar309;
    auVar68._24_4_ = auVar29._24_4_ * fVar194;
    auVar68._28_4_ = auVar29._28_4_;
    auVar29 = vsubps_avx(auVar68,auVar67);
    auVar210._0_4_ = auVar144._0_4_ * 0.0 + auVar29._0_4_ + auVar35._0_4_ * 0.0;
    auVar210._4_4_ = auVar144._4_4_ * 0.0 + auVar29._4_4_ + auVar35._4_4_ * 0.0;
    auVar210._8_4_ = auVar144._8_4_ * 0.0 + auVar29._8_4_ + auVar35._8_4_ * 0.0;
    auVar210._12_4_ = auVar144._12_4_ * 0.0 + auVar29._12_4_ + auVar35._12_4_ * 0.0;
    auVar210._16_4_ = auVar144._16_4_ * 0.0 + auVar29._16_4_ + auVar35._16_4_ * 0.0;
    auVar210._20_4_ = auVar144._20_4_ * 0.0 + auVar29._20_4_ + auVar35._20_4_ * 0.0;
    auVar210._24_4_ = auVar144._24_4_ * 0.0 + auVar29._24_4_ + auVar35._24_4_ * 0.0;
    auVar210._28_4_ = auVar29._28_4_ + auVar29._28_4_ + auVar35._28_4_;
    auVar144 = vmaxps_avx(auVar238,auVar210);
    auVar144 = vcmpps_avx(auVar144,ZEXT832(0) << 0x20,2);
    auVar219 = vpackssdw_avx(auVar144._0_16_,auVar144._16_16_);
    auVar202 = vpand_avx(auVar202,auVar219);
    auVar219 = vpmovsxwd_avx(auVar202);
    auVar223 = vpunpckhwd_avx(auVar202,auVar202);
    auVar151._16_16_ = auVar223;
    auVar151._0_16_ = auVar219;
    if ((((((((auVar151 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar151 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar151 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar151 >> 0x7f,0) == '\0') &&
          (auVar151 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB161(auVar223 >> 0x3f,0) == '\0') &&
        (auVar151 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar223[0xf])
    {
LAB_00985c7f:
      auVar179._8_8_ = local_460[1]._8_8_;
      auVar179._0_8_ = local_460[1]._0_8_;
      auVar179._16_8_ = local_460[1]._16_8_;
      auVar179._24_8_ = local_460[1]._24_8_;
      auVar304 = ZEXT3264(local_6e0);
      auVar316 = ZEXT3264(local_680);
    }
    else {
      auVar353 = ZEXT3264(auVar238);
      auVar69._4_4_ = fVar281 * fVar272;
      auVar69._0_4_ = fVar270 * fVar259;
      auVar69._8_4_ = fVar308 * fVar279;
      auVar69._12_4_ = fVar244 * fVar243;
      auVar69._16_4_ = fVar275 * fVar168;
      auVar69._20_4_ = fVar229 * fVar277;
      auVar69._24_4_ = fVar165 * fVar141;
      auVar69._28_4_ = auVar223._12_4_;
      auVar332._0_4_ = fVar162 * fVar285;
      auVar332._4_4_ = fVar163 * fVar294;
      auVar332._8_4_ = fVar305 * fVar317;
      auVar332._12_4_ = fVar306 * fVar318;
      auVar332._16_4_ = fVar307 * fVar319;
      auVar332._20_4_ = fVar309 * fVar320;
      auVar332._24_4_ = fVar194 * fVar295;
      auVar332._28_4_ = 0;
      auVar29 = vsubps_avx(auVar332,auVar69);
      auVar70._4_4_ = fVar297 * fVar294;
      auVar70._0_4_ = fVar296 * fVar285;
      auVar70._8_4_ = fVar321 * fVar317;
      auVar70._12_4_ = fVar342 * fVar318;
      auVar70._16_4_ = fVar346 * fVar319;
      auVar70._20_4_ = fVar347 * fVar320;
      auVar70._24_4_ = fVar348 * fVar295;
      auVar70._28_4_ = auVar34._28_4_;
      auVar71._4_4_ = fVar281 * fVar278;
      auVar71._0_4_ = fVar270 * fVar263;
      auVar71._8_4_ = fVar308 * fVar282;
      auVar71._12_4_ = fVar244 * fVar311;
      auVar71._16_4_ = fVar275 * fVar187;
      auVar71._20_4_ = fVar229 * fVar284;
      auVar71._24_4_ = fVar165 * fVar164;
      auVar71._28_4_ = auVar147._28_4_;
      auVar30 = vsubps_avx(auVar71,auVar70);
      auVar72._4_4_ = fVar163 * fVar278;
      auVar72._0_4_ = fVar162 * fVar263;
      auVar72._8_4_ = fVar305 * fVar282;
      auVar72._12_4_ = fVar306 * fVar311;
      auVar72._16_4_ = fVar307 * fVar187;
      auVar72._20_4_ = fVar309 * fVar284;
      auVar72._24_4_ = fVar194 * fVar164;
      auVar72._28_4_ = auVar32._28_4_;
      auVar73._4_4_ = fVar297 * fVar272;
      auVar73._0_4_ = fVar296 * fVar259;
      auVar73._8_4_ = fVar321 * fVar279;
      auVar73._12_4_ = fVar342 * fVar243;
      auVar73._16_4_ = fVar346 * fVar168;
      auVar73._20_4_ = fVar347 * fVar277;
      auVar73._24_4_ = fVar348 * fVar141;
      auVar73._28_4_ = auVar33._28_4_;
      auVar31 = vsubps_avx(auVar73,auVar72);
      auVar292._0_4_ = auVar29._0_4_ * 0.0 + auVar31._0_4_ + auVar30._0_4_ * 0.0;
      auVar292._4_4_ = auVar29._4_4_ * 0.0 + auVar31._4_4_ + auVar30._4_4_ * 0.0;
      auVar292._8_4_ = auVar29._8_4_ * 0.0 + auVar31._8_4_ + auVar30._8_4_ * 0.0;
      auVar292._12_4_ = auVar29._12_4_ * 0.0 + auVar31._12_4_ + auVar30._12_4_ * 0.0;
      auVar292._16_4_ = auVar29._16_4_ * 0.0 + auVar31._16_4_ + auVar30._16_4_ * 0.0;
      auVar292._20_4_ = auVar29._20_4_ * 0.0 + auVar31._20_4_ + auVar30._20_4_ * 0.0;
      auVar292._24_4_ = auVar29._24_4_ * 0.0 + auVar31._24_4_ + auVar30._24_4_ * 0.0;
      auVar292._28_4_ = auVar33._28_4_ + auVar31._28_4_ + auVar32._28_4_;
      auVar144 = vrcpps_avx(auVar292);
      fVar263 = auVar144._0_4_;
      fVar270 = auVar144._4_4_;
      auVar74._4_4_ = auVar292._4_4_ * fVar270;
      auVar74._0_4_ = auVar292._0_4_ * fVar263;
      fVar272 = auVar144._8_4_;
      auVar74._8_4_ = auVar292._8_4_ * fVar272;
      fVar278 = auVar144._12_4_;
      auVar74._12_4_ = auVar292._12_4_ * fVar278;
      fVar281 = auVar144._16_4_;
      auVar74._16_4_ = auVar292._16_4_ * fVar281;
      fVar279 = auVar144._20_4_;
      auVar74._20_4_ = auVar292._20_4_ * fVar279;
      fVar282 = auVar144._24_4_;
      auVar74._24_4_ = auVar292._24_4_ * fVar282;
      auVar74._28_4_ = auVar147._28_4_;
      auVar333._8_4_ = 0x3f800000;
      auVar333._0_8_ = 0x3f8000003f800000;
      auVar333._12_4_ = 0x3f800000;
      auVar333._16_4_ = 0x3f800000;
      auVar333._20_4_ = 0x3f800000;
      auVar333._24_4_ = 0x3f800000;
      auVar333._28_4_ = 0x3f800000;
      auVar144 = vsubps_avx(auVar333,auVar74);
      fVar263 = auVar144._0_4_ * fVar263 + fVar263;
      fVar270 = auVar144._4_4_ * fVar270 + fVar270;
      fVar272 = auVar144._8_4_ * fVar272 + fVar272;
      fVar278 = auVar144._12_4_ * fVar278 + fVar278;
      fVar281 = auVar144._16_4_ * fVar281 + fVar281;
      fVar279 = auVar144._20_4_ * fVar279 + fVar279;
      fVar282 = auVar144._24_4_ * fVar282 + fVar282;
      auVar75._4_4_ =
           (auVar29._4_4_ * fVar276 + auVar30._4_4_ * fVar274 + auVar31._4_4_ * fVar167) * fVar270;
      auVar75._0_4_ =
           (auVar29._0_4_ * fVar261 + auVar30._0_4_ * fVar260 + auVar31._0_4_ * fVar166) * fVar263;
      auVar75._8_4_ =
           (auVar29._8_4_ * fVar188 + auVar30._8_4_ * fVar242 + auVar31._8_4_ * fVar230) * fVar272;
      auVar75._12_4_ =
           (auVar29._12_4_ * fVar310 + auVar30._12_4_ * fVar190 + auVar31._12_4_ * fVar240) *
           fVar278;
      auVar75._16_4_ =
           (auVar29._16_4_ * fVar186 + auVar30._16_4_ * fVar169 + auVar31._16_4_ * fVar241) *
           fVar281;
      auVar75._20_4_ =
           (auVar29._20_4_ * fVar283 + auVar30._20_4_ * fVar280 + auVar31._20_4_ * fVar140) *
           fVar279;
      auVar75._24_4_ =
           (auVar29._24_4_ * fVar262 + auVar30._24_4_ * fVar245 + auVar31._24_4_ * fVar161) *
           fVar282;
      auVar75._28_4_ = auVar238._28_4_ + auVar28._28_4_;
      auVar152._16_16_ = auVar15;
      auVar152._0_16_ = auVar15;
      auVar144 = vcmpps_avx(auVar152,auVar75,2);
      fVar259 = (ray->super_RayK<1>).tfar;
      auVar178._4_4_ = fVar259;
      auVar178._0_4_ = fVar259;
      auVar178._8_4_ = fVar259;
      auVar178._12_4_ = fVar259;
      auVar178._16_4_ = fVar259;
      auVar178._20_4_ = fVar259;
      auVar178._24_4_ = fVar259;
      auVar178._28_4_ = fVar259;
      auVar28 = vcmpps_avx(auVar75,auVar178,2);
      auVar144 = vandps_avx(auVar28,auVar144);
      auVar219 = vpackssdw_avx(auVar144._0_16_,auVar144._16_16_);
      auVar202 = vpand_avx(auVar202,auVar219);
      auVar219 = vpmovsxwd_avx(auVar202);
      auVar223 = vpshufd_avx(auVar202,0xee);
      auVar223 = vpmovsxwd_avx(auVar223);
      auVar153._16_16_ = auVar223;
      auVar153._0_16_ = auVar219;
      if ((((((((auVar153 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar153 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar153 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar153 >> 0x7f,0) == '\0') &&
            (auVar153 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB161(auVar223 >> 0x3f,0) == '\0') &&
          (auVar153 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar223[0xf]
         ) goto LAB_00985c7f;
      auVar144 = vcmpps_avx(ZEXT832(0) << 0x20,auVar292,4);
      auVar219 = vpackssdw_avx(auVar144._0_16_,auVar144._16_16_);
      auVar202 = vpand_avx(auVar202,auVar219);
      auVar219 = vpmovsxwd_avx(auVar202);
      auVar202 = vpunpckhwd_avx(auVar202,auVar202);
      auVar253._16_16_ = auVar202;
      auVar253._0_16_ = auVar219;
      auVar179._8_8_ = local_460[1]._8_8_;
      auVar179._0_8_ = local_460[1]._0_8_;
      auVar179._16_8_ = local_460[1]._16_8_;
      auVar179._24_8_ = local_460[1]._24_8_;
      auVar304 = ZEXT3264(local_6e0);
      auVar316 = ZEXT3264(local_680);
      if ((((((((auVar253 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar253 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar253 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar253 >> 0x7f,0) != '\0') ||
            (auVar253 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB161(auVar202 >> 0x3f,0) != '\0') ||
          (auVar253 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar202[0xf] < '\0') {
        auVar154._0_4_ = auVar238._0_4_ * fVar263;
        auVar154._4_4_ = auVar238._4_4_ * fVar270;
        auVar154._8_4_ = auVar238._8_4_ * fVar272;
        auVar154._12_4_ = auVar238._12_4_ * fVar278;
        auVar154._16_4_ = auVar238._16_4_ * fVar281;
        auVar154._20_4_ = auVar238._20_4_ * fVar279;
        auVar154._24_4_ = auVar238._24_4_ * fVar282;
        auVar154._28_4_ = 0;
        auVar76._4_4_ = auVar210._4_4_ * fVar270;
        auVar76._0_4_ = auVar210._0_4_ * fVar263;
        auVar76._8_4_ = auVar210._8_4_ * fVar272;
        auVar76._12_4_ = auVar210._12_4_ * fVar278;
        auVar76._16_4_ = auVar210._16_4_ * fVar281;
        auVar76._20_4_ = auVar210._20_4_ * fVar279;
        auVar76._24_4_ = auVar210._24_4_ * fVar282;
        auVar76._28_4_ = SUB84(local_460[1]._24_8_,4);
        auVar268._8_4_ = 0x3f800000;
        auVar268._0_8_ = 0x3f8000003f800000;
        auVar268._12_4_ = 0x3f800000;
        auVar268._16_4_ = 0x3f800000;
        auVar268._20_4_ = 0x3f800000;
        auVar268._24_4_ = 0x3f800000;
        auVar268._28_4_ = 0x3f800000;
        auVar144 = vsubps_avx(auVar268,auVar154);
        auVar144 = vblendvps_avx(auVar144,auVar154,auVar27);
        auVar304 = ZEXT3264(auVar144);
        auVar144 = vsubps_avx(auVar268,auVar76);
        _local_340 = vblendvps_avx(auVar144,auVar76,auVar27);
        auVar316 = ZEXT3264(auVar75);
        auVar179 = auVar253;
      }
    }
    auVar345 = ZEXT3264(_local_620);
    auVar341 = ZEXT3264(_local_700);
    auVar293 = ZEXT3264(_local_640);
    if ((((((((auVar179 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar179 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar179 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar179 >> 0x7f,0) == '\0') &&
          (auVar179 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar179 >> 0xbf,0) == '\0') &&
        (auVar179 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar179[0x1f])
    goto LAB_00984ca8;
    auVar144 = vsubps_avx(auVar290,local_560);
    fVar260 = (float)local_560._0_4_ + auVar304._0_4_ * auVar144._0_4_;
    fVar261 = local_560._4_4_ + auVar304._4_4_ * auVar144._4_4_;
    fVar263 = local_560._8_4_ + auVar304._8_4_ * auVar144._8_4_;
    fVar270 = local_560._12_4_ + auVar304._12_4_ * auVar144._12_4_;
    fVar272 = local_560._16_4_ + auVar304._16_4_ * auVar144._16_4_;
    fVar274 = local_560._20_4_ + auVar304._20_4_ * auVar144._20_4_;
    fVar276 = local_560._24_4_ + auVar304._24_4_ * auVar144._24_4_;
    fVar278 = auVar144._28_4_ + 0.0;
    fVar259 = pre->depth_scale;
    auVar77._4_4_ = (fVar261 + fVar261) * fVar259;
    auVar77._0_4_ = (fVar260 + fVar260) * fVar259;
    auVar77._8_4_ = (fVar263 + fVar263) * fVar259;
    auVar77._12_4_ = (fVar270 + fVar270) * fVar259;
    auVar77._16_4_ = (fVar272 + fVar272) * fVar259;
    auVar77._20_4_ = (fVar274 + fVar274) * fVar259;
    auVar77._24_4_ = (fVar276 + fVar276) * fVar259;
    auVar77._28_4_ = fVar278 + fVar278;
    local_240 = auVar316._0_32_;
    auVar144 = vcmpps_avx(local_240,auVar77,6);
    auVar28 = auVar179 & auVar144;
    if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar28 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar28 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar28 >> 0x7f,0) != '\0') ||
          (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar28 >> 0xbf,0) != '\0') ||
        (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar28[0x1f] < '\0')
    {
      local_340._0_4_ = (float)local_340._0_4_ + (float)local_340._0_4_ + -1.0;
      local_340._4_4_ = (float)local_340._4_4_ + (float)local_340._4_4_ + -1.0;
      uStack_338._0_4_ = (float)uStack_338 + (float)uStack_338 + -1.0;
      uStack_338._4_4_ = uStack_338._4_4_ + uStack_338._4_4_ + -1.0;
      uStack_330._0_4_ = (float)uStack_330 + (float)uStack_330 + -1.0;
      uStack_330._4_4_ = uStack_330._4_4_ + uStack_330._4_4_ + -1.0;
      uStack_328._0_4_ = (float)uStack_328 + (float)uStack_328 + -1.0;
      uStack_328._4_4_ = uStack_328._4_4_ + uStack_328._4_4_ + -1.0;
      local_280 = auVar304._0_32_;
      auVar130 = _local_340;
      auVar28 = _local_340;
      local_260 = (float)local_340._0_4_;
      fStack_25c = (float)local_340._4_4_;
      fStack_258 = (float)uStack_338;
      fStack_254 = uStack_338._4_4_;
      fStack_250 = (float)uStack_330;
      fStack_24c = uStack_330._4_4_;
      fStack_248 = (float)uStack_328;
      fStack_244 = uStack_328._4_4_;
      local_220 = 0;
      local_21c = uVar24;
      local_200 = local_690;
      uStack_1f8 = uStack_688;
      local_1f0 = local_6a0;
      uStack_1e8 = uStack_698;
      local_1e0 = local_6b0;
      uStack_1d8 = uStack_6a8;
      local_5a0._0_8_ = lVar134;
      _local_6b0 = auVar16;
      _local_6a0 = auVar17;
      _local_690 = auVar18;
      _local_340 = auVar28;
      if ((pGVar25->mask & (ray->super_RayK<1>).mask) != 0) {
        auVar144 = vandps_avx(auVar144,auVar179);
        local_460[0] = auVar144;
        auVar199._0_4_ = 1.0 / auVar249._0_4_;
        auVar199._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar250 = vshufps_avx(auVar199,auVar199,0);
        local_1a0[0] = auVar250._0_4_ * (auVar304._0_4_ + 0.0);
        local_1a0[1] = auVar250._4_4_ * (auVar304._4_4_ + 1.0);
        local_1a0[2] = auVar250._8_4_ * (auVar304._8_4_ + 2.0);
        local_1a0[3] = auVar250._12_4_ * (auVar304._12_4_ + 3.0);
        fStack_190 = auVar250._0_4_ * (auVar304._16_4_ + 4.0);
        fStack_18c = auVar250._4_4_ * (auVar304._20_4_ + 5.0);
        fStack_188 = auVar250._8_4_ * (auVar304._24_4_ + 6.0);
        fStack_184 = auVar304._28_4_ + 7.0;
        uStack_330 = auVar130._16_8_;
        uStack_328 = auVar28._24_8_;
        local_180 = local_340;
        uStack_178 = uStack_338;
        uStack_170 = uStack_330;
        uStack_168 = uStack_328;
        local_160 = local_240;
        auVar180._8_4_ = 0x7f800000;
        auVar180._0_8_ = 0x7f8000007f800000;
        auVar180._12_4_ = 0x7f800000;
        auVar180._16_4_ = 0x7f800000;
        auVar180._20_4_ = 0x7f800000;
        auVar180._24_4_ = 0x7f800000;
        auVar180._28_4_ = 0x7f800000;
        auVar28 = vblendvps_avx(auVar180,local_240,auVar144);
        auVar29 = vshufps_avx(auVar28,auVar28,0xb1);
        auVar29 = vminps_avx(auVar28,auVar29);
        auVar30 = vshufpd_avx(auVar29,auVar29,5);
        auVar29 = vminps_avx(auVar29,auVar30);
        auVar30 = vperm2f128_avx(auVar29,auVar29,1);
        auVar29 = vminps_avx(auVar29,auVar30);
        auVar28 = vcmpps_avx(auVar28,auVar29,0);
        auVar29 = auVar144 & auVar28;
        if ((((((((auVar29 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar29 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar29 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar29 >> 0x7f,0) != '\0') ||
              (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar29 >> 0xbf,0) != '\0') ||
            (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar29[0x1f] < '\0') {
          auVar144 = vandps_avx(auVar28,auVar144);
        }
        auVar185 = ZEXT3264(_local_700);
        uVar132 = vmovmskps_avx(auVar144);
        uVar133 = 0;
        if (uVar132 != 0) {
          for (; (uVar132 >> uVar133 & 1) == 0; uVar133 = uVar133 + 1) {
          }
        }
        uVar135 = (ulong)uVar133;
        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
           (pGVar25->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
          local_5a0._8_24_ = auVar290._8_24_;
          local_680 = local_240;
          local_560 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
          local_6e0 = auVar304._0_32_;
          local_5a8 = context;
          _local_2e0 = auVar352;
          do {
            local_5d4 = local_1a0[uVar135];
            local_5d0 = *(undefined4 *)((long)&local_180 + uVar135 * 4);
            local_720._0_8_ = uVar135;
            (ray->super_RayK<1>).tfar = *(float *)(local_160 + uVar135 * 4);
            local_750.context = context->user;
            fVar212 = 1.0 - local_5d4;
            fVar196 = local_5d4 * fVar212 + local_5d4 * fVar212;
            auVar250 = ZEXT416((uint)(local_5d4 * local_5d4 * 3.0));
            auVar250 = vshufps_avx(auVar250,auVar250,0);
            auVar202 = ZEXT416((uint)((fVar196 - local_5d4 * local_5d4) * 3.0));
            auVar202 = vshufps_avx(auVar202,auVar202,0);
            auVar219 = ZEXT416((uint)((fVar212 * fVar212 - fVar196) * 3.0));
            auVar219 = vshufps_avx(auVar219,auVar219,0);
            auVar223 = ZEXT416((uint)(fVar212 * fVar212 * -3.0));
            auVar223 = vshufps_avx(auVar223,auVar223,0);
            auVar205._0_4_ =
                 auVar223._0_4_ * local_7b0 +
                 auVar219._0_4_ * (float)local_690._0_4_ +
                 auVar250._0_4_ * (float)local_6b0._0_4_ + auVar202._0_4_ * (float)local_6a0._0_4_;
            auVar205._4_4_ =
                 auVar223._4_4_ * fStack_7ac +
                 auVar219._4_4_ * (float)local_690._4_4_ +
                 auVar250._4_4_ * (float)local_6b0._4_4_ + auVar202._4_4_ * (float)local_6a0._4_4_;
            auVar205._8_4_ =
                 auVar223._8_4_ * fStack_7a8 +
                 auVar219._8_4_ * (float)uStack_688 +
                 auVar250._8_4_ * (float)uStack_6a8 + auVar202._8_4_ * (float)uStack_698;
            auVar205._12_4_ =
                 auVar223._12_4_ * fStack_7a4 +
                 auVar219._12_4_ * uStack_688._4_4_ +
                 auVar250._12_4_ * uStack_6a8._4_4_ + auVar202._12_4_ * uStack_698._4_4_;
            local_5e0 = vmovlps_avx(auVar205);
            local_5d8 = vextractps_avx(auVar205,2);
            local_5cc = uVar131;
            local_5c8 = (int)local_7c0;
            local_5c4 = (local_750.context)->instID[0];
            local_5c0 = (local_750.context)->instPrimID[0];
            local_7c4 = -1;
            local_750.valid = &local_7c4;
            local_750.geometryUserPtr = local_7b8->userPtr;
            local_750.ray = (RTCRayN *)ray;
            local_750.hit = (RTCHitN *)&local_5e0;
            local_750.N = 1;
            if (local_7b8->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00985ed0:
              p_Var26 = context->args->filter;
              if ((p_Var26 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((local_7b8->field_8).field_0x2 & 0x40) != 0)))
                 ) {
                auVar353 = ZEXT1664(auVar353._0_16_);
                (*p_Var26)(&local_750);
                auVar345 = ZEXT3264(_local_620);
                auVar293 = ZEXT3264(_local_640);
                auVar185 = ZEXT3264(_local_700);
                auVar304 = ZEXT3264(local_6e0);
                pre = local_758;
                context = local_5a8;
                if (*local_750.valid == 0) goto LAB_00985fc3;
              }
              (((Vec3f *)((long)local_750.ray + 0x30))->field_0).components[0] =
                   *(float *)local_750.hit;
              (((Vec3f *)((long)local_750.ray + 0x30))->field_0).field_0.y =
                   *(float *)(local_750.hit + 4);
              (((Vec3f *)((long)local_750.ray + 0x30))->field_0).field_0.z =
                   *(float *)(local_750.hit + 8);
              *(float *)((long)local_750.ray + 0x3c) = *(float *)(local_750.hit + 0xc);
              *(float *)((long)local_750.ray + 0x40) = *(float *)(local_750.hit + 0x10);
              *(float *)((long)local_750.ray + 0x44) = *(float *)(local_750.hit + 0x14);
              *(float *)((long)local_750.ray + 0x48) = *(float *)(local_750.hit + 0x18);
              *(float *)((long)local_750.ray + 0x4c) = *(float *)(local_750.hit + 0x1c);
              *(float *)((long)local_750.ray + 0x50) = *(float *)(local_750.hit + 0x20);
            }
            else {
              auVar353 = ZEXT1664(auVar353._0_16_);
              (*local_7b8->intersectionFilterN)(&local_750);
              auVar345 = ZEXT3264(_local_620);
              auVar293 = ZEXT3264(_local_640);
              auVar185 = ZEXT3264(_local_700);
              auVar304 = ZEXT3264(local_6e0);
              pre = local_758;
              context = local_5a8;
              if (*local_750.valid != 0) goto LAB_00985ed0;
LAB_00985fc3:
              (ray->super_RayK<1>).tfar = (float)local_560._0_4_;
              pre = local_758;
              context = local_5a8;
            }
            *(undefined4 *)(local_460[0] + local_720._0_8_ * 4) = 0;
            auVar29 = local_460[0];
            fVar196 = (ray->super_RayK<1>).tfar;
            auVar160._4_4_ = fVar196;
            auVar160._0_4_ = fVar196;
            auVar160._8_4_ = fVar196;
            auVar160._12_4_ = fVar196;
            auVar160._16_4_ = fVar196;
            auVar160._20_4_ = fVar196;
            auVar160._24_4_ = fVar196;
            auVar160._28_4_ = fVar196;
            auVar316 = ZEXT3264(local_680);
            auVar28 = vcmpps_avx(local_680,auVar160,2);
            auVar144 = vandps_avx(auVar28,local_460[0]);
            local_460[0] = auVar144;
            auVar29 = auVar29 & auVar28;
            if ((((((((auVar29 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar29 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar29 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar29 >> 0x7f,0) == '\0') &&
                  (auVar29 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar29 >> 0xbf,0) == '\0') &&
                (auVar29 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar29[0x1f]) goto LAB_00986083;
            local_560 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
            auVar184._8_4_ = 0x7f800000;
            auVar184._0_8_ = 0x7f8000007f800000;
            auVar184._12_4_ = 0x7f800000;
            auVar184._16_4_ = 0x7f800000;
            auVar184._20_4_ = 0x7f800000;
            auVar184._24_4_ = 0x7f800000;
            auVar184._28_4_ = 0x7f800000;
            auVar28 = vblendvps_avx(auVar184,local_680,auVar144);
            auVar29 = vshufps_avx(auVar28,auVar28,0xb1);
            auVar29 = vminps_avx(auVar28,auVar29);
            auVar30 = vshufpd_avx(auVar29,auVar29,5);
            auVar29 = vminps_avx(auVar29,auVar30);
            auVar30 = vperm2f128_avx(auVar29,auVar29,1);
            auVar29 = vminps_avx(auVar29,auVar30);
            auVar28 = vcmpps_avx(auVar28,auVar29,0);
            auVar29 = auVar144 & auVar28;
            if ((((((((auVar29 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar29 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar29 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar29 >> 0x7f,0) != '\0') ||
                  (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar29 >> 0xbf,0) != '\0') ||
                (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar29[0x1f] < '\0') {
              auVar144 = vandps_avx(auVar28,auVar144);
            }
            uVar133 = vmovmskps_avx(auVar144);
            uVar23 = 0;
            if (uVar133 != 0) {
              for (; (uVar133 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
              }
            }
            uVar135 = (ulong)uVar23;
          } while( true );
        }
        fVar196 = local_1a0[uVar135];
        fVar212 = *(float *)((long)&local_180 + uVar135 * 4);
        fVar216 = 1.0 - fVar196;
        fVar214 = fVar196 * fVar216 + fVar196 * fVar216;
        auVar250 = ZEXT416((uint)(fVar196 * fVar196 * 3.0));
        auVar250 = vshufps_avx(auVar250,auVar250,0);
        auVar202 = ZEXT416((uint)((fVar214 - fVar196 * fVar196) * 3.0));
        auVar202 = vshufps_avx(auVar202,auVar202,0);
        auVar219 = ZEXT416((uint)((fVar216 * fVar216 - fVar214) * 3.0));
        auVar219 = vshufps_avx(auVar219,auVar219,0);
        auVar223 = ZEXT416((uint)(fVar216 * fVar216 * -3.0));
        auVar223 = vshufps_avx(auVar223,auVar223,0);
        auVar200._0_4_ =
             auVar223._0_4_ * local_7b0 +
             auVar219._0_4_ * (float)local_690._0_4_ +
             auVar250._0_4_ * (float)local_6b0._0_4_ + auVar202._0_4_ * (float)local_6a0._0_4_;
        auVar200._4_4_ =
             auVar223._4_4_ * fStack_7ac +
             auVar219._4_4_ * (float)local_690._4_4_ +
             auVar250._4_4_ * (float)local_6b0._4_4_ + auVar202._4_4_ * (float)local_6a0._4_4_;
        auVar200._8_4_ =
             auVar223._8_4_ * fStack_7a8 +
             auVar219._8_4_ * (float)uStack_688 +
             auVar250._8_4_ * (float)uStack_6a8 + auVar202._8_4_ * (float)uStack_698;
        auVar200._12_4_ =
             auVar223._12_4_ * fStack_7a4 +
             auVar219._12_4_ * uStack_688._4_4_ +
             auVar250._12_4_ * uStack_6a8._4_4_ + auVar202._12_4_ * uStack_698._4_4_;
        (ray->super_RayK<1>).tfar = *(float *)(local_160 + uVar135 * 4);
        uVar12 = vmovlps_avx(auVar200);
        *(undefined8 *)&(ray->Ng).field_0 = uVar12;
        fVar214 = (float)vextractps_avx(auVar200,2);
        (ray->Ng).field_0.field_0.z = fVar214;
        ray->u = fVar196;
        ray->v = fVar212;
        ray->primID = uVar131;
        ray->geomID = uVar23;
        ray->instID[0] = context->user->instID[0];
        ray->instPrimID[0] = context->user->instPrimID[0];
      }
      goto LAB_00984c8c;
    }
    goto LAB_00984c9e;
  }
  auVar341 = ZEXT3264(_local_700);
  auVar304 = ZEXT3264(local_6e0);
  auVar316 = ZEXT3264(local_680);
  auVar293 = ZEXT3264(_local_640);
  auVar345 = ZEXT3264(_local_620);
  goto LAB_00984ca8;
LAB_00986083:
  auVar341 = ZEXT3264(auVar185._0_32_);
  fVar197 = (float)local_660._0_4_;
  fVar213 = (float)local_660._4_4_;
  fVar215 = fStack_658;
  fVar217 = fStack_654;
  fVar218 = fStack_650;
  fVar220 = fStack_64c;
  fVar221 = fStack_648;
  auVar15 = _local_780;
LAB_00984c8c:
  _local_780 = auVar15;
  lVar134 = local_5a0._0_8_;
  fVar189 = (float)local_600._0_4_;
  fVar191 = (float)local_600._4_4_;
  fVar192 = fStack_5f8;
  fVar193 = fStack_5f4;
  fVar196 = fStack_5f0;
  fVar212 = fStack_5ec;
  fVar214 = fStack_5e8;
  fVar216 = fStack_5e4;
  fVar195 = (float)local_500._0_4_;
  fVar264 = (float)local_500._4_4_;
  fVar271 = fStack_4f8;
  fVar273 = fStack_4f4;
  fVar246 = fStack_4f0;
  fVar256 = fStack_4ec;
  fVar257 = fStack_4e8;
  fVar258 = fStack_4e4;
  auVar15 = _local_780;
LAB_00984c9e:
  _local_780 = auVar15;
  auVar250 = _local_7a0;
  auVar15 = _local_780;
LAB_00984ca8:
  _local_780 = auVar15;
  auVar185 = ZEXT3264(local_420);
  if (8 < (int)uVar24) {
    _local_4c0 = vpshufd_avx(ZEXT416(uVar24),0);
    auVar250 = vshufps_avx(auVar250,auVar250,0);
    register0x00001210 = auVar250;
    _local_400 = auVar250;
    local_300 = local_780._0_4_;
    fStack_2fc = local_780._4_4_;
    fStack_2f8 = local_780._8_4_;
    fStack_2f4 = local_780._12_4_;
    auVar143._0_4_ = 1.0 / (float)local_520._0_4_;
    auVar143._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar250 = vshufps_avx(auVar143,auVar143,0);
    register0x00001210 = auVar250;
    _local_320 = auVar250;
    lVar136 = 8;
    local_6e0 = auVar304._0_32_;
    local_680 = auVar316._0_32_;
    fStack_2f0 = local_300;
    fStack_2ec = fStack_2fc;
    fStack_2e8 = fStack_2f8;
    uStack_2e4 = fStack_2f4;
LAB_00984d6e:
    local_420 = auVar185._0_32_;
    if (lVar136 < lVar134) {
      pauVar2 = (undefined1 (*) [28])(bezier_basis0 + lVar136 * 4 + lVar139);
      fVar259 = *(float *)*pauVar2;
      fVar260 = *(float *)(*pauVar2 + 4);
      fVar261 = *(float *)(*pauVar2 + 8);
      fVar263 = *(float *)(*pauVar2 + 0xc);
      fVar270 = *(float *)(*pauVar2 + 0x10);
      fVar272 = *(float *)(*pauVar2 + 0x14);
      fVar274 = *(float *)(*pauVar2 + 0x18);
      auVar129 = *pauVar2;
      pauVar5 = (undefined1 (*) [28])(lVar139 + 0x21fb768 + lVar136 * 4);
      fVar276 = *(float *)*pauVar5;
      fVar278 = *(float *)(*pauVar5 + 4);
      fVar281 = *(float *)(*pauVar5 + 8);
      fVar279 = *(float *)(*pauVar5 + 0xc);
      fVar242 = *(float *)(*pauVar5 + 0x10);
      fVar188 = *(float *)(*pauVar5 + 0x14);
      fVar282 = *(float *)(*pauVar5 + 0x18);
      auVar128 = *pauVar5;
      pauVar5 = (undefined1 (*) [28])(lVar139 + 0x21fbbec + lVar136 * 4);
      fVar308 = *(float *)*pauVar5;
      fVar243 = *(float *)(*pauVar5 + 4);
      fVar190 = *(float *)(*pauVar5 + 8);
      fVar310 = *(float *)(*pauVar5 + 0xc);
      fVar311 = *(float *)(*pauVar5 + 0x10);
      fVar244 = *(float *)(*pauVar5 + 0x14);
      fVar168 = *(float *)(*pauVar5 + 0x18);
      auVar127 = *pauVar5;
      pauVar5 = (undefined1 (*) [28])(lVar139 + 0x21fc070 + lVar136 * 4);
      fVar169 = *(float *)*pauVar5;
      fVar186 = *(float *)(*pauVar5 + 4);
      fVar187 = *(float *)(*pauVar5 + 8);
      fVar275 = *(float *)(*pauVar5 + 0xc);
      fVar277 = *(float *)(*pauVar5 + 0x10);
      fVar280 = *(float *)(*pauVar5 + 0x14);
      fVar283 = *(float *)(*pauVar5 + 0x18);
      auVar126 = *pauVar5;
      fVar284 = *(float *)pauVar5[1];
      fVar245 = fVar284 + fVar284 + fVar216;
      local_7a0._0_4_ =
           fVar259 * (float)local_2c0._0_4_ +
           (float)local_3a0._0_4_ * fVar169 + fVar189 * fVar308 + auVar293._0_4_ * fVar276;
      local_7a0._4_4_ =
           fVar260 * (float)local_2c0._4_4_ +
           (float)local_3a0._4_4_ * fVar186 + fVar191 * fVar243 + auVar293._4_4_ * fVar278;
      fStack_798 = fVar261 * fStack_2b8 +
                   fStack_398 * fVar187 + fVar192 * fVar190 + auVar293._8_4_ * fVar281;
      fStack_794 = fVar263 * fStack_2b4 +
                   fStack_394 * fVar275 + fVar193 * fVar310 + auVar293._12_4_ * fVar279;
      fStack_790 = fVar270 * fStack_2b0 +
                   fStack_390 * fVar277 + fVar196 * fVar311 + auVar293._16_4_ * fVar242;
      fStack_78c = fVar272 * fStack_2ac +
                   fStack_38c * fVar280 + fVar212 * fVar244 + auVar293._20_4_ * fVar188;
      fStack_788 = fVar274 * fStack_2a8 +
                   fStack_388 * fVar283 + fVar214 * fVar168 + auVar293._24_4_ * fVar282;
      fStack_784 = fVar284 + fVar216 + auVar353._28_4_ + fVar284 + fVar284;
      local_520._0_4_ =
           auVar341._0_4_ * fVar308 + fVar195 * fVar169 + auVar345._0_4_ * fVar276 +
           fVar259 * fVar197;
      local_520._4_4_ =
           auVar341._4_4_ * fVar243 + fVar264 * fVar186 + auVar345._4_4_ * fVar278 +
           fVar260 * fVar213;
      local_520._8_4_ =
           auVar341._8_4_ * fVar190 + fVar271 * fVar187 + auVar345._8_4_ * fVar281 +
           fVar261 * fVar215;
      local_520._12_4_ =
           auVar341._12_4_ * fVar310 + fVar273 * fVar275 + auVar345._12_4_ * fVar279 +
           fVar263 * fVar217;
      local_520._16_4_ =
           auVar341._16_4_ * fVar311 + fVar246 * fVar277 + auVar345._16_4_ * fVar242 +
           fVar270 * fVar218;
      local_520._20_4_ =
           auVar341._20_4_ * fVar244 + fVar256 * fVar280 + auVar345._20_4_ * fVar188 +
           fVar272 * fVar220;
      local_520._24_4_ =
           auVar341._24_4_ * fVar168 + fVar257 * fVar283 + auVar345._24_4_ * fVar282 +
           fVar274 * fVar221;
      local_520._28_4_ = fVar284 + auVar185._28_4_ + fVar284 + fStack_784;
      local_780._0_4_ =
           fVar259 * (float)local_c0._0_4_ +
           (float)local_a0._0_4_ * fVar276 +
           fVar308 * (float)local_100._0_4_ + fVar169 * (float)local_120._0_4_;
      local_780._4_4_ =
           fVar260 * (float)local_c0._4_4_ +
           (float)local_a0._4_4_ * fVar278 +
           fVar243 * (float)local_100._4_4_ + fVar186 * (float)local_120._4_4_;
      fStack_778 = fVar261 * fStack_b8 +
                   fStack_98 * fVar281 + fVar190 * fStack_f8 + fVar187 * fStack_118;
      fStack_774 = fVar263 * fStack_b4 +
                   fStack_94 * fVar279 + fVar310 * fStack_f4 + fVar275 * fStack_114;
      fStack_770 = fVar270 * fStack_b0 +
                   fStack_90 * fVar242 + fVar311 * fStack_f0 + fVar277 * fStack_110;
      fStack_76c = fVar272 * fStack_ac +
                   fStack_8c * fVar188 + fVar244 * fStack_ec + fVar280 * fStack_10c;
      fStack_768 = fVar274 * fStack_a8 +
                   fStack_88 * fVar282 + fVar168 * fStack_e8 + fVar283 * fStack_108;
      fStack_764 = fStack_784 + fVar245;
      pfVar3 = (float *)(bezier_basis1 + lVar136 * 4 + lVar139);
      fVar263 = *pfVar3;
      fVar270 = pfVar3[1];
      fVar272 = pfVar3[2];
      fVar274 = pfVar3[3];
      fVar276 = pfVar3[4];
      fVar278 = pfVar3[5];
      fVar281 = pfVar3[6];
      auVar353 = ZEXT3264(auVar345._0_32_);
      pfVar6 = (float *)(lVar139 + 0x21fdb88 + lVar136 * 4);
      fVar279 = *pfVar6;
      fVar242 = pfVar6[1];
      fVar188 = pfVar6[2];
      fVar282 = pfVar6[3];
      fVar308 = pfVar6[4];
      fVar243 = pfVar6[5];
      fVar190 = pfVar6[6];
      pfVar7 = (float *)(lVar139 + 0x21fe00c + lVar136 * 4);
      fVar310 = *pfVar7;
      fVar311 = pfVar7[1];
      fVar244 = pfVar7[2];
      fVar168 = pfVar7[3];
      fVar169 = pfVar7[4];
      fVar186 = pfVar7[5];
      fVar187 = pfVar7[6];
      pfVar8 = (float *)(lVar139 + 0x21fe490 + lVar136 * 4);
      fVar275 = *pfVar8;
      fVar277 = pfVar8[1];
      fVar280 = pfVar8[2];
      fVar283 = pfVar8[3];
      fVar284 = pfVar8[4];
      fVar229 = pfVar8[5];
      fVar141 = pfVar8[6];
      fVar216 = pfVar8[7];
      fVar260 = *(float *)pauVar2[1] + fVar216;
      fVar259 = fVar216 + fVar216 + fVar245;
      local_560._0_4_ =
           (float)local_2c0._0_4_ * fVar263 +
           fVar279 * auVar293._0_4_ + fVar310 * fVar189 + (float)local_3a0._0_4_ * fVar275;
      local_560._4_4_ =
           (float)local_2c0._4_4_ * fVar270 +
           fVar242 * auVar293._4_4_ + fVar311 * fVar191 + (float)local_3a0._4_4_ * fVar277;
      local_560._8_4_ =
           fStack_2b8 * fVar272 +
           fVar188 * auVar293._8_4_ + fVar244 * fVar192 + fStack_398 * fVar280;
      local_560._12_4_ =
           fStack_2b4 * fVar274 +
           fVar282 * auVar293._12_4_ + fVar168 * fVar193 + fStack_394 * fVar283;
      local_560._16_4_ =
           fStack_2b0 * fVar276 +
           fVar308 * auVar293._16_4_ + fVar169 * fVar196 + fStack_390 * fVar284;
      local_560._20_4_ =
           fStack_2ac * fVar278 +
           fVar243 * auVar293._20_4_ + fVar186 * fVar212 + fStack_38c * fVar229;
      local_560._24_4_ =
           fStack_2a8 * fVar281 +
           fVar190 * auVar293._24_4_ + fVar187 * fVar214 + fStack_388 * fVar141;
      local_560._28_4_ = fVar260 + fVar259;
      auVar254._0_4_ =
           fVar197 * fVar263 +
           auVar345._0_4_ * fVar279 + fVar195 * fVar275 + auVar341._0_4_ * fVar310;
      auVar254._4_4_ =
           fVar213 * fVar270 +
           auVar345._4_4_ * fVar242 + fVar264 * fVar277 + auVar341._4_4_ * fVar311;
      auVar254._8_4_ =
           fVar215 * fVar272 +
           auVar345._8_4_ * fVar188 + fVar271 * fVar280 + auVar341._8_4_ * fVar244;
      auVar254._12_4_ =
           fVar217 * fVar274 +
           auVar345._12_4_ * fVar282 + fVar273 * fVar283 + auVar341._12_4_ * fVar168;
      auVar254._16_4_ =
           fVar218 * fVar276 +
           auVar345._16_4_ * fVar308 + fVar246 * fVar284 + auVar341._16_4_ * fVar169;
      auVar254._20_4_ =
           fVar220 * fVar278 +
           auVar345._20_4_ * fVar243 + fVar256 * fVar229 + auVar341._20_4_ * fVar186;
      auVar254._24_4_ =
           fVar221 * fVar281 +
           auVar345._24_4_ * fVar190 + fVar257 * fVar141 + auVar341._24_4_ * fVar187;
      auVar254._28_4_ = fVar259 + fVar216 + fVar258 + fVar216;
      auVar211._0_4_ =
           (float)local_a0._0_4_ * fVar279 +
           fVar275 * (float)local_120._0_4_ + fVar310 * (float)local_100._0_4_ +
           (float)local_c0._0_4_ * fVar263;
      auVar211._4_4_ =
           (float)local_a0._4_4_ * fVar242 +
           fVar277 * (float)local_120._4_4_ + fVar311 * (float)local_100._4_4_ +
           (float)local_c0._4_4_ * fVar270;
      auVar211._8_4_ =
           fStack_98 * fVar188 + fVar280 * fStack_118 + fVar244 * fStack_f8 + fStack_b8 * fVar272;
      auVar211._12_4_ =
           fStack_94 * fVar282 + fVar283 * fStack_114 + fVar168 * fStack_f4 + fStack_b4 * fVar274;
      auVar211._16_4_ =
           fStack_90 * fVar308 + fVar284 * fStack_110 + fVar169 * fStack_f0 + fStack_b0 * fVar276;
      auVar211._20_4_ =
           fStack_8c * fVar243 + fVar229 * fStack_10c + fVar186 * fStack_ec + fStack_ac * fVar278;
      auVar211._24_4_ =
           fStack_88 * fVar190 + fVar141 * fStack_108 + fVar187 * fStack_e8 + fStack_a8 * fVar281;
      auVar211._28_4_ = fVar216 + fVar260 + fVar259;
      auVar28 = vsubps_avx(local_560,_local_7a0);
      local_5a0 = auVar254;
      auVar29 = vsubps_avx(auVar254,local_520);
      fVar196 = auVar28._0_4_;
      fVar214 = auVar28._4_4_;
      auVar78._4_4_ = local_520._4_4_ * fVar214;
      auVar78._0_4_ = (float)local_520._0_4_ * fVar196;
      fVar218 = auVar28._8_4_;
      auVar78._8_4_ = local_520._8_4_ * fVar218;
      fVar221 = auVar28._12_4_;
      auVar78._12_4_ = local_520._12_4_ * fVar221;
      fVar256 = auVar28._16_4_;
      auVar78._16_4_ = local_520._16_4_ * fVar256;
      fVar258 = auVar28._20_4_;
      auVar78._20_4_ = local_520._20_4_ * fVar258;
      fVar260 = auVar28._24_4_;
      auVar78._24_4_ = local_520._24_4_ * fVar260;
      auVar78._28_4_ = fVar259;
      fVar212 = auVar29._0_4_;
      fVar216 = auVar29._4_4_;
      auVar79._4_4_ = (float)local_7a0._4_4_ * fVar216;
      auVar79._0_4_ = (float)local_7a0._0_4_ * fVar212;
      fVar220 = auVar29._8_4_;
      auVar79._8_4_ = fStack_798 * fVar220;
      fVar246 = auVar29._12_4_;
      auVar79._12_4_ = fStack_794 * fVar246;
      fVar257 = auVar29._16_4_;
      auVar79._16_4_ = fStack_790 * fVar257;
      fVar259 = auVar29._20_4_;
      auVar79._20_4_ = fStack_78c * fVar259;
      fVar261 = auVar29._24_4_;
      auVar79._24_4_ = fStack_788 * fVar261;
      auVar79._28_4_ = auVar254._28_4_;
      auVar30 = vsubps_avx(auVar78,auVar79);
      local_720 = auVar211;
      auVar144 = vmaxps_avx(_local_780,auVar211);
      auVar80._4_4_ = auVar144._4_4_ * auVar144._4_4_ * (fVar214 * fVar214 + fVar216 * fVar216);
      auVar80._0_4_ = auVar144._0_4_ * auVar144._0_4_ * (fVar196 * fVar196 + fVar212 * fVar212);
      auVar80._8_4_ = auVar144._8_4_ * auVar144._8_4_ * (fVar218 * fVar218 + fVar220 * fVar220);
      auVar80._12_4_ = auVar144._12_4_ * auVar144._12_4_ * (fVar221 * fVar221 + fVar246 * fVar246);
      auVar80._16_4_ = auVar144._16_4_ * auVar144._16_4_ * (fVar256 * fVar256 + fVar257 * fVar257);
      auVar80._20_4_ = auVar144._20_4_ * auVar144._20_4_ * (fVar258 * fVar258 + fVar259 * fVar259);
      auVar80._24_4_ = auVar144._24_4_ * auVar144._24_4_ * (fVar260 * fVar260 + fVar261 * fVar261);
      auVar80._28_4_ = local_560._28_4_ + auVar254._28_4_;
      auVar81._4_4_ = auVar30._4_4_ * auVar30._4_4_;
      auVar81._0_4_ = auVar30._0_4_ * auVar30._0_4_;
      auVar81._8_4_ = auVar30._8_4_ * auVar30._8_4_;
      auVar81._12_4_ = auVar30._12_4_ * auVar30._12_4_;
      auVar81._16_4_ = auVar30._16_4_ * auVar30._16_4_;
      auVar81._20_4_ = auVar30._20_4_ * auVar30._20_4_;
      auVar81._24_4_ = auVar30._24_4_ * auVar30._24_4_;
      auVar81._28_4_ = auVar30._28_4_;
      _local_4e0 = vcmpps_avx(auVar81,auVar80,2);
      local_220 = (uint)lVar136;
      auVar202 = vpshufd_avx(ZEXT416(local_220),0);
      auVar250 = vpor_avx(auVar202,_DAT_01f4ad30);
      auVar202 = vpor_avx(auVar202,_DAT_01f7afa0);
      auVar250 = vpcmpgtd_avx(_local_4c0,auVar250);
      auVar202 = vpcmpgtd_avx(_local_4c0,auVar202);
      register0x00001290 = auVar202;
      _local_2e0 = auVar250;
      auVar144 = _local_2e0 & _local_4e0;
      local_5a0._0_8_ = lVar134;
      local_720._0_8_ = prim;
      fVar197 = (float)local_660._0_4_;
      fVar213 = (float)local_660._4_4_;
      fVar215 = fStack_658;
      fVar217 = fStack_654;
      fVar218 = fStack_650;
      fVar220 = fStack_64c;
      fVar221 = fStack_648;
      if ((((((((auVar144 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar144 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar144 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar144 >> 0x7f,0) != '\0') ||
            (auVar144 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar144 >> 0xbf,0) != '\0') ||
          (auVar144 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar144[0x1f] < '\0') {
        local_4a0 = fVar263 * (float)local_140._0_4_ +
                    fVar279 * (float)local_e0._0_4_ +
                    fVar310 * (float)local_2a0._0_4_ + (float)local_540._0_4_ * fVar275;
        fStack_49c = fVar270 * (float)local_140._4_4_ +
                     fVar242 * (float)local_e0._4_4_ +
                     fVar311 * (float)local_2a0._4_4_ + (float)local_540._4_4_ * fVar277;
        fStack_498 = fVar272 * fStack_138 +
                     fVar188 * fStack_d8 + fVar244 * fStack_298 + fStack_538 * fVar280;
        fStack_494 = fVar274 * fStack_134 +
                     fVar282 * fStack_d4 + fVar168 * fStack_294 + fStack_534 * fVar283;
        fStack_490 = fVar276 * fStack_130 +
                     fVar308 * fStack_d0 + fVar169 * fStack_290 + fStack_530 * fVar284;
        fStack_48c = fVar278 * fStack_12c +
                     fVar243 * fStack_cc + fVar186 * fStack_28c + fStack_52c * fVar229;
        fStack_488 = fVar281 * fStack_128 +
                     fVar190 * fStack_c8 + fVar187 * fStack_288 + fStack_528 * fVar141;
        fStack_484 = *(float *)pauVar2[1] + fStack_764 + pfVar3[7] + 0.0;
        local_480._0_4_ = auVar128._0_4_;
        local_480._4_4_ = auVar128._4_4_;
        fStack_478 = auVar128._8_4_;
        fStack_474 = auVar128._12_4_;
        fStack_470 = auVar128._16_4_;
        fStack_46c = auVar128._20_4_;
        fStack_468 = auVar128._24_4_;
        local_3c0._0_4_ = auVar127._0_4_;
        local_3c0._4_4_ = auVar127._4_4_;
        fStack_3b8 = auVar127._8_4_;
        fStack_3b4 = auVar127._12_4_;
        fStack_3b0 = auVar127._16_4_;
        fStack_3ac = auVar127._20_4_;
        fStack_3a8 = auVar127._24_4_;
        fVar169 = (float)local_2a0._0_4_ * (float)local_3c0._0_4_;
        fVar186 = (float)local_2a0._4_4_ * (float)local_3c0._4_4_;
        fVar187 = fStack_298 * fStack_3b8;
        fVar189 = fStack_294 * fStack_3b4;
        fVar191 = fStack_290 * fStack_3b0;
        fVar192 = fStack_28c * fStack_3ac;
        fVar193 = fStack_288 * fStack_3a8;
        local_3e0._0_4_ = auVar126._0_4_;
        local_3e0._4_4_ = auVar126._4_4_;
        fStack_3d8 = auVar126._8_4_;
        fStack_3d4 = auVar126._12_4_;
        fStack_3d0 = auVar126._16_4_;
        fStack_3cc = auVar126._20_4_;
        fStack_3c8 = auVar126._24_4_;
        fVar264 = (float)local_540._0_4_ * (float)local_3e0._0_4_;
        fVar271 = (float)local_540._4_4_ * (float)local_3e0._4_4_;
        fVar273 = fStack_538 * fStack_3d8;
        fVar275 = fStack_534 * fStack_3d4;
        fVar277 = fStack_530 * fStack_3d0;
        fVar280 = fStack_52c * fStack_3cc;
        fVar283 = fStack_528 * fStack_3c8;
        pfVar8 = (float *)(lVar139 + 0x21fcdfc + lVar136 * 4);
        fVar196 = *pfVar8;
        fVar212 = pfVar8[1];
        fVar214 = pfVar8[2];
        fVar216 = pfVar8[3];
        fVar246 = pfVar8[4];
        fVar256 = pfVar8[5];
        fVar257 = pfVar8[6];
        pfVar9 = (float *)(lVar139 + 0x21fd280 + lVar136 * 4);
        fVar258 = *pfVar9;
        fVar259 = pfVar9[1];
        fVar260 = pfVar9[2];
        fVar261 = pfVar9[3];
        fVar263 = pfVar9[4];
        fVar270 = pfVar9[5];
        fVar272 = pfVar9[6];
        fVar284 = pfVar6[7] + 0.0;
        pfVar10 = (float *)(lVar139 + 0x21fc978 + lVar136 * 4);
        fVar274 = *pfVar10;
        fVar276 = pfVar10[1];
        fVar278 = pfVar10[2];
        fVar281 = pfVar10[3];
        fVar279 = pfVar10[4];
        fVar242 = pfVar10[5];
        fVar188 = pfVar10[6];
        fVar168 = pfVar8[7] + pfVar9[7];
        fVar195 = pfVar9[7] + fVar284;
        fVar284 = pfVar6[7] + pfVar7[7] + fVar284;
        pfVar6 = (float *)(lVar139 + 0x21fc4f4 + lVar136 * 4);
        fVar282 = *pfVar6;
        fVar308 = pfVar6[1];
        fVar243 = pfVar6[2];
        fVar190 = pfVar6[3];
        fVar310 = pfVar6[4];
        fVar311 = pfVar6[5];
        fVar244 = pfVar6[6];
        local_3c0._4_4_ =
             (float)local_2c0._4_4_ * fVar308 +
             fVar276 * (float)local_640._4_4_ +
             (float)local_600._4_4_ * fVar212 + (float)local_3a0._4_4_ * fVar259;
        local_3c0._0_4_ =
             (float)local_2c0._0_4_ * fVar282 +
             fVar274 * (float)local_640._0_4_ +
             (float)local_600._0_4_ * fVar196 + (float)local_3a0._0_4_ * fVar258;
        fStack_3b8 = fStack_2b8 * fVar243 +
                     fVar278 * fStack_638 + fStack_5f8 * fVar214 + fStack_398 * fVar260;
        fStack_3b4 = fStack_2b4 * fVar190 +
                     fVar281 * fStack_634 + fStack_5f4 * fVar216 + fStack_394 * fVar261;
        fStack_3b0 = fStack_2b0 * fVar310 +
                     fVar279 * fStack_630 + fStack_5f0 * fVar246 + fStack_390 * fVar263;
        fStack_3ac = fStack_2ac * fVar311 +
                     fVar242 * fStack_62c + fStack_5ec * fVar256 + fStack_38c * fVar270;
        fStack_3a8 = fStack_2a8 * fVar244 +
                     fVar188 * fStack_628 + fStack_5e8 * fVar257 + fStack_388 * fVar272;
        fStack_3a4 = fVar168 + fVar195;
        local_3e0._4_4_ =
             fVar308 * (float)local_660._4_4_ +
             (float)local_700._4_4_ * fVar212 + (float)local_500._4_4_ * fVar259 +
             fVar276 * (float)local_620._4_4_;
        local_3e0._0_4_ =
             fVar282 * (float)local_660._0_4_ +
             (float)local_700._0_4_ * fVar196 + (float)local_500._0_4_ * fVar258 +
             fVar274 * (float)local_620._0_4_;
        fStack_3d8 = fVar243 * fStack_658 +
                     fStack_6f8 * fVar214 + fStack_4f8 * fVar260 + fVar278 * fStack_618;
        fStack_3d4 = fVar190 * fStack_654 +
                     fStack_6f4 * fVar216 + fStack_4f4 * fVar261 + fVar281 * fStack_614;
        fStack_3d0 = fVar310 * fStack_650 +
                     fStack_6f0 * fVar246 + fStack_4f0 * fVar263 + fVar279 * fStack_610;
        fStack_3cc = fVar311 * fStack_64c +
                     fStack_6ec * fVar256 + fStack_4ec * fVar270 + fVar242 * fStack_60c;
        fStack_3c8 = fVar244 * fStack_648 +
                     fStack_6e8 * fVar257 + fStack_4e8 * fVar272 + fVar188 * fStack_608;
        fStack_3c4 = fVar195 + fVar284;
        auVar339._0_4_ =
             fVar274 * (float)local_e0._0_4_ +
             (float)local_2a0._0_4_ * fVar196 + (float)local_540._0_4_ * fVar258 +
             fVar282 * (float)local_140._0_4_;
        auVar339._4_4_ =
             fVar276 * (float)local_e0._4_4_ +
             (float)local_2a0._4_4_ * fVar212 + (float)local_540._4_4_ * fVar259 +
             fVar308 * (float)local_140._4_4_;
        auVar339._8_4_ =
             fVar278 * fStack_d8 + fStack_298 * fVar214 + fStack_538 * fVar260 +
             fVar243 * fStack_138;
        auVar339._12_4_ =
             fVar281 * fStack_d4 + fStack_294 * fVar216 + fStack_534 * fVar261 +
             fVar190 * fStack_134;
        auVar339._16_4_ =
             fVar279 * fStack_d0 + fStack_290 * fVar246 + fStack_530 * fVar263 +
             fVar310 * fStack_130;
        auVar339._20_4_ =
             fVar242 * fStack_cc + fStack_28c * fVar256 + fStack_52c * fVar270 +
             fVar311 * fStack_12c;
        auVar339._24_4_ =
             fVar188 * fStack_c8 + fStack_288 * fVar257 + fStack_528 * fVar272 +
             fVar244 * fStack_128;
        auVar339._28_4_ = pfVar10[7] + fVar168 + fVar284;
        pfVar6 = (float *)(lVar139 + 0x21ff21c + lVar136 * 4);
        fVar196 = *pfVar6;
        fVar212 = pfVar6[1];
        fVar214 = pfVar6[2];
        fVar216 = pfVar6[3];
        fVar246 = pfVar6[4];
        fVar256 = pfVar6[5];
        fVar257 = pfVar6[6];
        pfVar7 = (float *)(lVar139 + 0x21ff6a0 + lVar136 * 4);
        fVar258 = *pfVar7;
        fVar259 = pfVar7[1];
        fVar260 = pfVar7[2];
        fVar261 = pfVar7[3];
        fVar263 = pfVar7[4];
        fVar270 = pfVar7[5];
        fVar272 = pfVar7[6];
        pfVar8 = (float *)(lVar139 + 0x21fed98 + lVar136 * 4);
        fVar274 = *pfVar8;
        fVar276 = pfVar8[1];
        fVar278 = pfVar8[2];
        fVar281 = pfVar8[3];
        fVar279 = pfVar8[4];
        fVar242 = pfVar8[5];
        fVar188 = pfVar8[6];
        pfVar9 = (float *)(lVar139 + 0x21fe914 + lVar136 * 4);
        fVar282 = *pfVar9;
        fVar308 = pfVar9[1];
        fVar243 = pfVar9[2];
        fVar190 = pfVar9[3];
        fVar310 = pfVar9[4];
        fVar311 = pfVar9[5];
        fVar244 = pfVar9[6];
        auVar314._0_4_ =
             (float)local_2c0._0_4_ * fVar282 +
             fVar274 * (float)local_640._0_4_ +
             (float)local_600._0_4_ * fVar196 + (float)local_3a0._0_4_ * fVar258;
        auVar314._4_4_ =
             (float)local_2c0._4_4_ * fVar308 +
             fVar276 * (float)local_640._4_4_ +
             (float)local_600._4_4_ * fVar212 + (float)local_3a0._4_4_ * fVar259;
        auVar314._8_4_ =
             fStack_2b8 * fVar243 +
             fVar278 * fStack_638 + fStack_5f8 * fVar214 + fStack_398 * fVar260;
        auVar314._12_4_ =
             fStack_2b4 * fVar190 +
             fVar281 * fStack_634 + fStack_5f4 * fVar216 + fStack_394 * fVar261;
        auVar314._16_4_ =
             fStack_2b0 * fVar310 +
             fVar279 * fStack_630 + fStack_5f0 * fVar246 + fStack_390 * fVar263;
        auVar314._20_4_ =
             fStack_2ac * fVar311 +
             fVar242 * fStack_62c + fStack_5ec * fVar256 + fStack_38c * fVar270;
        auVar314._24_4_ =
             fStack_2a8 * fVar244 +
             fVar188 * fStack_628 + fStack_5e8 * fVar257 + fStack_388 * fVar272;
        auVar314._28_4_ = fStack_384 + fStack_384 + fStack_5e4 + fStack_384;
        auVar334._0_4_ =
             fVar282 * (float)local_660._0_4_ +
             fVar274 * (float)local_620._0_4_ +
             (float)local_700._0_4_ * fVar196 + (float)local_500._0_4_ * fVar258;
        auVar334._4_4_ =
             fVar308 * (float)local_660._4_4_ +
             fVar276 * (float)local_620._4_4_ +
             (float)local_700._4_4_ * fVar212 + (float)local_500._4_4_ * fVar259;
        auVar334._8_4_ =
             fVar243 * fStack_658 +
             fVar278 * fStack_618 + fStack_6f8 * fVar214 + fStack_4f8 * fVar260;
        auVar334._12_4_ =
             fVar190 * fStack_654 +
             fVar281 * fStack_614 + fStack_6f4 * fVar216 + fStack_4f4 * fVar261;
        auVar334._16_4_ =
             fVar310 * fStack_650 +
             fVar279 * fStack_610 + fStack_6f0 * fVar246 + fStack_4f0 * fVar263;
        auVar334._20_4_ =
             fVar311 * fStack_64c +
             fVar242 * fStack_60c + fStack_6ec * fVar256 + fStack_4ec * fVar270;
        auVar334._24_4_ =
             fVar244 * fStack_648 +
             fVar188 * fStack_608 + fStack_6e8 * fVar257 + fStack_4e8 * fVar272;
        auVar334._28_4_ = fStack_384 + fStack_384 + fStack_4e4 + fStack_384;
        auVar255._8_4_ = 0x7fffffff;
        auVar255._0_8_ = 0x7fffffff7fffffff;
        auVar255._12_4_ = 0x7fffffff;
        auVar255._16_4_ = 0x7fffffff;
        auVar255._20_4_ = 0x7fffffff;
        auVar255._24_4_ = 0x7fffffff;
        auVar255._28_4_ = 0x7fffffff;
        auVar144 = vandps_avx(_local_3c0,auVar255);
        auVar30 = vandps_avx(_local_3e0,auVar255);
        auVar30 = vmaxps_avx(auVar144,auVar30);
        auVar144 = vandps_avx(auVar339,auVar255);
        auVar30 = vmaxps_avx(auVar30,auVar144);
        auVar30 = vcmpps_avx(auVar30,_local_400,1);
        auVar352 = vblendvps_avx(_local_3c0,auVar28,auVar30);
        auVar156._0_4_ =
             fVar282 * (float)local_140._0_4_ +
             fVar274 * (float)local_e0._0_4_ +
             fVar258 * (float)local_540._0_4_ + (float)local_2a0._0_4_ * fVar196;
        auVar156._4_4_ =
             fVar308 * (float)local_140._4_4_ +
             fVar276 * (float)local_e0._4_4_ +
             fVar259 * (float)local_540._4_4_ + (float)local_2a0._4_4_ * fVar212;
        auVar156._8_4_ =
             fVar243 * fStack_138 +
             fVar278 * fStack_d8 + fVar260 * fStack_538 + fStack_298 * fVar214;
        auVar156._12_4_ =
             fVar190 * fStack_134 +
             fVar281 * fStack_d4 + fVar261 * fStack_534 + fStack_294 * fVar216;
        auVar156._16_4_ =
             fVar310 * fStack_130 +
             fVar279 * fStack_d0 + fVar263 * fStack_530 + fStack_290 * fVar246;
        auVar156._20_4_ =
             fVar311 * fStack_12c +
             fVar242 * fStack_cc + fVar270 * fStack_52c + fStack_28c * fVar256;
        auVar156._24_4_ =
             fVar244 * fStack_128 +
             fVar188 * fStack_c8 + fVar272 * fStack_528 + fStack_288 * fVar257;
        auVar156._28_4_ = auVar144._28_4_ + pfVar8[7] + pfVar7[7] + pfVar6[7];
        auVar31 = vblendvps_avx(_local_3e0,auVar29,auVar30);
        auVar144 = vandps_avx(auVar314,auVar255);
        auVar30 = vandps_avx(auVar334,auVar255);
        auVar32 = vmaxps_avx(auVar144,auVar30);
        auVar144 = vandps_avx(auVar156,auVar255);
        auVar144 = vmaxps_avx(auVar32,auVar144);
        local_580._0_4_ = auVar129._0_4_;
        local_580._4_4_ = auVar129._4_4_;
        fStack_578 = auVar129._8_4_;
        fStack_574 = auVar129._12_4_;
        fStack_570 = auVar129._16_4_;
        fStack_56c = auVar129._20_4_;
        fStack_568 = auVar129._24_4_;
        auVar30 = vcmpps_avx(auVar144,_local_400,1);
        auVar144 = vblendvps_avx(auVar314,auVar28,auVar30);
        auVar157._0_4_ =
             (float)local_140._0_4_ * (float)local_580._0_4_ +
             (float)local_e0._0_4_ * (float)local_480._0_4_ + fVar169 + fVar264;
        auVar157._4_4_ =
             (float)local_140._4_4_ * (float)local_580._4_4_ +
             (float)local_e0._4_4_ * (float)local_480._4_4_ + fVar186 + fVar271;
        auVar157._8_4_ = fStack_138 * fStack_578 + fStack_d8 * fStack_478 + fVar187 + fVar273;
        auVar157._12_4_ = fStack_134 * fStack_574 + fStack_d4 * fStack_474 + fVar189 + fVar275;
        auVar157._16_4_ = fStack_130 * fStack_570 + fStack_d0 * fStack_470 + fVar191 + fVar277;
        auVar157._20_4_ = fStack_12c * fStack_56c + fStack_cc * fStack_46c + fVar192 + fVar280;
        auVar157._24_4_ = fStack_128 * fStack_568 + fStack_c8 * fStack_468 + fVar193 + fVar283;
        auVar157._28_4_ = auVar32._28_4_ + fStack_484 + pfVar3[7] + 0.0;
        auVar28 = vblendvps_avx(auVar334,auVar29,auVar30);
        fVar193 = auVar352._0_4_;
        fVar195 = auVar352._4_4_;
        fVar264 = auVar352._8_4_;
        fVar271 = auVar352._12_4_;
        fVar273 = auVar352._16_4_;
        fVar275 = auVar352._20_4_;
        fVar277 = auVar352._24_4_;
        fVar280 = auVar352._28_4_;
        fVar274 = auVar144._0_4_;
        fVar278 = auVar144._4_4_;
        fVar279 = auVar144._8_4_;
        fVar188 = auVar144._12_4_;
        fVar308 = auVar144._16_4_;
        fVar190 = auVar144._20_4_;
        fVar311 = auVar144._24_4_;
        fVar196 = auVar31._0_4_;
        fVar214 = auVar31._4_4_;
        fVar246 = auVar31._8_4_;
        fVar257 = auVar31._12_4_;
        fVar259 = auVar31._16_4_;
        fVar261 = auVar31._20_4_;
        fVar270 = auVar31._24_4_;
        auVar325._0_4_ = fVar196 * fVar196 + fVar193 * fVar193;
        auVar325._4_4_ = fVar214 * fVar214 + fVar195 * fVar195;
        auVar325._8_4_ = fVar246 * fVar246 + fVar264 * fVar264;
        auVar325._12_4_ = fVar257 * fVar257 + fVar271 * fVar271;
        auVar325._16_4_ = fVar259 * fVar259 + fVar273 * fVar273;
        auVar325._20_4_ = fVar261 * fVar261 + fVar275 * fVar275;
        auVar325._24_4_ = fVar270 * fVar270 + fVar277 * fVar277;
        auVar325._28_4_ = fStack_2a4 + auVar29._28_4_;
        auVar29 = vrsqrtps_avx(auVar325);
        fVar212 = auVar29._0_4_;
        fVar216 = auVar29._4_4_;
        auVar82._4_4_ = fVar216 * 1.5;
        auVar82._0_4_ = fVar212 * 1.5;
        fVar256 = auVar29._8_4_;
        auVar82._8_4_ = fVar256 * 1.5;
        fVar258 = auVar29._12_4_;
        auVar82._12_4_ = fVar258 * 1.5;
        fVar260 = auVar29._16_4_;
        auVar82._16_4_ = fVar260 * 1.5;
        fVar263 = auVar29._20_4_;
        auVar82._20_4_ = fVar263 * 1.5;
        fVar272 = auVar29._24_4_;
        auVar82._24_4_ = fVar272 * 1.5;
        auVar82._28_4_ = auVar334._28_4_;
        auVar83._4_4_ = fVar216 * fVar216 * fVar216 * auVar325._4_4_ * 0.5;
        auVar83._0_4_ = fVar212 * fVar212 * fVar212 * auVar325._0_4_ * 0.5;
        auVar83._8_4_ = fVar256 * fVar256 * fVar256 * auVar325._8_4_ * 0.5;
        auVar83._12_4_ = fVar258 * fVar258 * fVar258 * auVar325._12_4_ * 0.5;
        auVar83._16_4_ = fVar260 * fVar260 * fVar260 * auVar325._16_4_ * 0.5;
        auVar83._20_4_ = fVar263 * fVar263 * fVar263 * auVar325._20_4_ * 0.5;
        auVar83._24_4_ = fVar272 * fVar272 * fVar272 * auVar325._24_4_ * 0.5;
        auVar83._28_4_ = auVar325._28_4_;
        auVar30 = vsubps_avx(auVar82,auVar83);
        fVar168 = auVar30._0_4_;
        fVar169 = auVar30._4_4_;
        fVar186 = auVar30._8_4_;
        fVar187 = auVar30._12_4_;
        fVar189 = auVar30._16_4_;
        fVar191 = auVar30._20_4_;
        fVar192 = auVar30._24_4_;
        fVar212 = auVar28._0_4_;
        fVar216 = auVar28._4_4_;
        fVar256 = auVar28._8_4_;
        fVar258 = auVar28._12_4_;
        fVar260 = auVar28._16_4_;
        fVar263 = auVar28._20_4_;
        fVar272 = auVar28._24_4_;
        auVar302._0_4_ = fVar212 * fVar212 + fVar274 * fVar274;
        auVar302._4_4_ = fVar216 * fVar216 + fVar278 * fVar278;
        auVar302._8_4_ = fVar256 * fVar256 + fVar279 * fVar279;
        auVar302._12_4_ = fVar258 * fVar258 + fVar188 * fVar188;
        auVar302._16_4_ = fVar260 * fVar260 + fVar308 * fVar308;
        auVar302._20_4_ = fVar263 * fVar263 + fVar190 * fVar190;
        auVar302._24_4_ = fVar272 * fVar272 + fVar311 * fVar311;
        auVar302._28_4_ = auVar29._28_4_ + auVar144._28_4_;
        auVar144 = vrsqrtps_avx(auVar302);
        fVar276 = auVar144._0_4_;
        fVar281 = auVar144._4_4_;
        auVar84._4_4_ = fVar281 * 1.5;
        auVar84._0_4_ = fVar276 * 1.5;
        fVar242 = auVar144._8_4_;
        auVar84._8_4_ = fVar242 * 1.5;
        fVar282 = auVar144._12_4_;
        auVar84._12_4_ = fVar282 * 1.5;
        fVar243 = auVar144._16_4_;
        auVar84._16_4_ = fVar243 * 1.5;
        fVar310 = auVar144._20_4_;
        auVar84._20_4_ = fVar310 * 1.5;
        fVar244 = auVar144._24_4_;
        auVar84._24_4_ = fVar244 * 1.5;
        auVar84._28_4_ = auVar334._28_4_;
        auVar85._4_4_ = fVar281 * fVar281 * fVar281 * auVar302._4_4_ * 0.5;
        auVar85._0_4_ = fVar276 * fVar276 * fVar276 * auVar302._0_4_ * 0.5;
        auVar85._8_4_ = fVar242 * fVar242 * fVar242 * auVar302._8_4_ * 0.5;
        auVar85._12_4_ = fVar282 * fVar282 * fVar282 * auVar302._12_4_ * 0.5;
        auVar85._16_4_ = fVar243 * fVar243 * fVar243 * auVar302._16_4_ * 0.5;
        auVar85._20_4_ = fVar310 * fVar310 * fVar310 * auVar302._20_4_ * 0.5;
        auVar85._24_4_ = fVar244 * fVar244 * fVar244 * auVar302._24_4_ * 0.5;
        auVar85._28_4_ = auVar302._28_4_;
        auVar28 = vsubps_avx(auVar84,auVar85);
        fVar276 = auVar28._0_4_;
        fVar281 = auVar28._4_4_;
        fVar242 = auVar28._8_4_;
        fVar282 = auVar28._12_4_;
        fVar243 = auVar28._16_4_;
        fVar310 = auVar28._20_4_;
        fVar244 = auVar28._24_4_;
        fVar196 = (float)local_780._0_4_ * fVar168 * fVar196;
        fVar214 = (float)local_780._4_4_ * fVar169 * fVar214;
        auVar86._4_4_ = fVar214;
        auVar86._0_4_ = fVar196;
        fVar246 = fStack_778 * fVar186 * fVar246;
        auVar86._8_4_ = fVar246;
        fVar257 = fStack_774 * fVar187 * fVar257;
        auVar86._12_4_ = fVar257;
        fVar259 = fStack_770 * fVar189 * fVar259;
        auVar86._16_4_ = fVar259;
        fVar261 = fStack_76c * fVar191 * fVar261;
        auVar86._20_4_ = fVar261;
        fVar270 = fStack_768 * fVar192 * fVar270;
        auVar86._24_4_ = fVar270;
        auVar86._28_4_ = auVar144._28_4_;
        local_580._4_4_ = fVar214 + (float)local_7a0._4_4_;
        local_580._0_4_ = fVar196 + (float)local_7a0._0_4_;
        fStack_578 = fVar246 + fStack_798;
        fStack_574 = fVar257 + fStack_794;
        fStack_570 = fVar259 + fStack_790;
        fStack_56c = fVar261 + fStack_78c;
        fStack_568 = fVar270 + fStack_788;
        fStack_564 = auVar144._28_4_ + fStack_784;
        fVar196 = (float)local_780._0_4_ * fVar168 * -fVar193;
        fVar214 = (float)local_780._4_4_ * fVar169 * -fVar195;
        auVar87._4_4_ = fVar214;
        auVar87._0_4_ = fVar196;
        fVar246 = fStack_778 * fVar186 * -fVar264;
        auVar87._8_4_ = fVar246;
        fVar257 = fStack_774 * fVar187 * -fVar271;
        auVar87._12_4_ = fVar257;
        fVar259 = fStack_770 * fVar189 * -fVar273;
        auVar87._16_4_ = fVar259;
        fVar261 = fStack_76c * fVar191 * -fVar275;
        auVar87._20_4_ = fVar261;
        fVar270 = fStack_768 * fVar192 * -fVar277;
        auVar87._24_4_ = fVar270;
        auVar87._28_4_ = -fVar280;
        local_480._4_4_ = local_520._4_4_ + fVar214;
        local_480._0_4_ = (float)local_520._0_4_ + fVar196;
        fStack_478 = local_520._8_4_ + fVar246;
        fStack_474 = local_520._12_4_ + fVar257;
        fStack_470 = local_520._16_4_ + fVar259;
        fStack_46c = local_520._20_4_ + fVar261;
        fStack_468 = local_520._24_4_ + fVar270;
        fStack_464 = local_520._28_4_ + -fVar280;
        fVar196 = fVar168 * 0.0 * (float)local_780._0_4_;
        fVar214 = fVar169 * 0.0 * (float)local_780._4_4_;
        auVar88._4_4_ = fVar214;
        auVar88._0_4_ = fVar196;
        fVar246 = fVar186 * 0.0 * fStack_778;
        auVar88._8_4_ = fVar246;
        fVar257 = fVar187 * 0.0 * fStack_774;
        auVar88._12_4_ = fVar257;
        fVar259 = fVar189 * 0.0 * fStack_770;
        auVar88._16_4_ = fVar259;
        fVar261 = fVar191 * 0.0 * fStack_76c;
        auVar88._20_4_ = fVar261;
        fVar270 = fVar192 * 0.0 * fStack_768;
        auVar88._24_4_ = fVar270;
        auVar88._28_4_ = fVar280;
        auVar32 = vsubps_avx(_local_7a0,auVar86);
        auVar351._0_4_ = fVar196 + auVar157._0_4_;
        auVar351._4_4_ = fVar214 + auVar157._4_4_;
        auVar351._8_4_ = fVar246 + auVar157._8_4_;
        auVar351._12_4_ = fVar257 + auVar157._12_4_;
        auVar351._16_4_ = fVar259 + auVar157._16_4_;
        auVar351._20_4_ = fVar261 + auVar157._20_4_;
        auVar351._24_4_ = fVar270 + auVar157._24_4_;
        auVar351._28_4_ = fVar280 + auVar157._28_4_;
        fVar196 = auVar211._0_4_ * fVar276 * fVar212;
        fVar212 = auVar211._4_4_ * fVar281 * fVar216;
        auVar89._4_4_ = fVar212;
        auVar89._0_4_ = fVar196;
        fVar214 = auVar211._8_4_ * fVar242 * fVar256;
        auVar89._8_4_ = fVar214;
        fVar216 = auVar211._12_4_ * fVar282 * fVar258;
        auVar89._12_4_ = fVar216;
        fVar246 = auVar211._16_4_ * fVar243 * fVar260;
        auVar89._16_4_ = fVar246;
        fVar256 = auVar211._20_4_ * fVar310 * fVar263;
        auVar89._20_4_ = fVar256;
        fVar257 = auVar211._24_4_ * fVar244 * fVar272;
        auVar89._24_4_ = fVar257;
        auVar89._28_4_ = fStack_784;
        auVar35 = vsubps_avx(local_520,auVar87);
        auVar340._0_4_ = (float)local_560._0_4_ + fVar196;
        auVar340._4_4_ = local_560._4_4_ + fVar212;
        auVar340._8_4_ = local_560._8_4_ + fVar214;
        auVar340._12_4_ = local_560._12_4_ + fVar216;
        auVar340._16_4_ = local_560._16_4_ + fVar246;
        auVar340._20_4_ = local_560._20_4_ + fVar256;
        auVar340._24_4_ = local_560._24_4_ + fVar257;
        auVar340._28_4_ = local_560._28_4_ + fStack_784;
        fVar196 = fVar276 * -fVar274 * auVar211._0_4_;
        fVar212 = fVar281 * -fVar278 * auVar211._4_4_;
        auVar90._4_4_ = fVar212;
        auVar90._0_4_ = fVar196;
        fVar214 = fVar242 * -fVar279 * auVar211._8_4_;
        auVar90._8_4_ = fVar214;
        fVar216 = fVar282 * -fVar188 * auVar211._12_4_;
        auVar90._12_4_ = fVar216;
        fVar246 = fVar243 * -fVar308 * auVar211._16_4_;
        auVar90._16_4_ = fVar246;
        fVar256 = fVar310 * -fVar190 * auVar211._20_4_;
        auVar90._20_4_ = fVar256;
        fVar257 = fVar244 * -fVar311 * auVar211._24_4_;
        auVar90._24_4_ = fVar257;
        auVar90._28_4_ = fStack_764;
        auVar145 = vsubps_avx(auVar157,auVar88);
        auVar239._0_4_ = auVar254._0_4_ + fVar196;
        auVar239._4_4_ = auVar254._4_4_ + fVar212;
        auVar239._8_4_ = auVar254._8_4_ + fVar214;
        auVar239._12_4_ = auVar254._12_4_ + fVar216;
        auVar239._16_4_ = auVar254._16_4_ + fVar246;
        auVar239._20_4_ = auVar254._20_4_ + fVar256;
        auVar239._24_4_ = auVar254._24_4_ + fVar257;
        auVar239._28_4_ = auVar254._28_4_ + fStack_764;
        fVar196 = fVar276 * 0.0 * auVar211._0_4_;
        fVar212 = fVar281 * 0.0 * auVar211._4_4_;
        auVar91._4_4_ = fVar212;
        auVar91._0_4_ = fVar196;
        fVar214 = fVar242 * 0.0 * auVar211._8_4_;
        auVar91._8_4_ = fVar214;
        fVar216 = fVar282 * 0.0 * auVar211._12_4_;
        auVar91._12_4_ = fVar216;
        fVar246 = fVar243 * 0.0 * auVar211._16_4_;
        auVar91._16_4_ = fVar246;
        fVar256 = fVar310 * 0.0 * auVar211._20_4_;
        auVar91._20_4_ = fVar256;
        fVar257 = fVar244 * 0.0 * auVar211._24_4_;
        auVar91._24_4_ = fVar257;
        auVar91._28_4_ = auVar157._28_4_;
        auVar144 = vsubps_avx(local_560,auVar89);
        auVar124._4_4_ = fStack_49c;
        auVar124._0_4_ = local_4a0;
        auVar124._8_4_ = fStack_498;
        auVar124._12_4_ = fStack_494;
        auVar124._16_4_ = fStack_490;
        auVar124._20_4_ = fStack_48c;
        auVar124._24_4_ = fStack_488;
        auVar124._28_4_ = fStack_484;
        auVar315._0_4_ = local_4a0 + fVar196;
        auVar315._4_4_ = fStack_49c + fVar212;
        auVar315._8_4_ = fStack_498 + fVar214;
        auVar315._12_4_ = fStack_494 + fVar216;
        auVar315._16_4_ = fStack_490 + fVar246;
        auVar315._20_4_ = fStack_48c + fVar256;
        auVar315._24_4_ = fStack_488 + fVar257;
        auVar315._28_4_ = fStack_484 + auVar157._28_4_;
        auVar29 = vsubps_avx(auVar254,auVar90);
        auVar30 = vsubps_avx(auVar124,auVar91);
        auVar352 = vsubps_avx(auVar239,auVar35);
        auVar31 = vsubps_avx(auVar315,auVar145);
        auVar92._4_4_ = auVar145._4_4_ * auVar352._4_4_;
        auVar92._0_4_ = auVar145._0_4_ * auVar352._0_4_;
        auVar92._8_4_ = auVar145._8_4_ * auVar352._8_4_;
        auVar92._12_4_ = auVar145._12_4_ * auVar352._12_4_;
        auVar92._16_4_ = auVar145._16_4_ * auVar352._16_4_;
        auVar92._20_4_ = auVar145._20_4_ * auVar352._20_4_;
        auVar92._24_4_ = auVar145._24_4_ * auVar352._24_4_;
        auVar92._28_4_ = auVar334._28_4_;
        auVar93._4_4_ = auVar35._4_4_ * auVar31._4_4_;
        auVar93._0_4_ = auVar35._0_4_ * auVar31._0_4_;
        auVar93._8_4_ = auVar35._8_4_ * auVar31._8_4_;
        auVar93._12_4_ = auVar35._12_4_ * auVar31._12_4_;
        auVar93._16_4_ = auVar35._16_4_ * auVar31._16_4_;
        auVar93._20_4_ = auVar35._20_4_ * auVar31._20_4_;
        auVar93._24_4_ = auVar35._24_4_ * auVar31._24_4_;
        auVar93._28_4_ = fStack_484;
        auVar33 = vsubps_avx(auVar93,auVar92);
        auVar94._4_4_ = auVar32._4_4_ * auVar31._4_4_;
        auVar94._0_4_ = auVar32._0_4_ * auVar31._0_4_;
        auVar94._8_4_ = auVar32._8_4_ * auVar31._8_4_;
        auVar94._12_4_ = auVar32._12_4_ * auVar31._12_4_;
        auVar94._16_4_ = auVar32._16_4_ * auVar31._16_4_;
        auVar94._20_4_ = auVar32._20_4_ * auVar31._20_4_;
        auVar94._24_4_ = auVar32._24_4_ * auVar31._24_4_;
        auVar94._28_4_ = auVar31._28_4_;
        auVar31 = vsubps_avx(auVar340,auVar32);
        auVar95._4_4_ = auVar145._4_4_ * auVar31._4_4_;
        auVar95._0_4_ = auVar145._0_4_ * auVar31._0_4_;
        auVar95._8_4_ = auVar145._8_4_ * auVar31._8_4_;
        auVar95._12_4_ = auVar145._12_4_ * auVar31._12_4_;
        auVar95._16_4_ = auVar145._16_4_ * auVar31._16_4_;
        auVar95._20_4_ = auVar145._20_4_ * auVar31._20_4_;
        auVar95._24_4_ = auVar145._24_4_ * auVar31._24_4_;
        auVar95._28_4_ = auVar28._28_4_;
        auVar34 = vsubps_avx(auVar95,auVar94);
        auVar96._4_4_ = auVar35._4_4_ * auVar31._4_4_;
        auVar96._0_4_ = auVar35._0_4_ * auVar31._0_4_;
        auVar96._8_4_ = auVar35._8_4_ * auVar31._8_4_;
        auVar96._12_4_ = auVar35._12_4_ * auVar31._12_4_;
        auVar96._16_4_ = auVar35._16_4_ * auVar31._16_4_;
        auVar96._20_4_ = auVar35._20_4_ * auVar31._20_4_;
        auVar96._24_4_ = auVar35._24_4_ * auVar31._24_4_;
        auVar96._28_4_ = auVar28._28_4_;
        auVar97._4_4_ = auVar32._4_4_ * auVar352._4_4_;
        auVar97._0_4_ = auVar32._0_4_ * auVar352._0_4_;
        auVar97._8_4_ = auVar32._8_4_ * auVar352._8_4_;
        auVar97._12_4_ = auVar32._12_4_ * auVar352._12_4_;
        auVar97._16_4_ = auVar32._16_4_ * auVar352._16_4_;
        auVar97._20_4_ = auVar32._20_4_ * auVar352._20_4_;
        auVar97._24_4_ = auVar32._24_4_ * auVar352._24_4_;
        auVar97._28_4_ = auVar352._28_4_;
        auVar28 = vsubps_avx(auVar97,auVar96);
        auVar181._0_4_ = auVar33._0_4_ * 0.0 + auVar28._0_4_ + auVar34._0_4_ * 0.0;
        auVar181._4_4_ = auVar33._4_4_ * 0.0 + auVar28._4_4_ + auVar34._4_4_ * 0.0;
        auVar181._8_4_ = auVar33._8_4_ * 0.0 + auVar28._8_4_ + auVar34._8_4_ * 0.0;
        auVar181._12_4_ = auVar33._12_4_ * 0.0 + auVar28._12_4_ + auVar34._12_4_ * 0.0;
        auVar181._16_4_ = auVar33._16_4_ * 0.0 + auVar28._16_4_ + auVar34._16_4_ * 0.0;
        auVar181._20_4_ = auVar33._20_4_ * 0.0 + auVar28._20_4_ + auVar34._20_4_ * 0.0;
        auVar181._24_4_ = auVar33._24_4_ * 0.0 + auVar28._24_4_ + auVar34._24_4_ * 0.0;
        auVar181._28_4_ = auVar33._28_4_ + auVar28._28_4_ + auVar34._28_4_;
        auVar27 = vcmpps_avx(auVar181,ZEXT832(0) << 0x20,2);
        auVar144 = vblendvps_avx(auVar144,_local_580,auVar27);
        auVar28 = vblendvps_avx(auVar29,_local_480,auVar27);
        auVar29 = vblendvps_avx(auVar30,auVar351,auVar27);
        auVar30 = vblendvps_avx(auVar32,auVar340,auVar27);
        auVar352 = vblendvps_avx(auVar35,auVar239,auVar27);
        auVar31 = vblendvps_avx(auVar145,auVar315,auVar27);
        auVar32 = vblendvps_avx(auVar340,auVar32,auVar27);
        auVar33 = vblendvps_avx(auVar239,auVar35,auVar27);
        auVar34 = vblendvps_avx(auVar315,auVar145,auVar27);
        _local_7a0 = vandps_avx(_local_2e0,_local_4e0);
        auVar32 = vsubps_avx(auVar32,auVar144);
        auVar146 = vsubps_avx(auVar33,auVar28);
        auVar34 = vsubps_avx(auVar34,auVar29);
        auVar147 = vsubps_avx(auVar28,auVar352);
        fVar196 = auVar146._0_4_;
        fVar164 = auVar29._0_4_;
        fVar258 = auVar146._4_4_;
        fVar165 = auVar29._4_4_;
        auVar98._4_4_ = fVar165 * fVar258;
        auVar98._0_4_ = fVar164 * fVar196;
        fVar274 = auVar146._8_4_;
        fVar166 = auVar29._8_4_;
        auVar98._8_4_ = fVar166 * fVar274;
        fVar282 = auVar146._12_4_;
        fVar167 = auVar29._12_4_;
        auVar98._12_4_ = fVar167 * fVar282;
        fVar168 = auVar146._16_4_;
        fVar230 = auVar29._16_4_;
        auVar98._16_4_ = fVar230 * fVar168;
        fVar193 = auVar146._20_4_;
        fVar240 = auVar29._20_4_;
        auVar98._20_4_ = fVar240 * fVar193;
        fVar280 = auVar146._24_4_;
        fVar241 = auVar29._24_4_;
        auVar98._24_4_ = fVar241 * fVar280;
        auVar98._28_4_ = auVar33._28_4_;
        fVar212 = auVar28._0_4_;
        fVar140 = auVar34._0_4_;
        fVar259 = auVar28._4_4_;
        fVar161 = auVar34._4_4_;
        auVar99._4_4_ = fVar161 * fVar259;
        auVar99._0_4_ = fVar140 * fVar212;
        fVar276 = auVar28._8_4_;
        fVar162 = auVar34._8_4_;
        auVar99._8_4_ = fVar162 * fVar276;
        fVar308 = auVar28._12_4_;
        fVar163 = auVar34._12_4_;
        auVar99._12_4_ = fVar163 * fVar308;
        fVar169 = auVar28._16_4_;
        fVar305 = auVar34._16_4_;
        auVar99._16_4_ = fVar305 * fVar169;
        fVar195 = auVar28._20_4_;
        fVar306 = auVar34._20_4_;
        auVar99._20_4_ = fVar306 * fVar195;
        fVar283 = auVar28._24_4_;
        fVar307 = auVar34._24_4_;
        uVar11 = auVar35._28_4_;
        auVar99._24_4_ = fVar307 * fVar283;
        auVar99._28_4_ = uVar11;
        auVar33 = vsubps_avx(auVar99,auVar98);
        fVar214 = auVar144._0_4_;
        fVar260 = auVar144._4_4_;
        auVar100._4_4_ = fVar161 * fVar260;
        auVar100._0_4_ = fVar140 * fVar214;
        fVar278 = auVar144._8_4_;
        auVar100._8_4_ = fVar162 * fVar278;
        fVar243 = auVar144._12_4_;
        auVar100._12_4_ = fVar163 * fVar243;
        fVar186 = auVar144._16_4_;
        auVar100._16_4_ = fVar305 * fVar186;
        fVar264 = auVar144._20_4_;
        auVar100._20_4_ = fVar306 * fVar264;
        fVar284 = auVar144._24_4_;
        auVar100._24_4_ = fVar307 * fVar284;
        auVar100._28_4_ = uVar11;
        fVar216 = auVar32._0_4_;
        fVar261 = auVar32._4_4_;
        auVar101._4_4_ = fVar165 * fVar261;
        auVar101._0_4_ = fVar164 * fVar216;
        fVar281 = auVar32._8_4_;
        auVar101._8_4_ = fVar166 * fVar281;
        fVar190 = auVar32._12_4_;
        auVar101._12_4_ = fVar167 * fVar190;
        fVar187 = auVar32._16_4_;
        auVar101._16_4_ = fVar230 * fVar187;
        fVar271 = auVar32._20_4_;
        auVar101._20_4_ = fVar240 * fVar271;
        fVar229 = auVar32._24_4_;
        auVar101._24_4_ = fVar241 * fVar229;
        auVar101._28_4_ = auVar340._28_4_;
        auVar35 = vsubps_avx(auVar101,auVar100);
        auVar102._4_4_ = fVar259 * fVar261;
        auVar102._0_4_ = fVar212 * fVar216;
        auVar102._8_4_ = fVar276 * fVar281;
        auVar102._12_4_ = fVar308 * fVar190;
        auVar102._16_4_ = fVar169 * fVar187;
        auVar102._20_4_ = fVar195 * fVar271;
        auVar102._24_4_ = fVar283 * fVar229;
        auVar102._28_4_ = uVar11;
        auVar103._4_4_ = fVar260 * fVar258;
        auVar103._0_4_ = fVar214 * fVar196;
        auVar103._8_4_ = fVar278 * fVar274;
        auVar103._12_4_ = fVar243 * fVar282;
        auVar103._16_4_ = fVar186 * fVar168;
        auVar103._20_4_ = fVar264 * fVar193;
        auVar103._24_4_ = fVar284 * fVar280;
        auVar103._28_4_ = auVar145._28_4_;
        auVar145 = vsubps_avx(auVar103,auVar102);
        auVar36 = vsubps_avx(auVar29,auVar31);
        fVar256 = auVar145._28_4_ + auVar35._28_4_;
        auVar326._0_4_ = auVar145._0_4_ + auVar35._0_4_ * 0.0 + auVar33._0_4_ * 0.0;
        auVar326._4_4_ = auVar145._4_4_ + auVar35._4_4_ * 0.0 + auVar33._4_4_ * 0.0;
        auVar326._8_4_ = auVar145._8_4_ + auVar35._8_4_ * 0.0 + auVar33._8_4_ * 0.0;
        auVar326._12_4_ = auVar145._12_4_ + auVar35._12_4_ * 0.0 + auVar33._12_4_ * 0.0;
        auVar326._16_4_ = auVar145._16_4_ + auVar35._16_4_ * 0.0 + auVar33._16_4_ * 0.0;
        auVar326._20_4_ = auVar145._20_4_ + auVar35._20_4_ * 0.0 + auVar33._20_4_ * 0.0;
        auVar326._24_4_ = auVar145._24_4_ + auVar35._24_4_ * 0.0 + auVar33._24_4_ * 0.0;
        auVar326._28_4_ = fVar256 + auVar33._28_4_;
        fVar246 = auVar147._0_4_;
        fVar263 = auVar147._4_4_;
        auVar104._4_4_ = auVar31._4_4_ * fVar263;
        auVar104._0_4_ = auVar31._0_4_ * fVar246;
        fVar279 = auVar147._8_4_;
        auVar104._8_4_ = auVar31._8_4_ * fVar279;
        fVar310 = auVar147._12_4_;
        auVar104._12_4_ = auVar31._12_4_ * fVar310;
        fVar189 = auVar147._16_4_;
        auVar104._16_4_ = auVar31._16_4_ * fVar189;
        fVar273 = auVar147._20_4_;
        auVar104._20_4_ = auVar31._20_4_ * fVar273;
        fVar141 = auVar147._24_4_;
        auVar104._24_4_ = auVar31._24_4_ * fVar141;
        auVar104._28_4_ = fVar256;
        fVar256 = auVar36._0_4_;
        fVar270 = auVar36._4_4_;
        auVar105._4_4_ = auVar352._4_4_ * fVar270;
        auVar105._0_4_ = auVar352._0_4_ * fVar256;
        fVar242 = auVar36._8_4_;
        auVar105._8_4_ = auVar352._8_4_ * fVar242;
        fVar311 = auVar36._12_4_;
        auVar105._12_4_ = auVar352._12_4_ * fVar311;
        fVar191 = auVar36._16_4_;
        auVar105._16_4_ = auVar352._16_4_ * fVar191;
        fVar275 = auVar36._20_4_;
        auVar105._20_4_ = auVar352._20_4_ * fVar275;
        fVar245 = auVar36._24_4_;
        auVar105._24_4_ = auVar352._24_4_ * fVar245;
        auVar105._28_4_ = auVar145._28_4_;
        auVar29 = vsubps_avx(auVar105,auVar104);
        auVar144 = vsubps_avx(auVar144,auVar30);
        fVar257 = auVar144._0_4_;
        fVar272 = auVar144._4_4_;
        auVar106._4_4_ = auVar31._4_4_ * fVar272;
        auVar106._0_4_ = auVar31._0_4_ * fVar257;
        fVar188 = auVar144._8_4_;
        auVar106._8_4_ = auVar31._8_4_ * fVar188;
        fVar244 = auVar144._12_4_;
        auVar106._12_4_ = auVar31._12_4_ * fVar244;
        fVar192 = auVar144._16_4_;
        auVar106._16_4_ = auVar31._16_4_ * fVar192;
        fVar277 = auVar144._20_4_;
        auVar106._20_4_ = auVar31._20_4_ * fVar277;
        fVar262 = auVar144._24_4_;
        auVar106._24_4_ = auVar31._24_4_ * fVar262;
        auVar106._28_4_ = auVar31._28_4_;
        auVar107._4_4_ = fVar270 * auVar30._4_4_;
        auVar107._0_4_ = fVar256 * auVar30._0_4_;
        auVar107._8_4_ = fVar242 * auVar30._8_4_;
        auVar107._12_4_ = fVar311 * auVar30._12_4_;
        auVar107._16_4_ = fVar191 * auVar30._16_4_;
        auVar107._20_4_ = fVar275 * auVar30._20_4_;
        auVar107._24_4_ = fVar245 * auVar30._24_4_;
        auVar107._28_4_ = auVar33._28_4_;
        auVar144 = vsubps_avx(auVar106,auVar107);
        auVar353 = ZEXT1264(ZEXT412(0)) << 0x20;
        auVar108._4_4_ = auVar352._4_4_ * fVar272;
        auVar108._0_4_ = auVar352._0_4_ * fVar257;
        auVar108._8_4_ = auVar352._8_4_ * fVar188;
        auVar108._12_4_ = auVar352._12_4_ * fVar244;
        auVar108._16_4_ = auVar352._16_4_ * fVar192;
        auVar108._20_4_ = auVar352._20_4_ * fVar277;
        auVar108._24_4_ = auVar352._24_4_ * fVar262;
        auVar108._28_4_ = auVar352._28_4_;
        auVar109._4_4_ = fVar263 * auVar30._4_4_;
        auVar109._0_4_ = fVar246 * auVar30._0_4_;
        auVar109._8_4_ = fVar279 * auVar30._8_4_;
        auVar109._12_4_ = fVar310 * auVar30._12_4_;
        auVar109._16_4_ = fVar189 * auVar30._16_4_;
        auVar109._20_4_ = fVar273 * auVar30._20_4_;
        auVar109._24_4_ = fVar141 * auVar30._24_4_;
        auVar109._28_4_ = auVar30._28_4_;
        auVar30 = vsubps_avx(auVar109,auVar108);
        auVar352 = ZEXT1232(ZEXT412(0)) << 0x20;
        auVar158._0_4_ = auVar29._0_4_ * 0.0 + auVar30._0_4_ + auVar144._0_4_ * 0.0;
        auVar158._4_4_ = auVar29._4_4_ * 0.0 + auVar30._4_4_ + auVar144._4_4_ * 0.0;
        auVar158._8_4_ = auVar29._8_4_ * 0.0 + auVar30._8_4_ + auVar144._8_4_ * 0.0;
        auVar158._12_4_ = auVar29._12_4_ * 0.0 + auVar30._12_4_ + auVar144._12_4_ * 0.0;
        auVar158._16_4_ = auVar29._16_4_ * 0.0 + auVar30._16_4_ + auVar144._16_4_ * 0.0;
        auVar158._20_4_ = auVar29._20_4_ * 0.0 + auVar30._20_4_ + auVar144._20_4_ * 0.0;
        auVar158._24_4_ = auVar29._24_4_ * 0.0 + auVar30._24_4_ + auVar144._24_4_ * 0.0;
        auVar158._28_4_ = auVar144._28_4_ + auVar30._28_4_ + auVar144._28_4_;
        auVar144 = vmaxps_avx(auVar326,auVar158);
        auVar144 = vcmpps_avx(auVar144,auVar352,2);
        auVar29 = _local_7a0 & auVar144;
        if ((((((((auVar29 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar29 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar29 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar29 >> 0x7f,0) == '\0') &&
              (auVar29 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar29 >> 0xbf,0) == '\0') &&
            (auVar29 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar29[0x1f]) {
LAB_0098590a:
          auVar330 = auVar36._4_12_;
          auVar185 = ZEXT3264(CONCAT824(local_460[1]._24_8_,
                                        CONCAT816(local_460[1]._16_8_,
                                                  CONCAT88(local_460[1]._8_8_,local_460[1]._0_8_))))
          ;
        }
        else {
          auVar29 = vandps_avx(auVar144,_local_7a0);
          auVar110._4_4_ = fVar270 * fVar258;
          auVar110._0_4_ = fVar256 * fVar196;
          auVar110._8_4_ = fVar242 * fVar274;
          auVar110._12_4_ = fVar311 * fVar282;
          auVar110._16_4_ = fVar191 * fVar168;
          auVar110._20_4_ = fVar275 * fVar193;
          auVar110._24_4_ = fVar245 * fVar280;
          auVar110._28_4_ = local_7a0._28_4_;
          auVar111._4_4_ = fVar263 * fVar161;
          auVar111._0_4_ = fVar246 * fVar140;
          auVar111._8_4_ = fVar279 * fVar162;
          auVar111._12_4_ = fVar310 * fVar163;
          auVar111._16_4_ = fVar189 * fVar305;
          auVar111._20_4_ = fVar273 * fVar306;
          auVar111._24_4_ = fVar141 * fVar307;
          auVar111._28_4_ = auVar144._28_4_;
          auVar30 = vsubps_avx(auVar111,auVar110);
          auVar112._4_4_ = fVar272 * fVar161;
          auVar112._0_4_ = fVar257 * fVar140;
          auVar112._8_4_ = fVar188 * fVar162;
          auVar112._12_4_ = fVar244 * fVar163;
          auVar112._16_4_ = fVar192 * fVar305;
          auVar112._20_4_ = fVar277 * fVar306;
          auVar112._24_4_ = fVar262 * fVar307;
          auVar112._28_4_ = auVar34._28_4_;
          auVar113._4_4_ = fVar270 * fVar261;
          auVar113._0_4_ = fVar256 * fVar216;
          auVar113._8_4_ = fVar242 * fVar281;
          auVar113._12_4_ = fVar311 * fVar190;
          auVar113._16_4_ = fVar191 * fVar187;
          auVar113._20_4_ = fVar275 * fVar271;
          auVar113._24_4_ = fVar245 * fVar229;
          auVar113._28_4_ = auVar36._28_4_;
          auVar31 = vsubps_avx(auVar113,auVar112);
          auVar114._4_4_ = fVar263 * fVar261;
          auVar114._0_4_ = fVar246 * fVar216;
          auVar114._8_4_ = fVar279 * fVar281;
          auVar114._12_4_ = fVar310 * fVar190;
          auVar114._16_4_ = fVar189 * fVar187;
          auVar114._20_4_ = fVar273 * fVar271;
          auVar114._24_4_ = fVar141 * fVar229;
          auVar114._28_4_ = auVar32._28_4_;
          auVar115._4_4_ = fVar272 * fVar258;
          auVar115._0_4_ = fVar257 * fVar196;
          auVar115._8_4_ = fVar188 * fVar274;
          auVar115._12_4_ = fVar244 * fVar282;
          auVar115._16_4_ = fVar192 * fVar168;
          auVar115._20_4_ = fVar277 * fVar193;
          auVar115._24_4_ = fVar262 * fVar280;
          auVar115._28_4_ = auVar146._28_4_;
          auVar33 = vsubps_avx(auVar115,auVar114);
          auVar303._0_4_ = auVar30._0_4_ * 0.0 + auVar33._0_4_ + auVar31._0_4_ * 0.0;
          auVar303._4_4_ = auVar30._4_4_ * 0.0 + auVar33._4_4_ + auVar31._4_4_ * 0.0;
          auVar303._8_4_ = auVar30._8_4_ * 0.0 + auVar33._8_4_ + auVar31._8_4_ * 0.0;
          auVar303._12_4_ = auVar30._12_4_ * 0.0 + auVar33._12_4_ + auVar31._12_4_ * 0.0;
          auVar303._16_4_ = auVar30._16_4_ * 0.0 + auVar33._16_4_ + auVar31._16_4_ * 0.0;
          auVar303._20_4_ = auVar30._20_4_ * 0.0 + auVar33._20_4_ + auVar31._20_4_ * 0.0;
          auVar303._24_4_ = auVar30._24_4_ * 0.0 + auVar33._24_4_ + auVar31._24_4_ * 0.0;
          auVar303._28_4_ = auVar147._28_4_ + auVar33._28_4_ + auVar32._28_4_;
          auVar144 = vrcpps_avx(auVar303);
          fVar216 = auVar144._0_4_;
          fVar246 = auVar144._4_4_;
          auVar116._4_4_ = auVar303._4_4_ * fVar246;
          auVar116._0_4_ = auVar303._0_4_ * fVar216;
          fVar256 = auVar144._8_4_;
          auVar116._8_4_ = auVar303._8_4_ * fVar256;
          fVar257 = auVar144._12_4_;
          auVar116._12_4_ = auVar303._12_4_ * fVar257;
          fVar196 = auVar144._16_4_;
          auVar116._16_4_ = auVar303._16_4_ * fVar196;
          fVar258 = auVar144._20_4_;
          auVar116._20_4_ = auVar303._20_4_ * fVar258;
          fVar261 = auVar144._24_4_;
          auVar116._24_4_ = auVar303._24_4_ * fVar261;
          auVar116._28_4_ = auVar36._28_4_;
          auVar335._8_4_ = 0x3f800000;
          auVar335._0_8_ = 0x3f8000003f800000;
          auVar335._12_4_ = 0x3f800000;
          auVar335._16_4_ = 0x3f800000;
          auVar335._20_4_ = 0x3f800000;
          auVar335._24_4_ = 0x3f800000;
          auVar335._28_4_ = 0x3f800000;
          auVar144 = vsubps_avx(auVar335,auVar116);
          auVar327._0_4_ = auVar144._0_4_ * fVar216;
          auVar327._4_4_ = auVar144._4_4_ * fVar246;
          auVar327._8_4_ = auVar144._8_4_ * fVar256;
          auVar327._12_4_ = auVar144._12_4_ * fVar257;
          fVar263 = auVar144._16_4_ * fVar196;
          auVar36._16_4_ = fVar263;
          auVar36._0_16_ = auVar327;
          fVar270 = auVar144._20_4_ * fVar258;
          auVar36._20_4_ = fVar270;
          fVar272 = auVar144._24_4_ * fVar261;
          auVar36._24_4_ = fVar272;
          auVar36._28_4_ = auVar144._28_4_;
          auVar330 = auVar327._4_12_;
          fVar216 = auVar327._0_4_ + fVar216;
          fVar246 = auVar327._4_4_ + fVar246;
          fVar256 = auVar327._8_4_ + fVar256;
          fVar257 = auVar327._12_4_ + fVar257;
          fVar263 = fVar263 + fVar196;
          fVar270 = fVar270 + fVar258;
          fVar272 = fVar272 + fVar261;
          auVar117._4_4_ =
               (fVar260 * auVar30._4_4_ + auVar31._4_4_ * fVar259 + fVar165 * auVar33._4_4_) *
               fVar246;
          auVar117._0_4_ =
               (fVar214 * auVar30._0_4_ + auVar31._0_4_ * fVar212 + fVar164 * auVar33._0_4_) *
               fVar216;
          auVar117._8_4_ =
               (fVar278 * auVar30._8_4_ + auVar31._8_4_ * fVar276 + fVar166 * auVar33._8_4_) *
               fVar256;
          auVar117._12_4_ =
               (fVar243 * auVar30._12_4_ + auVar31._12_4_ * fVar308 + fVar167 * auVar33._12_4_) *
               fVar257;
          auVar117._16_4_ =
               (fVar186 * auVar30._16_4_ + auVar31._16_4_ * fVar169 + fVar230 * auVar33._16_4_) *
               fVar263;
          auVar117._20_4_ =
               (fVar264 * auVar30._20_4_ + auVar31._20_4_ * fVar195 + fVar240 * auVar33._20_4_) *
               fVar270;
          auVar117._24_4_ =
               (fVar284 * auVar30._24_4_ + auVar31._24_4_ * fVar283 + fVar241 * auVar33._24_4_) *
               fVar272;
          auVar117._28_4_ = auVar28._28_4_ + auVar33._28_4_;
          fVar196 = (ray->super_RayK<1>).tfar;
          auVar228._4_4_ = fVar196;
          auVar228._0_4_ = fVar196;
          auVar228._8_4_ = fVar196;
          auVar228._12_4_ = fVar196;
          auVar228._16_4_ = fVar196;
          auVar228._20_4_ = fVar196;
          auVar228._24_4_ = fVar196;
          auVar228._28_4_ = fVar196;
          auVar125._4_4_ = fStack_2fc;
          auVar125._0_4_ = local_300;
          auVar125._8_4_ = fStack_2f8;
          auVar125._12_4_ = fStack_2f4;
          auVar125._16_4_ = fStack_2f0;
          auVar125._20_4_ = fStack_2ec;
          auVar125._24_4_ = fStack_2e8;
          auVar125._28_4_ = uStack_2e4;
          auVar28 = vcmpps_avx(auVar125,auVar117,2);
          auVar144 = vcmpps_avx(auVar117,auVar228,2);
          auVar144 = vandps_avx(auVar28,auVar144);
          auVar30 = auVar29 & auVar144;
          if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar30 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar30 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar30 >> 0x7f,0) == '\0') &&
                (auVar30 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar30 >> 0xbf,0) == '\0') &&
              (auVar30 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar30[0x1f]) goto LAB_0098590a;
          auVar144 = vandps_avx(auVar29,auVar144);
          auVar29 = vcmpps_avx(auVar303,auVar352,4);
          auVar30 = auVar144 & auVar29;
          auVar185 = ZEXT3264(CONCAT824(local_460[1]._24_8_,
                                        CONCAT816(local_460[1]._16_8_,
                                                  CONCAT88(local_460[1]._8_8_,local_460[1]._0_8_))))
          ;
          if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar30 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar30 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar30 >> 0x7f,0) != '\0') ||
                (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar30 >> 0xbf,0) != '\0') ||
              (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar30[0x1f] < '\0') {
            auVar144 = vandps_avx(auVar29,auVar144);
            auVar185 = ZEXT3264(auVar144);
            auVar118._4_4_ = auVar326._4_4_ * fVar246;
            auVar118._0_4_ = auVar326._0_4_ * fVar216;
            auVar118._8_4_ = auVar326._8_4_ * fVar256;
            auVar118._12_4_ = auVar326._12_4_ * fVar257;
            auVar118._16_4_ = auVar326._16_4_ * fVar263;
            auVar118._20_4_ = auVar326._20_4_ * fVar270;
            auVar118._24_4_ = auVar326._24_4_ * fVar272;
            auVar118._28_4_ = auVar28._28_4_;
            auVar119._4_4_ = auVar158._4_4_ * fVar246;
            auVar119._0_4_ = auVar158._0_4_ * fVar216;
            auVar119._8_4_ = auVar158._8_4_ * fVar256;
            auVar119._12_4_ = auVar158._12_4_ * fVar257;
            auVar119._16_4_ = auVar158._16_4_ * fVar263;
            auVar119._20_4_ = auVar158._20_4_ * fVar270;
            auVar119._24_4_ = auVar158._24_4_ * fVar272;
            auVar119._28_4_ = auVar158._28_4_;
            auVar269._8_4_ = 0x3f800000;
            auVar269._0_8_ = 0x3f8000003f800000;
            auVar269._12_4_ = 0x3f800000;
            auVar269._16_4_ = 0x3f800000;
            auVar269._20_4_ = 0x3f800000;
            auVar269._24_4_ = 0x3f800000;
            auVar269._28_4_ = 0x3f800000;
            auVar144 = vsubps_avx(auVar269,auVar118);
            local_420 = vblendvps_avx(auVar144,auVar118,auVar27);
            auVar144 = vsubps_avx(auVar269,auVar119);
            _local_380 = vblendvps_avx(auVar144,auVar119,auVar27);
            local_360 = auVar117;
          }
        }
        auVar341 = ZEXT3264(_local_700);
        auVar316 = ZEXT3264(local_680);
        auVar304 = ZEXT3264(local_6e0);
        auVar144 = auVar185._0_32_;
        auVar293 = ZEXT3264(_local_640);
        auVar345 = ZEXT3264(_local_620);
        if ((((((((auVar144 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar144 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar144 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar144 >> 0x7f,0) == '\0') &&
              (auVar185 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
             SUB321(auVar144 >> 0xbf,0) == '\0') &&
            (auVar185 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
            -1 < auVar185[0x1f]) {
          auVar185 = ZEXT3264(local_420);
          goto LAB_00985669;
        }
        auVar28 = vsubps_avx(auVar211,_local_780);
        fVar212 = (float)local_780._0_4_ + auVar28._0_4_ * local_420._0_4_;
        fVar214 = (float)local_780._4_4_ + auVar28._4_4_ * local_420._4_4_;
        fVar216 = fStack_778 + auVar28._8_4_ * local_420._8_4_;
        fVar246 = fStack_774 + auVar28._12_4_ * local_420._12_4_;
        fVar256 = fStack_770 + auVar28._16_4_ * local_420._16_4_;
        fVar257 = fStack_76c + auVar28._20_4_ * local_420._20_4_;
        fVar258 = fStack_768 + auVar28._24_4_ * local_420._24_4_;
        fVar259 = fStack_764 + auVar28._28_4_;
        fVar196 = pre->depth_scale;
        auVar120._4_4_ = (fVar214 + fVar214) * fVar196;
        auVar120._0_4_ = (fVar212 + fVar212) * fVar196;
        auVar120._8_4_ = (fVar216 + fVar216) * fVar196;
        auVar120._12_4_ = (fVar246 + fVar246) * fVar196;
        auVar120._16_4_ = (fVar256 + fVar256) * fVar196;
        auVar120._20_4_ = (fVar257 + fVar257) * fVar196;
        auVar120._24_4_ = (fVar258 + fVar258) * fVar196;
        auVar120._28_4_ = fVar259 + fVar259;
        auVar28 = vcmpps_avx(local_360,auVar120,6);
        auVar29 = auVar144 & auVar28;
        if ((((((((auVar29 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar29 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar29 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar29 >> 0x7f,0) == '\0') &&
              (auVar29 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar29 >> 0xbf,0) == '\0') &&
            (auVar29 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar29[0x1f]) {
          auVar185 = ZEXT3264(local_420);
          goto LAB_00985669;
        }
        local_380._0_4_ = (float)local_380._0_4_ + (float)local_380._0_4_ + -1.0;
        local_380._4_4_ = (float)local_380._4_4_ + (float)local_380._4_4_ + -1.0;
        uStack_378._0_4_ = (float)uStack_378 + (float)uStack_378 + -1.0;
        uStack_378._4_4_ = uStack_378._4_4_ + uStack_378._4_4_ + -1.0;
        uStack_370._0_4_ = (float)uStack_370 + (float)uStack_370 + -1.0;
        uStack_370._4_4_ = uStack_370._4_4_ + uStack_370._4_4_ + -1.0;
        uStack_368._0_4_ = (float)uStack_368 + (float)uStack_368 + -1.0;
        uStack_368._4_4_ = uStack_368._4_4_ + uStack_368._4_4_ + -1.0;
        local_280 = local_420;
        auVar130 = _local_380;
        auVar29 = _local_380;
        local_260 = (float)local_380._0_4_;
        fStack_25c = (float)local_380._4_4_;
        fStack_258 = (float)uStack_378;
        fStack_254 = uStack_378._4_4_;
        fStack_250 = (float)uStack_370;
        fStack_24c = uStack_370._4_4_;
        fStack_248 = (float)uStack_368;
        fStack_244 = uStack_368._4_4_;
        local_240 = local_360;
        local_21c = uVar24;
        local_210 = CONCAT44(fStack_7ac,local_7b0);
        uStack_208 = CONCAT44(fStack_7a4,fStack_7a8);
        local_200 = local_690;
        uStack_1f8 = uStack_688;
        local_1f0 = local_6a0;
        uStack_1e8 = uStack_698;
        local_1e0 = local_6b0;
        uStack_1d8 = uStack_6a8;
        pGVar25 = (context->scene->geometries).items[local_7c0].ptr;
        local_780 = (undefined1  [8])pGVar25;
        if ((pGVar25->mask & (ray->super_RayK<1>).mask) != 0) {
          auVar144 = vandps_avx(auVar28,auVar144);
          local_460[0] = auVar144;
          auVar201._0_4_ = (float)(int)local_220;
          auVar201._4_12_ = auVar330;
          auVar250 = vshufps_avx(auVar201,auVar201,0);
          local_1a0[0] = (auVar250._0_4_ + local_420._0_4_ + 0.0) * (float)local_320._0_4_;
          local_1a0[1] = (auVar250._4_4_ + local_420._4_4_ + 1.0) * (float)local_320._4_4_;
          local_1a0[2] = (auVar250._8_4_ + local_420._8_4_ + 2.0) * fStack_318;
          local_1a0[3] = (auVar250._12_4_ + local_420._12_4_ + 3.0) * fStack_314;
          fStack_190 = (auVar250._0_4_ + local_420._16_4_ + 4.0) * fStack_310;
          fStack_18c = (auVar250._4_4_ + local_420._20_4_ + 5.0) * fStack_30c;
          fStack_188 = (auVar250._8_4_ + local_420._24_4_ + 6.0) * fStack_308;
          fStack_184 = auVar250._12_4_ + local_420._28_4_ + 7.0;
          uStack_370 = auVar130._16_8_;
          uStack_368 = auVar29._24_8_;
          local_180 = local_380;
          uStack_178 = uStack_378;
          uStack_170 = uStack_370;
          uStack_168 = uStack_368;
          local_160 = local_360;
          auVar182._8_4_ = 0x7f800000;
          auVar182._0_8_ = 0x7f8000007f800000;
          auVar182._12_4_ = 0x7f800000;
          auVar182._16_4_ = 0x7f800000;
          auVar182._20_4_ = 0x7f800000;
          auVar182._24_4_ = 0x7f800000;
          auVar182._28_4_ = 0x7f800000;
          auVar28 = vblendvps_avx(auVar182,local_360,auVar144);
          auVar30 = vshufps_avx(auVar28,auVar28,0xb1);
          auVar30 = vminps_avx(auVar28,auVar30);
          auVar352 = vshufpd_avx(auVar30,auVar30,5);
          auVar30 = vminps_avx(auVar30,auVar352);
          auVar352 = vperm2f128_avx(auVar30,auVar30,1);
          auVar30 = vminps_avx(auVar30,auVar352);
          auVar28 = vcmpps_avx(auVar28,auVar30,0);
          auVar30 = auVar144 & auVar28;
          if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar30 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar30 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar30 >> 0x7f,0) != '\0') ||
                (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar30 >> 0xbf,0) != '\0') ||
              (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar30[0x1f] < '\0') {
            auVar144 = vandps_avx(auVar28,auVar144);
          }
          uVar133 = vmovmskps_avx(auVar144);
          uVar23 = 0;
          if (uVar133 != 0) {
            for (; (uVar133 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
            }
          }
          uVar135 = (ulong)uVar23;
          _local_380 = auVar29;
          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
             (pGVar25->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
            local_5a0._8_24_ = auVar254._8_24_;
            local_520._0_8_ = pPVar137;
            local_720._8_24_ = auVar211._8_24_;
            _local_7a0 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
            local_5b0 = ray;
            do {
              local_5d4 = local_1a0[uVar135];
              local_5d0 = *(undefined4 *)((long)&local_180 + uVar135 * 4);
              (ray->super_RayK<1>).tfar = *(float *)(local_160 + uVar135 * 4);
              local_750.context = context->user;
              fVar212 = 1.0 - local_5d4;
              fVar196 = local_5d4 * fVar212 + local_5d4 * fVar212;
              auVar250 = ZEXT416((uint)(local_5d4 * local_5d4 * 3.0));
              auVar250 = vshufps_avx(auVar250,auVar250,0);
              auVar202 = ZEXT416((uint)((fVar196 - local_5d4 * local_5d4) * 3.0));
              auVar202 = vshufps_avx(auVar202,auVar202,0);
              auVar219 = ZEXT416((uint)((fVar212 * fVar212 - fVar196) * 3.0));
              auVar219 = vshufps_avx(auVar219,auVar219,0);
              auVar223 = ZEXT416((uint)(fVar212 * fVar212 * -3.0));
              auVar223 = vshufps_avx(auVar223,auVar223,0);
              auVar204._0_4_ =
                   auVar223._0_4_ * local_7b0 +
                   auVar219._0_4_ * (float)local_690._0_4_ +
                   auVar250._0_4_ * (float)local_6b0._0_4_ + auVar202._0_4_ * (float)local_6a0._0_4_
              ;
              auVar204._4_4_ =
                   auVar223._4_4_ * fStack_7ac +
                   auVar219._4_4_ * (float)local_690._4_4_ +
                   auVar250._4_4_ * (float)local_6b0._4_4_ + auVar202._4_4_ * (float)local_6a0._4_4_
              ;
              auVar204._8_4_ =
                   auVar223._8_4_ * fStack_7a8 +
                   auVar219._8_4_ * (float)uStack_688 +
                   auVar250._8_4_ * (float)uStack_6a8 + auVar202._8_4_ * (float)uStack_698;
              auVar204._12_4_ =
                   auVar223._12_4_ * fStack_7a4 +
                   auVar219._12_4_ * uStack_688._4_4_ +
                   auVar250._12_4_ * uStack_6a8._4_4_ + auVar202._12_4_ * uStack_698._4_4_;
              local_5e0 = vmovlps_avx(auVar204);
              local_5d8 = vextractps_avx(auVar204,2);
              local_5cc = uVar131;
              local_5c8 = (int)local_7c0;
              local_5c4 = (local_750.context)->instID[0];
              local_5c0 = (local_750.context)->instPrimID[0];
              local_7c4 = -1;
              local_750.valid = &local_7c4;
              local_750.geometryUserPtr = *(void **)((long)local_780 + 0x18);
              local_750.ray = (RTCRayN *)ray;
              local_750.hit = (RTCHitN *)&local_5e0;
              local_750.N = 1;
              if (*(code **)((long)local_780 + 0x40) == (code *)0x0) {
LAB_00985ae7:
                p_Var26 = context->args->filter;
                if ((p_Var26 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                    ((*(byte *)((long)local_780 + 0x3e) & 0x40) != 0)))) {
                  auVar353 = ZEXT1664(auVar353._0_16_);
                  (*p_Var26)(&local_750);
                  ray = local_5b0;
                  if (*local_750.valid == 0) goto LAB_00985b81;
                }
                (((Vec3f *)((long)local_750.ray + 0x30))->field_0).components[0] =
                     *(float *)local_750.hit;
                (((Vec3f *)((long)local_750.ray + 0x30))->field_0).field_0.y =
                     *(float *)(local_750.hit + 4);
                (((Vec3f *)((long)local_750.ray + 0x30))->field_0).field_0.z =
                     *(float *)(local_750.hit + 8);
                *(float *)((long)local_750.ray + 0x3c) = *(float *)(local_750.hit + 0xc);
                *(float *)((long)local_750.ray + 0x40) = *(float *)(local_750.hit + 0x10);
                *(float *)((long)local_750.ray + 0x44) = *(float *)(local_750.hit + 0x14);
                *(float *)((long)local_750.ray + 0x48) = *(float *)(local_750.hit + 0x18);
                *(float *)((long)local_750.ray + 0x4c) = *(float *)(local_750.hit + 0x1c);
                *(float *)((long)local_750.ray + 0x50) = *(float *)(local_750.hit + 0x20);
              }
              else {
                auVar353 = ZEXT1664(auVar353._0_16_);
                (**(code **)((long)local_780 + 0x40))(&local_750);
                ray = local_5b0;
                if (*local_750.valid != 0) goto LAB_00985ae7;
LAB_00985b81:
                (local_5b0->super_RayK<1>).tfar = (float)local_7a0._0_4_;
                ray = local_5b0;
              }
              *(undefined4 *)(local_460[0] + uVar135 * 4) = 0;
              auVar29 = local_460[0];
              fVar196 = (ray->super_RayK<1>).tfar;
              auVar159._4_4_ = fVar196;
              auVar159._0_4_ = fVar196;
              auVar159._8_4_ = fVar196;
              auVar159._12_4_ = fVar196;
              auVar159._16_4_ = fVar196;
              auVar159._20_4_ = fVar196;
              auVar159._24_4_ = fVar196;
              auVar159._28_4_ = fVar196;
              auVar28 = vcmpps_avx(local_360,auVar159,2);
              auVar144 = vandps_avx(auVar28,local_460[0]);
              local_460[0] = auVar144;
              auVar29 = auVar29 & auVar28;
              if ((((((((auVar29 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar29 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar29 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar29 >> 0x7f,0) == '\0') &&
                    (auVar29 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar29 >> 0xbf,0) == '\0') &&
                  (auVar29 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar29[0x1f]) goto LAB_00985c1a;
              auVar183._8_4_ = 0x7f800000;
              auVar183._0_8_ = 0x7f8000007f800000;
              auVar183._12_4_ = 0x7f800000;
              auVar183._16_4_ = 0x7f800000;
              auVar183._20_4_ = 0x7f800000;
              auVar183._24_4_ = 0x7f800000;
              auVar183._28_4_ = 0x7f800000;
              auVar28 = vblendvps_avx(auVar183,local_360,auVar144);
              auVar29 = vshufps_avx(auVar28,auVar28,0xb1);
              auVar29 = vminps_avx(auVar28,auVar29);
              auVar30 = vshufpd_avx(auVar29,auVar29,5);
              auVar29 = vminps_avx(auVar29,auVar30);
              auVar30 = vperm2f128_avx(auVar29,auVar29,1);
              auVar29 = vminps_avx(auVar29,auVar30);
              auVar28 = vcmpps_avx(auVar28,auVar29,0);
              auVar29 = auVar144 & auVar28;
              if ((((((((auVar29 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar29 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar29 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar29 >> 0x7f,0) != '\0') ||
                    (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar29 >> 0xbf,0) != '\0') ||
                  (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar29[0x1f] < '\0') {
                auVar144 = vandps_avx(auVar28,auVar144);
              }
              _local_7a0 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
              uVar133 = vmovmskps_avx(auVar144);
              uVar23 = 0;
              if (uVar133 != 0) {
                for (; (uVar133 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
                }
              }
              uVar135 = (ulong)uVar23;
            } while( true );
          }
          fVar196 = local_1a0[uVar135];
          fVar212 = *(float *)((long)&local_180 + uVar135 * 4);
          fVar216 = 1.0 - fVar196;
          fVar214 = fVar196 * fVar216 + fVar196 * fVar216;
          auVar250 = ZEXT416((uint)(fVar196 * fVar196 * 3.0));
          auVar250 = vshufps_avx(auVar250,auVar250,0);
          auVar202 = ZEXT416((uint)((fVar214 - fVar196 * fVar196) * 3.0));
          auVar202 = vshufps_avx(auVar202,auVar202,0);
          auVar219 = ZEXT416((uint)((fVar216 * fVar216 - fVar214) * 3.0));
          auVar219 = vshufps_avx(auVar219,auVar219,0);
          auVar223 = ZEXT416((uint)(fVar216 * fVar216 * -3.0));
          auVar223 = vshufps_avx(auVar223,auVar223,0);
          auVar203._0_4_ =
               auVar223._0_4_ * local_7b0 +
               auVar219._0_4_ * (float)local_690._0_4_ +
               auVar250._0_4_ * (float)local_6b0._0_4_ + auVar202._0_4_ * (float)local_6a0._0_4_;
          auVar203._4_4_ =
               auVar223._4_4_ * fStack_7ac +
               auVar219._4_4_ * (float)local_690._4_4_ +
               auVar250._4_4_ * (float)local_6b0._4_4_ + auVar202._4_4_ * (float)local_6a0._4_4_;
          auVar203._8_4_ =
               auVar223._8_4_ * fStack_7a8 +
               auVar219._8_4_ * (float)uStack_688 +
               auVar250._8_4_ * (float)uStack_6a8 + auVar202._8_4_ * (float)uStack_698;
          auVar203._12_4_ =
               auVar223._12_4_ * fStack_7a4 +
               auVar219._12_4_ * uStack_688._4_4_ +
               auVar250._12_4_ * uStack_6a8._4_4_ + auVar202._12_4_ * uStack_698._4_4_;
          (ray->super_RayK<1>).tfar = *(float *)(local_160 + uVar135 * 4);
          uVar12 = vmovlps_avx(auVar203);
          *(undefined8 *)&(ray->Ng).field_0 = uVar12;
          fVar214 = (float)vextractps_avx(auVar203,2);
          (ray->Ng).field_0.field_0.z = fVar214;
          ray->u = fVar196;
          ray->v = fVar212;
          ray->primID = uVar131;
          ray->geomID = (uint)local_7c0;
          ray->instID[0] = context->user->instID[0];
          ray->instPrimID[0] = context->user->instPrimID[0];
          goto LAB_009858ea;
        }
        goto LAB_009858fc;
      }
      auVar185 = ZEXT3264(auVar185._0_32_);
LAB_00985669:
      auVar341 = ZEXT3264(_local_700);
      auVar316 = ZEXT3264(local_680);
      auVar304 = ZEXT3264(local_6e0);
      auVar345 = ZEXT3264(_local_620);
      auVar293 = ZEXT3264(_local_640);
      fVar189 = (float)local_600._0_4_;
      fVar191 = (float)local_600._4_4_;
      fVar192 = fStack_5f8;
      fVar193 = fStack_5f4;
      fVar196 = fStack_5f0;
      fVar212 = fStack_5ec;
      fVar214 = fStack_5e8;
      fVar216 = fStack_5e4;
      goto LAB_00985672;
    }
  }
  fVar196 = (ray->super_RayK<1>).tfar;
  auVar155._4_4_ = fVar196;
  auVar155._0_4_ = fVar196;
  auVar155._8_4_ = fVar196;
  auVar155._12_4_ = fVar196;
  auVar155._16_4_ = fVar196;
  auVar155._20_4_ = fVar196;
  auVar155._24_4_ = fVar196;
  auVar155._28_4_ = fVar196;
  auVar144 = vcmpps_avx(local_80,auVar155,2);
  uVar131 = vmovmskps_avx(auVar144);
  uVar131 = (uint)uVar138 & uVar131;
  goto LAB_00983d58;
LAB_00985c1a:
  auVar304 = ZEXT3264(local_6e0);
  auVar316 = ZEXT3264(local_680);
  auVar341 = ZEXT3264(_local_700);
  auVar293 = ZEXT3264(_local_640);
  auVar345 = ZEXT3264(_local_620);
  pre = local_758;
  pPVar137 = (Primitive *)local_520._0_8_;
LAB_009858ea:
  fVar197 = (float)local_660._0_4_;
  fVar213 = (float)local_660._4_4_;
  fVar215 = fStack_658;
  fVar217 = fStack_654;
  fVar218 = fStack_650;
  fVar220 = fStack_64c;
  fVar221 = fStack_648;
LAB_009858fc:
  auVar185 = ZEXT3264(local_420);
  fVar189 = (float)local_600._0_4_;
  fVar191 = (float)local_600._4_4_;
  fVar192 = fStack_5f8;
  fVar193 = fStack_5f4;
  fVar196 = fStack_5f0;
  fVar212 = fStack_5ec;
  fVar214 = fStack_5e8;
  fVar216 = fStack_5e4;
LAB_00985672:
  lVar136 = lVar136 + 8;
  lVar134 = local_5a0._0_8_;
  prim = (Primitive *)local_720._0_8_;
  fVar195 = (float)local_500._0_4_;
  fVar264 = (float)local_500._4_4_;
  fVar271 = fStack_4f8;
  fVar273 = fStack_4f4;
  fVar246 = fStack_4f0;
  fVar256 = fStack_4ec;
  fVar257 = fStack_4e8;
  fVar258 = fStack_4e4;
  goto LAB_00984d6e;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersector1<M>::intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }